

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O1

void __thiscall Tagliatelle<TTA>::PerformLabeling(Tagliatelle<TTA> *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  char cVar8;
  undefined4 uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  undefined4 *puVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  long lVar33;
  uint *puVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint *puVar44;
  long lVar45;
  uint *puVar46;
  uint uVar47;
  int iVar48;
  uint *puVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  bool bVar58;
  ulong local_160;
  int local_110;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  uVar19 = (ulong)(int)uVar3;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar47 = uVar13 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar37 = *(int *)&pMVar4->field_0x8;
  iVar36 = *(int *)&pMVar4->field_0xc;
  TTA::Alloc(((iVar36 - (iVar36 + 1 >> 0x1f)) + 1 >> 1) * ((iVar37 - (iVar37 + 1 >> 0x1f)) + 1 >> 1)
             + 1);
  puVar14 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar46 = TTA::tail_;
  puVar49 = TTA::next_;
  TTA::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar45 = *(long *)&pMVar4->field_0x10;
  if (uVar13 != 1) {
    lVar20 = **(long **)&pMVar4->field_0x48;
    lVar53 = lVar45 + lVar20;
    lVar28 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    local_110 = (int)(uVar19 - 2);
    if ((int)uVar3 < 3) {
      uVar12 = 0;
      lVar20 = 1;
    }
    else {
      uVar29 = 0xfffffffe;
      uVar30 = 0;
      do {
        iVar37 = (int)uVar30;
        uVar23 = (ulong)iVar37;
        iVar36 = (int)uVar29;
        if ((*(char *)(lVar45 + uVar23) != '\0') || (*(char *)(lVar53 + uVar23) != '\0')) {
          cVar8 = *(char *)(lVar45 + 3 + (long)iVar36);
          puVar14[TTA::length_] = TTA::length_;
          puVar49[TTA::length_] = 0xffffffff;
          puVar46[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar28 + uVar23 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          if (cVar8 != '\0') goto LAB_002dd581;
          goto LAB_002dd654;
        }
        if ((*(char *)((long)iVar36 + 3 + lVar45) != '\0') ||
           (*(char *)(lVar53 + 3 + (long)iVar36) != '\0')) {
          puVar14[TTA::length_] = TTA::length_;
          puVar49[TTA::length_] = 0xffffffff;
          puVar46[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
LAB_002dd57e:
          *(uint *)(lVar28 + uVar23 * 4) = uVar12;
LAB_002dd581:
          puVar6 = TTA::tail_;
          puVar34 = TTA::next_;
          iVar36 = iVar37 + 2;
          if (iVar36 < local_110) {
            lVar31 = (long)iVar37;
            lVar38 = lVar31 + 2;
            lVar10 = lVar28 + lVar31 * 4;
            lVar54 = lVar45 + 3 + lVar31;
            lVar31 = lVar31 + lVar20 + 3 + lVar45;
            lVar26 = 0;
            do {
              if ((*(char *)(lVar54 + -1 + lVar26) == '\0') &&
                 (*(char *)(lVar31 + -1 + lVar26) == '\0')) {
                if ((*(char *)(lVar54 + lVar26) == '\0') && (*(char *)(lVar31 + lVar26) == '\0')) {
                  uVar23 = lVar38 + lVar26;
                  uVar30 = uVar23 & 0xffffffff;
                  goto LAB_002dd8f0;
                }
                puVar14[TTA::length_] = TTA::length_;
                puVar34[TTA::length_] = 0xffffffff;
                puVar6[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
              }
              else {
                if (*(char *)(lVar54 + lVar26) == '\0') goto LAB_002dd63e;
                uVar12 = *(uint *)(lVar10 + lVar26 * 4);
              }
              *(uint *)(lVar10 + 8 + lVar26 * 4) = uVar12;
              lVar35 = lVar26 + lVar38;
              lVar26 = lVar26 + 2;
              if ((long)(uVar19 - 2) <= lVar35 + 2) {
                iVar36 = (int)lVar26 + iVar37 + 2;
                iVar37 = iVar37 + (int)lVar26;
                break;
              }
            } while( true );
          }
          lVar38 = (long)iVar36;
          if (iVar36 <= local_110) {
            if ((*(char *)(lVar45 + lVar38) != '\0') || (*(char *)(lVar53 + lVar38) != '\0'))
            goto LAB_002ddb2f;
            goto LAB_002ddc25;
          }
          if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar53 + lVar38) == '\0'))
          goto LAB_002ddc98;
LAB_002ddb2f:
          uVar12 = *(uint *)(lVar28 + (long)iVar37 * 4);
          goto LAB_002ddc9a;
        }
LAB_002dd8f0:
        *(undefined4 *)(lVar28 + uVar23 * 4) = 0;
        iVar37 = (int)uVar30;
        uVar12 = iVar37 + 2;
        uVar29 = uVar30;
        uVar30 = (ulong)uVar12;
      } while ((int)uVar12 < local_110);
      lVar20 = (long)(iVar37 + 3);
    }
    lVar38 = (long)(int)uVar12;
    if (local_110 < (int)uVar12) {
      if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar53 + lVar38) == '\0'))
      goto LAB_002ddc98;
LAB_002dda73:
      TTA::rtable_[TTA::length_] = TTA::length_;
LAB_002dda82:
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_;
      TTA::length_ = TTA::length_ + 1;
    }
    else {
      if ((((*(char *)(lVar45 + lVar38) != '\0') || (*(char *)(lVar53 + lVar38) != '\0')) ||
          (*(char *)(lVar45 + lVar20) != '\0')) || (*(char *)(lVar53 + lVar20) != '\0'))
      goto LAB_002dda73;
LAB_002ddc98:
      uVar12 = 0;
    }
LAB_002ddc9a:
    *(uint *)(lVar28 + lVar38 * 4) = uVar12;
    if (2 < (int)uVar47) {
      lVar45 = (long)local_110;
      uVar29 = 2;
      lVar20 = 1;
      lVar53 = 3;
      lVar28 = 0;
      do {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar10 = *(long *)&pMVar4->field_0x10;
        lVar54 = **(long **)&pMVar4->field_0x48;
        lVar33 = lVar54 * uVar29;
        lVar38 = lVar10 + lVar33;
        pcVar32 = (char *)(lVar38 - lVar54);
        pcVar1 = (char *)(lVar38 + lVar54);
        lVar26 = *(long *)&pMVar5->field_0x10;
        lVar31 = **(long **)&pMVar5->field_0x48;
        lVar35 = lVar31 * uVar29;
        puVar14 = (uint *)(lVar35 + lVar26);
        puVar49 = (uint *)((long)puVar14 + lVar31 * -2);
        cVar8 = *(char *)(lVar10 + lVar33);
        if (2 < (int)uVar3) {
          if (cVar8 == '\0') {
            if (*pcVar1 == '\0') {
              if (*(char *)(lVar38 + 1) == '\0') {
                if (pcVar1[1] != '\0') {
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  *puVar14 = TTA::length_;
                  TTA::length_ = uVar12;
                  local_160 = 0;
                  goto LAB_002e0bc3;
                }
                local_160 = 0;
                puVar46 = puVar14;
                goto LAB_002e021b;
              }
            }
            else if (*(char *)(lVar38 + 1) == '\0') {
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              *puVar14 = TTA::length_;
              TTA::length_ = uVar12;
              uVar30 = 0;
              goto LAB_002e3931;
            }
            if (pcVar32[1] != '\0') {
              *puVar14 = *puVar49;
              uVar30 = 0;
              goto LAB_002e1955;
            }
            cVar8 = *pcVar32;
            if (pcVar32[2] == '\0') goto LAB_002de1b2;
            if (cVar8 != '\0') {
              cVar8 = pcVar32[1 - lVar54];
              uVar12 = *puVar49;
              goto joined_r0x002de18b;
            }
            uVar12 = puVar49[2];
LAB_002de6d2:
            *puVar14 = uVar12;
          }
          else {
            if (pcVar32[1] != '\0') {
              *puVar14 = *puVar49;
              local_160 = 0;
              goto LAB_002dddc1;
            }
            if (*(char *)(lVar38 + 1) == '\0') {
              if (*pcVar32 != '\0') {
                *puVar14 = *puVar49;
                local_160 = 0;
                goto LAB_002e5607;
              }
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              *puVar14 = TTA::length_;
              TTA::length_ = uVar12;
              local_160 = 0;
              goto LAB_002e4e8b;
            }
            cVar8 = *pcVar32;
            if (pcVar32[2] == '\0') {
LAB_002de1b2:
              if (cVar8 != '\0') {
                *puVar14 = *puVar49;
                local_160 = 0;
                goto LAB_002de1c1;
              }
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              *puVar14 = TTA::length_;
              TTA::length_ = uVar12;
              uVar30 = 0;
              goto LAB_002de3c4;
            }
            if (cVar8 == '\0') {
              *puVar14 = puVar49[2];
              uVar30 = 0;
              goto LAB_002de6d7;
            }
            cVar8 = pcVar32[1 - lVar54];
            uVar12 = *puVar49;
joined_r0x002de18b:
            if (cVar8 == '\0') {
              uVar12 = TTA::Merge(uVar12,puVar49[2]);
              goto LAB_002de6d2;
            }
            *puVar14 = uVar12;
          }
          uVar30 = 0;
LAB_002de6d7:
          iVar37 = (int)uVar30;
          uVar12 = iVar37 + 2;
          if ((int)uVar12 < local_110) {
            lVar41 = (long)iVar37;
            lVar57 = lVar41 << 0x20;
            lVar18 = lVar35 + lVar41 * 4;
            lVar43 = lVar26 + lVar18 + 8;
            lVar17 = lVar54 * lVar53 + lVar41;
            lVar52 = lVar10 + lVar54 * lVar28 + lVar41 + 3;
            lVar39 = lVar10 + lVar54 * lVar20 + lVar41;
            lVar16 = lVar39 + 4;
            lVar40 = lVar10 + lVar33 + lVar41;
            lVar22 = lVar40 + 3;
            lVar21 = lVar31 * lVar28 + lVar41 * 4 + lVar26;
            lVar24 = lVar21 + 8;
            lVar11 = 0;
            lVar42 = 0;
LAB_002de7d6:
            iVar48 = (int)lVar42;
            lVar50 = lVar57 >> 0x1e;
            iVar36 = (int)(lVar41 + 2);
            if (*(char *)(lVar40 + 2 + lVar42) == '\0') {
              cVar8 = *(char *)(lVar22 + lVar42);
              if (*(char *)(lVar17 + lVar10 + 2 + lVar42) != '\0') {
                if (cVar8 == '\0') {
                  uVar12 = iVar36 + iVar48;
                  *(undefined4 *)(lVar18 + lVar26 + 8 + lVar42 * 4) =
                       *(undefined4 *)((long)puVar14 + lVar50);
LAB_002e1cbb:
                  uVar30 = (ulong)uVar12;
                  goto LAB_002e3931;
                }
                if (*(char *)(lVar39 + 3 + lVar42) != '\0') goto LAB_002defbc;
                if (*(char *)(lVar16 + lVar42) != '\0') goto LAB_002de83e;
LAB_002deb12:
                uVar12 = *(uint *)((long)puVar14 + lVar50);
                local_160 = (ulong)(uint)(iVar36 + iVar48);
                uVar23 = lVar41 + lVar42 + 2;
LAB_002e1fd0:
                puVar14[uVar23] = uVar12;
                iVar37 = (int)local_160;
                uVar12 = iVar37 + 2;
                if ((int)uVar12 < local_110) {
                  lVar24 = (long)iVar37;
                  lVar18 = lVar24 + 2;
                  lVar21 = lVar24 << 0x20;
                  lVar39 = lVar35 + lVar24 * 4;
                  lVar52 = lVar26 + lVar39 + 8;
                  lVar40 = lVar10 + lVar33 + lVar24;
                  lVar16 = lVar40 + 3;
                  lVar11 = lVar10 + lVar54 * lVar20 + lVar24;
                  lVar17 = 0;
                  lVar22 = 0;
                  do {
                    lVar41 = lVar21 >> 0x1e;
                    lVar57 = lVar21 >> 0x20;
                    if (*(char *)(lVar40 + 2 + lVar22) == '\0') {
                      if (*(char *)(lVar10 + lVar54 * lVar53 + lVar24 + 2 + lVar22) == '\0') {
                        local_160 = lVar18 + lVar22;
                        lVar18 = lVar21 + 0x300000000 >> 0x20;
                        if (*(char *)(lVar38 + lVar18) == '\0') {
                          if (pcVar1[lVar18] == '\0') {
                            lVar17 = lVar17 + lVar39 + lVar26;
LAB_002e6bb1:
                            local_160 = local_160 & 0xffffffff;
                            puVar46 = (uint *)(lVar17 + 8);
                            goto LAB_002e021b;
                          }
                          TTA::rtable_[TTA::length_] = TTA::length_;
                          TTA::next_[TTA::length_] = 0xffffffff;
                          TTA::tail_[TTA::length_] = TTA::length_;
                          uVar12 = TTA::length_ + 1;
                          *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = TTA::length_;
                          TTA::length_ = uVar12;
LAB_002dede4:
                          local_160 = local_160 & 0xffffffff;
                          goto LAB_002e0bc3;
                        }
                        if (pcVar32[lVar18] != '\0') {
                          *(undefined4 *)(lVar52 + lVar22 * 4) =
                               *(undefined4 *)
                                (lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4);
                          uVar30 = local_160 & 0xffffffff;
                          goto LAB_002e1955;
                        }
                        lVar18 = lVar21 + 0x400000000 >> 0x20;
                        if (pcVar32[lVar18] == '\0') {
                          TTA::rtable_[TTA::length_] = TTA::length_;
                          TTA::next_[TTA::length_] = 0xffffffff;
                          TTA::tail_[TTA::length_] = TTA::length_;
                          uVar12 = TTA::length_ + 1;
                          *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = TTA::length_;
                          TTA::length_ = uVar12;
                          uVar30 = local_160 & 0xffffffff;
                          goto LAB_002de3c4;
                        }
                        *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = puVar49[lVar18];
                        uVar30 = local_160 & 0xffffffff;
                        goto LAB_002de6d7;
                      }
                      if (*(char *)(lVar16 + lVar22) == '\0') {
                        uVar30 = (ulong)(uint)((int)lVar18 + (int)lVar22);
                        *(undefined4 *)(lVar39 + lVar26 + 8 + lVar22 * 4) =
                             *(undefined4 *)((long)puVar14 + lVar41);
                        goto LAB_002e3931;
                      }
                      if (*(char *)(lVar11 + 3 + lVar22) != '\0') goto LAB_002e290e;
                      if (*(char *)(lVar11 + 4 + lVar22) != '\0') {
                        lVar40 = lVar54 * lVar28 + lVar24 + lVar10;
                        if (*(char *)(lVar22 + 3 + lVar40) == '\0') {
LAB_002e29f6:
                          uVar12 = *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 0x10 +
                                            lVar22 * 4);
                          goto LAB_002e2c46;
                        }
                        if (*(char *)(lVar22 + 2 + lVar40) == '\0') goto LAB_002e2c2e;
                        if (pcVar32[lVar57] == '\0') goto LAB_002e29b4;
LAB_002e265a:
                        uVar30 = lVar18 + lVar22;
                        if (pcVar32[lVar57 + (1 - lVar54)] == '\0') {
                          uVar12 = TTA::Merge(puVar49[lVar57],
                                              *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 +
                                                       lVar22 * 4));
                          *(uint *)(lVar52 + lVar22 * 4) = uVar12;
                        }
                        else {
                          *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = puVar49[lVar57];
                        }
                        goto LAB_002de6d7;
                      }
                    }
                    else {
                      if (*(char *)(lVar11 + 3 + lVar22) != '\0') {
                        local_160 = lVar18 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar54 * lVar28 + lVar24 + lVar10) == '\0') {
                          uVar12 = *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4)
                          ;
                          uVar27 = *(uint *)((long)puVar14 + lVar41);
                        }
                        else {
                          if (pcVar32[lVar57] != '\0') {
                            if (pcVar32[lVar57 + (1 - lVar54)] != '\0') {
                              *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = puVar49[lVar57];
                              goto LAB_002dddc1;
                            }
                            uVar12 = TTA::Merge(puVar49[lVar57],
                                                *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8
                                                         + lVar22 * 4));
                            *(uint *)(lVar52 + lVar22 * 4) = uVar12;
                            goto LAB_002dddc1;
                          }
                          uVar12 = *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4)
                          ;
                          uVar27 = puVar14[lVar57];
                        }
                        uVar12 = TTA::Merge(uVar12,uVar27);
                        *(uint *)(lVar52 + lVar22 * 4) = uVar12;
                        goto LAB_002dddc1;
                      }
                      if (*(char *)(lVar16 + lVar22) == '\0') {
                        uVar23 = lVar18 + lVar22;
                        uVar12 = *(uint *)((long)puVar14 + lVar41);
                        local_160 = uVar23;
                        goto LAB_002e2275;
                      }
                      if (*(char *)(lVar11 + 4 + lVar22) != '\0') {
                        lVar40 = lVar54 * lVar28 + lVar24 + lVar10;
                        if (*(char *)(lVar22 + 3 + lVar40) == '\0') goto LAB_002e29f6;
                        if (*(char *)(lVar22 + 2 + lVar40) == '\0') {
LAB_002e2c2e:
                          uVar12 = *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4)
                          ;
LAB_002e2c46:
                          uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar41));
                          *(uint *)(lVar52 + lVar22 * 4) = uVar12;
                          uVar30 = lVar18 + lVar22;
                        }
                        else {
                          if (pcVar32[lVar57] != '\0') goto LAB_002e265a;
LAB_002e29b4:
                          uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 +
                                                       lVar22 * 4),puVar14[lVar57]);
                          *(uint *)(lVar52 + lVar22 * 4) = uVar12;
                          uVar30 = lVar18 + lVar22;
                        }
                        goto LAB_002de6d7;
                      }
                    }
                    *(undefined4 *)(lVar52 + lVar22 * 4) =
                         *(undefined4 *)(lVar26 + lVar39 + lVar22 * 4);
                    lVar21 = lVar21 + 0x200000000;
                    lVar17 = lVar17 + 8;
                    lVar57 = lVar22 + lVar18;
                    lVar22 = lVar22 + 2;
                    if (lVar45 <= lVar57 + 2) {
                      iVar37 = iVar37 + (int)lVar22;
                      uVar12 = (int)lVar18 + (int)lVar22;
                      break;
                    }
                  } while( true );
                }
                if (local_110 < (int)uVar12) goto LAB_002e1be7;
                uVar30 = (ulong)uVar12;
                if (*(char *)(lVar38 + uVar30) == '\0') {
                  uVar23 = (ulong)(iVar37 + 3);
                  if (pcVar1[uVar30] == '\0') {
                    if (*(char *)(lVar38 + uVar23) == '\0') {
LAB_002e28f7:
                      cVar8 = pcVar1[uVar23];
joined_r0x002e1057:
                      if (cVar8 == '\0') {
LAB_002e2901:
                        puVar14[uVar30] = 0;
                        goto LAB_002e68c2;
                      }
                    }
                    else {
LAB_002e28e8:
                      cVar8 = pcVar32[uVar23];
joined_r0x002e609f:
                      if (cVar8 != '\0') {
LAB_002e60a1:
                        uVar12 = puVar49[uVar30];
                        goto LAB_002e651a;
                      }
                    }
                    TTA::rtable_[TTA::length_] = TTA::length_;
                    TTA::next_[TTA::length_] = 0xffffffff;
                    TTA::tail_[TTA::length_] = TTA::length_;
                    uVar12 = TTA::length_ + 1;
                    puVar14[uVar30] = TTA::length_;
                    TTA::length_ = uVar12;
                    goto LAB_002e68c2;
                  }
                  if ((*(char *)(lVar38 + uVar23) == '\0') || (pcVar32[uVar23] == '\0')) {
                    lVar38 = (long)iVar37;
                    goto LAB_002e6516;
                  }
                  if (pcVar32[uVar30 - lVar54] == '\0') {
                    uVar12 = puVar49[uVar30];
                    lVar38 = (long)iVar37;
                    goto LAB_002e217a;
                  }
                }
                else {
                  lVar38 = (long)iVar37;
                  if (pcVar32[lVar38 + 3] == '\0') {
LAB_002e6516:
                    uVar12 = puVar14[lVar38];
LAB_002e651a:
                    puVar14[uVar30] = uVar12;
                    goto LAB_002e68c2;
                  }
                  if (pcVar32[uVar30 - lVar54] == '\0') {
LAB_002e2176:
                    uVar12 = puVar49[uVar30];
LAB_002e217a:
                    uVar27 = puVar14[lVar38];
LAB_002e5dec:
                    uVar12 = TTA::Merge(uVar12,uVar27);
                    puVar14[uVar30] = uVar12;
                    goto LAB_002e68c2;
                  }
                }
                if (pcVar32[iVar37] == '\0') {
                  uVar12 = puVar49[uVar30];
                  uVar27 = puVar14[iVar37];
                }
                else {
                  uVar12 = puVar49[iVar37];
                  if (pcVar32[(long)iVar37 + (1 - lVar54)] != '\0') {
                    puVar14[uVar30] = uVar12;
                    goto LAB_002e68c2;
                  }
                  uVar27 = puVar49[uVar30];
                }
                uVar12 = TTA::Merge(uVar12,uVar27);
                puVar14[uVar30] = uVar12;
                goto LAB_002e68c2;
              }
              if (cVar8 == '\0') {
                local_160 = lVar41 + 2 + lVar42;
                if (*(char *)(lVar42 + 3 + lVar17 + lVar10) != '\0') {
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  *(uint *)(lVar18 + lVar26 + 8 + lVar42 * 4) = TTA::length_;
                  TTA::length_ = uVar12;
                  local_160 = local_160 & 0xffffffff;
                  goto LAB_002e0bc3;
                }
                lVar11 = lVar11 + lVar18 + lVar26;
LAB_002e2599:
                puVar46 = (uint *)(lVar11 + 8);
                goto LAB_002e021b;
              }
              if (*(char *)(lVar39 + 3 + lVar42) != '\0') {
LAB_002defbc:
                uVar30 = (ulong)(uint)(iVar36 + iVar48);
                *(undefined4 *)(lVar43 + lVar42 * 4) = *(undefined4 *)(lVar24 + lVar42 * 4);
                goto LAB_002e1955;
              }
              if (*(char *)(lVar16 + lVar42) == '\0') {
                local_160 = (ulong)(uint)(iVar36 + iVar48);
                *(undefined4 *)(lVar43 + lVar42 * 4) = *(undefined4 *)(lVar24 + lVar42 * 4);
                goto LAB_002de1c1;
              }
              uVar12 = *(uint *)(lVar24 + lVar42 * 4);
              if (*(char *)(lVar52 + lVar42) == '\0') {
                uVar12 = TTA::Merge(uVar12,*(uint *)(lVar21 + 0x10 + lVar42 * 4));
              }
            }
            else {
              if (*(char *)(lVar39 + 3 + lVar42) != '\0') {
                uVar12 = iVar36 + iVar48;
                *(undefined4 *)(lVar43 + lVar42 * 4) = *(undefined4 *)(lVar24 + lVar42 * 4);
LAB_002e5c90:
                local_160 = (ulong)uVar12;
                goto LAB_002dddc1;
              }
              if (*(char *)(lVar22 + lVar42) == '\0') {
                uVar23 = (ulong)(uint)(iVar36 + iVar48);
                uVar12 = *(uint *)((long)puVar14 + lVar50);
                local_160 = lVar41 + lVar42 + 2;
                goto LAB_002e2275;
              }
              if (*(char *)(lVar16 + lVar42) == '\0') goto LAB_002deb12;
LAB_002de83e:
              if (*(char *)(lVar52 + lVar42) == '\0') {
                uVar12 = TTA::Merge(*(uint *)(lVar21 + 0x10 + lVar42 * 4),
                                    *(uint *)(lVar26 + lVar18 + lVar42 * 4));
              }
              else {
                uVar12 = *(uint *)(lVar24 + lVar42 * 4);
              }
            }
            *(uint *)(lVar43 + lVar42 * 4) = uVar12;
            lVar57 = lVar57 + 0x200000000;
            lVar11 = lVar11 + 8;
            lVar50 = lVar42 + lVar41;
            lVar42 = lVar42 + 2;
            if (lVar45 <= lVar50 + 4) {
              iVar37 = iVar37 + (int)lVar42;
              uVar12 = iVar36 + (int)lVar42;
              goto LAB_002de972;
            }
            goto LAB_002de7d6;
          }
LAB_002de972:
          uVar30 = (ulong)uVar12;
          if (local_110 < (int)uVar12) {
LAB_002e1be7:
            uVar30 = (ulong)uVar12;
            if ((*(char *)(lVar38 + uVar30) == '\0') && (pcVar1[uVar30] == '\0')) {
              puVar14[uVar30] = 0;
            }
            else {
              puVar14[uVar30] = puVar14[(long)(int)uVar12 + -2];
            }
          }
          else if (*(char *)(lVar38 + uVar30) == '\0') {
            uVar23 = (ulong)(iVar37 + 3);
            if (pcVar1[uVar30] != '\0') {
              if (*(char *)(lVar38 + uVar23) != '\0') {
                cVar8 = pcVar32[uVar23];
                goto joined_r0x002dead7;
              }
              goto LAB_002df3c2;
            }
            if (*(char *)(lVar38 + uVar23) != '\0') {
              uVar12 = puVar49[uVar30];
              goto LAB_002df3c5;
            }
            if (pcVar1[uVar23] == '\0') {
              puVar14[uVar30] = 0;
            }
            else {
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              puVar14[uVar30] = TTA::length_;
              TTA::length_ = uVar12;
            }
          }
          else {
            cVar8 = pcVar32[(long)iVar37 + 3];
joined_r0x002dead7:
            if (cVar8 == '\0') {
LAB_002df3c2:
              uVar12 = puVar14[iVar37];
            }
            else {
              uVar12 = puVar49[uVar30];
            }
LAB_002df3c5:
            puVar14[uVar30] = uVar12;
          }
          goto LAB_002e68c2;
        }
        if (uVar3 == 2) {
          if (cVar8 == '\0') {
            if (*pcVar1 == '\0') {
              if (*(char *)(lVar38 + 1) != '\0') goto LAB_002ddd4e;
              if (pcVar1[1] == '\0') goto LAB_002de240;
            }
            else if (*(char *)(lVar38 + 1) != '\0') goto LAB_002ddd4e;
LAB_002de0f5:
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *puVar14 = TTA::length_;
            TTA::length_ = uVar12;
          }
          else {
LAB_002ddd4e:
            if (pcVar32[1] == '\0') goto LAB_002de00e;
LAB_002de017:
            *puVar14 = *puVar49;
          }
        }
        else {
          if (cVar8 != '\0') {
LAB_002de00e:
            if (*pcVar32 == '\0') goto LAB_002de0f5;
            goto LAB_002de017;
          }
          if (*pcVar1 != '\0') goto LAB_002de0f5;
LAB_002de240:
          *puVar14 = 0;
        }
LAB_002e68c2:
        uVar29 = uVar29 + 2;
        lVar28 = lVar28 + 2;
        lVar20 = lVar20 + 2;
        lVar53 = lVar53 + 2;
      } while (uVar29 < uVar47);
    }
    if ((uVar13 & 0x80000001) != 1) goto LAB_002e9054;
    uVar29 = (ulong)(uVar13 - 1);
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar20 = *(long *)&pMVar4->field_0x10;
    lVar28 = **(long **)&pMVar4->field_0x48;
    lVar45 = lVar20 + lVar28 * uVar29;
    lVar54 = lVar45 - lVar28;
    lVar38 = *(long *)&pMVar5->field_0x10;
    lVar10 = **(long **)&pMVar5->field_0x48;
    lVar53 = lVar38 + lVar10 * uVar29;
    lVar26 = lVar53 + lVar10 * -2;
    if ((int)uVar3 < 3) {
      uVar12 = 0;
      iVar37 = -2;
    }
    else {
      lVar18 = lVar54 - lVar28;
      lVar39 = (long)local_110;
      lVar40 = lVar28 * (uVar29 - 2) + lVar20 + 3;
      lVar33 = (uVar29 - 1) * lVar28;
      lVar31 = lVar20 + lVar33 + 2;
      lVar28 = lVar28 * uVar29 + 3 + lVar20;
      lVar35 = lVar38 + lVar10 * uVar29 + 8;
      lVar38 = lVar10 * (uVar29 - 2) + lVar38 + 8;
      lVar20 = lVar20 + lVar33 + 4;
      iVar37 = -2;
      uVar29 = 0;
      do {
        iVar36 = (int)uVar29;
        uVar30 = (ulong)iVar36;
        lVar10 = (long)iVar37;
        if (*(char *)(lVar45 + uVar30) == '\0') {
          if (*(char *)(lVar45 + 3 + lVar10) == '\0') goto LAB_002e76bc;
          if (*(char *)(lVar54 + 3 + lVar10) != '\0') goto LAB_002e8030;
LAB_002e758f:
          if (*(char *)(lVar10 + 4 + lVar54) == '\0') {
            if (*(char *)(lVar54 + uVar30) != '\0') goto LAB_002e7eb4;
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
            goto LAB_002e7a38;
          }
          if (*(char *)(lVar54 + uVar30) == '\0') {
            *(undefined4 *)(lVar53 + uVar30 * 4) = *(undefined4 *)(lVar26 + 0x10 + lVar10 * 4);
          }
          else {
            uVar12 = *(uint *)(lVar26 + uVar30 * 4);
            if (*(char *)(lVar18 + 3 + lVar10) == '\0') {
              uVar12 = TTA::Merge(uVar12,*(uint *)(lVar26 + 0x10 + lVar10 * 4));
              *(uint *)(lVar53 + uVar30 * 4) = uVar12;
            }
            else {
              *(uint *)(lVar53 + uVar30 * 4) = uVar12;
            }
          }
LAB_002e7cc1:
          iVar37 = (int)uVar29;
          uVar12 = iVar37 + 2;
          if ((int)uVar12 < local_110) {
            lVar16 = (long)iVar37;
            lVar24 = lVar16 << 0x20;
            lVar10 = lVar35 + lVar16 * 4;
            lVar33 = lVar28 + lVar16;
            lVar11 = lVar20 + lVar16;
            lVar17 = lVar38 + lVar16 * 4;
            lVar21 = 0;
            do {
              iVar36 = (int)lVar21;
              if (*(char *)(lVar33 + -1 + lVar21) == '\0') {
                if (*(char *)(lVar33 + lVar21) == '\0') {
                  uVar30 = lVar16 + lVar21 + 2;
                  iVar36 = iVar37 + iVar36 + 2;
                  goto LAB_002e76bc;
                }
                if (*(char *)(lVar11 + -1 + lVar21) != '\0') {
                  uVar30 = lVar16 + lVar21 + 2;
                  iVar36 = iVar37 + 2 + iVar36;
                  goto LAB_002e8030;
                }
                if (*(char *)(lVar11 + lVar21) == '\0') goto LAB_002e7e8c;
                uVar12 = *(uint *)(lVar17 + lVar21 * 4);
                if (*(char *)(lVar40 + lVar16 + lVar21) == '\0') {
                  uVar27 = *(uint *)(lVar17 + 8 + lVar21 * 4);
LAB_002e7d8b:
                  uVar12 = TTA::Merge(uVar12,uVar27);
                }
              }
              else {
                if (*(char *)(lVar11 + -1 + lVar21) != '\0') {
                  uVar29 = (ulong)(iVar37 + iVar36 + 2);
                  uVar12 = *(uint *)(lVar17 + lVar21 * 4);
                  uVar30 = lVar16 + 2 + lVar21;
                  goto LAB_002e84b7;
                }
                if (*(char *)(lVar33 + lVar21) == '\0') {
                  iVar37 = iVar37 + iVar36 + 2;
                  uVar12 = *(uint *)(lVar53 + (lVar24 >> 0x1e));
                  uVar30 = lVar16 + lVar21 + 2;
                  goto LAB_002e87b6;
                }
                if (*(char *)(lVar11 + lVar21) == '\0') {
                  iVar37 = iVar37 + iVar36 + 2;
                  puVar25 = (undefined4 *)((lVar24 >> 0x1e) + lVar53);
                  uVar30 = lVar16 + lVar21 + 2;
                  goto LAB_002e827c;
                }
                if (*(char *)(lVar40 + lVar16 + lVar21) == '\0') {
                  uVar12 = *(uint *)(lVar17 + 8 + lVar21 * 4);
                  uVar27 = *(uint *)(lVar10 + -8 + lVar21 * 4);
                  goto LAB_002e7d8b;
                }
                uVar12 = *(uint *)(lVar17 + lVar21 * 4);
              }
              *(uint *)(lVar10 + lVar21 * 4) = uVar12;
              lVar24 = lVar24 + 0x200000000;
              lVar22 = lVar16 + lVar21;
              lVar21 = lVar21 + 2;
              if (lVar39 <= lVar22 + 4) {
                uVar12 = iVar37 + (int)lVar21 + 2;
                iVar37 = iVar37 + (int)lVar21;
                break;
              }
            } while( true );
          }
          uVar30 = (ulong)uVar12;
          if (local_110 < (int)uVar12) {
LAB_002e8d51:
            lVar20 = (long)(int)uVar30;
            if (*(char *)(lVar45 + lVar20) == '\0') {
              *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
            }
            else {
              *(undefined4 *)(lVar53 + lVar20 * 4) = *(undefined4 *)(lVar53 + -8 + lVar20 * 4);
            }
            goto LAB_002e9054;
          }
          lVar20 = (long)(int)uVar12;
          lVar28 = (long)iVar37;
          if (*(char *)(lVar45 + lVar20) == '\0') {
            if (*(char *)(lVar45 + 3 + lVar28) != '\0') goto LAB_002e8ed1;
            goto LAB_002e8edf;
          }
          if (*(char *)(lVar54 + 3 + lVar28) != '\0') goto LAB_002e8ed1;
          uVar9 = *(undefined4 *)(lVar53 + lVar28 * 4);
          goto LAB_002e8ed6;
        }
        if (*(char *)(lVar54 + 3 + lVar10) != '\0') {
          uVar12 = *(uint *)(lVar26 + uVar30 * 4);
          goto LAB_002e84b7;
        }
        if (*(char *)(lVar45 + 3 + lVar10) != '\0') goto LAB_002e758f;
        iVar37 = iVar36;
        if (*(char *)(lVar54 + uVar30) == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          uVar12 = *(uint *)(lVar26 + uVar30 * 4);
        }
LAB_002e87b6:
        *(uint *)(lVar53 + uVar30 * 4) = uVar12;
        uVar12 = iVar37 + 2;
        uVar29 = (ulong)uVar12;
      } while ((int)uVar12 < local_110);
    }
    lVar20 = (long)(int)uVar12;
    if (local_110 < (int)uVar12) {
      if (*(char *)(lVar45 + lVar20) == '\0') {
LAB_002e8edf:
        *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
        goto LAB_002e9054;
      }
      cVar8 = *(char *)(lVar54 + lVar20);
joined_r0x002e8b94:
      if (cVar8 == '\0') {
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar20 * 4) = TTA::length_;
        TTA::length_ = uVar12;
        goto LAB_002e9054;
      }
    }
    else {
      if ((*(char *)(lVar45 + lVar20) == '\0') && (*(char *)((long)iVar37 + 3 + lVar45) == '\0'))
      goto LAB_002e8edf;
      if (*(char *)(lVar54 + 3 + (long)iVar37) == '\0') {
        cVar8 = *(char *)(lVar54 + lVar20);
        goto joined_r0x002e8b94;
      }
    }
LAB_002e8ed1:
    uVar9 = *(undefined4 *)(lVar26 + lVar20 * 4);
LAB_002e8ed6:
    *(undefined4 *)(lVar53 + lVar20 * 4) = uVar9;
    goto LAB_002e9054;
  }
  lVar53 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  iVar37 = (int)(uVar19 - 2);
  if (2 < (int)uVar3) {
    iVar48 = -2;
    iVar36 = 0;
LAB_002dd30f:
    lVar20 = (long)iVar36;
    if (*(char *)(lVar45 + lVar20) == '\0') {
      if (*(char *)(lVar45 + 3 + (long)iVar48) != '\0') {
        puVar14[TTA::length_] = TTA::length_;
        puVar49[TTA::length_] = 0xffffffff;
        puVar46[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar20 * 4) = TTA::length_;
        TTA::length_ = uVar12;
        goto LAB_002dd3a1;
      }
      uVar9 = 0;
      goto LAB_002dd430;
    }
    cVar8 = *(char *)(lVar45 + 3 + (long)iVar48);
    puVar14[TTA::length_] = TTA::length_;
    puVar49[TTA::length_] = 0xffffffff;
    puVar46[TTA::length_] = TTA::length_;
    uVar12 = TTA::length_ + 1;
    *(uint *)(lVar53 + lVar20 * 4) = TTA::length_;
    TTA::length_ = uVar12;
    iVar48 = iVar36;
    if (cVar8 == '\0') goto LAB_002dd436;
LAB_002dd3a1:
    puVar6 = TTA::tail_;
    puVar34 = TTA::next_;
    iVar48 = iVar36 + 2;
    if (iVar48 < iVar37) {
      lVar20 = (long)iVar48;
      do {
        iVar48 = iVar36;
        lVar28 = (long)iVar48;
        if (*(char *)(lVar45 + lVar20) == '\0') {
          if (*(char *)(lVar45 + 3 + lVar28) == '\0') {
            uVar9 = 0;
            goto LAB_002dd429;
          }
          puVar14[TTA::length_] = TTA::length_;
          puVar34[TTA::length_] = 0xffffffff;
          puVar6[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          if (*(char *)(lVar45 + 3 + lVar28) == '\0') goto LAB_002dd414;
          uVar12 = *(uint *)(lVar53 + lVar28 * 4);
        }
        *(uint *)(lVar53 + lVar20 * 4) = uVar12;
        lVar20 = lVar20 + 2;
        iVar36 = iVar48 + 2;
        if ((long)(uVar19 - 2) <= lVar20) {
          iVar48 = iVar48 + 4;
          break;
        }
      } while( true );
    }
    lVar20 = (long)iVar48;
    if (iVar37 < iVar48) {
      if (*(char *)(lVar45 + lVar20) == '\0') {
        *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
      }
      else {
        *(undefined4 *)(lVar53 + lVar20 * 4) = *(undefined4 *)(lVar53 + (long)iVar36 * 4);
      }
    }
    else if (*(char *)(lVar45 + lVar20) == '\0') {
      if (*(char *)(lVar45 + 3 + (long)iVar36) == '\0') {
        *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
      }
      else {
        puVar14[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar20 * 4) = TTA::length_;
        TTA::length_ = uVar12;
      }
    }
    else {
      *(undefined4 *)(lVar53 + lVar20 * 4) = *(undefined4 *)(lVar53 + (long)iVar36 * 4);
    }
    goto LAB_002e9054;
  }
  iVar36 = 0;
  lVar20 = -2;
  goto LAB_002dd91e;
LAB_002dd63e:
  iVar37 = (int)lVar38 + (int)lVar26;
  *(undefined4 *)(lVar10 + 8 + lVar26 * 4) = *(undefined4 *)(lVar10 + lVar26 * 4);
LAB_002dd654:
  puVar6 = TTA::tail_;
  puVar34 = TTA::next_;
  iVar36 = iVar37 + 2;
  if (iVar36 < local_110) {
    lVar35 = (long)iVar37;
    lVar54 = lVar35 + 2;
    lVar31 = (lVar35 << 0x20) + 0x300000000;
    lVar38 = lVar28 + lVar35 * 4;
    lVar10 = lVar20 + 1 + lVar45 + lVar35;
    lVar35 = lVar35 + lVar45 + 2;
    lVar26 = 0;
    do {
      if (*(char *)(lVar35 + lVar26) == '\0') {
        if (*(char *)(lVar10 + 1 + lVar26) == '\0') {
          uVar23 = lVar54 + lVar26;
          if (*(char *)(lVar45 + (lVar31 >> 0x20)) != '\0') {
            puVar14[TTA::length_] = TTA::length_;
            puVar49[TTA::length_] = 0xffffffff;
            puVar46[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
            goto LAB_002dd8b5;
          }
          if (*(char *)(lVar53 + (lVar31 >> 0x20)) != '\0') {
            puVar14[TTA::length_] = TTA::length_;
            puVar49[TTA::length_] = 0xffffffff;
            puVar46[TTA::length_] = TTA::length_;
            iVar37 = (int)uVar23;
            uVar12 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
            goto LAB_002dd57e;
          }
          uVar30 = uVar23 & 0xffffffff;
          goto LAB_002dd8f0;
        }
        if (*(char *)(lVar35 + 1 + lVar26) != '\0') {
          if (*(char *)(lVar26 + lVar10) == '\0') {
            puVar14[TTA::length_] = TTA::length_;
            puVar49[TTA::length_] = 0xffffffff;
            puVar46[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            uVar12 = *(uint *)(lVar38 + lVar26 * 4);
          }
          goto LAB_002dd8b5;
        }
        if (*(char *)(lVar10 + lVar26) != '\0') goto LAB_002dd6e3;
        puVar14[TTA::length_] = TTA::length_;
        puVar34[TTA::length_] = 0xffffffff;
        puVar6[TTA::length_] = TTA::length_;
LAB_002dd737:
        uVar12 = TTA::length_;
        TTA::length_ = TTA::length_ + 1;
      }
      else {
        if (*(char *)(lVar10 + lVar26) == '\0') {
          if (*(char *)(lVar35 + 1 + lVar26) == '\0') {
            puVar14[TTA::length_] = TTA::length_;
            puVar34[TTA::length_] = 0xffffffff;
            puVar6[TTA::length_] = TTA::length_;
            goto LAB_002dd737;
          }
          puVar14[TTA::length_] = TTA::length_;
          puVar49[TTA::length_] = 0xffffffff;
          puVar46[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
          goto LAB_002dd8b5;
        }
        if (*(char *)(lVar35 + 1 + lVar26) != '\0') goto LAB_002dd76d;
LAB_002dd6e3:
        uVar12 = *(uint *)(lVar38 + lVar26 * 4);
      }
      *(uint *)(lVar38 + 8 + lVar26 * 4) = uVar12;
      lVar31 = lVar31 + 0x200000000;
      lVar33 = lVar26 + lVar54;
      lVar26 = lVar26 + 2;
      if ((long)local_110 <= lVar33 + 2) {
        iVar36 = (int)lVar26 + iVar37 + 2;
        iVar37 = iVar37 + (int)lVar26;
        break;
      }
    } while( true );
  }
  lVar38 = (long)iVar36;
  if (local_110 < iVar36) {
    if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar53 + lVar38) == '\0'))
    goto LAB_002ddc98;
  }
  else if (*(char *)(lVar45 + lVar38) == '\0') {
    if (*(char *)(lVar53 + lVar38) != '\0') {
      if (*(char *)(lVar53 + 1 + (long)iVar37) != '\0') {
        uVar12 = *(uint *)(lVar28 + (long)iVar37 * 4);
        goto LAB_002ddc9a;
      }
LAB_002ddc87:
      puVar14[TTA::length_] = TTA::length_;
      goto LAB_002dda82;
    }
LAB_002ddc25:
    if (*(char *)((long)iVar37 + 3 + lVar45) == '\0') {
      if (*(char *)(lVar53 + 3 + (long)iVar37) == '\0') goto LAB_002ddc98;
      goto LAB_002ddc87;
    }
    goto LAB_002ddc2f;
  }
  if (*(char *)(lVar53 + 1 + (long)iVar37) != '\0') {
    uVar12 = *(uint *)(lVar28 + (long)iVar37 * 4);
    goto LAB_002ddc9a;
  }
LAB_002ddc2f:
  puVar14[TTA::length_] = TTA::length_;
  TTA::next_[TTA::length_] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar12 = TTA::length_;
  TTA::length_ = TTA::length_ + 1;
  goto LAB_002ddc9a;
LAB_002dd76d:
  uVar12 = *(uint *)(lVar38 + lVar26 * 4);
LAB_002dd8b5:
  uVar23 = lVar54 + lVar26;
  iVar37 = (int)uVar23;
  goto LAB_002dd57e;
LAB_002e290e:
  uVar30 = lVar18 + lVar22;
  if (*(char *)(lVar22 + 2 + lVar54 * lVar28 + lVar24 + lVar10) == '\0') {
    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4),
                        *(uint *)((long)puVar14 + lVar41));
    *(uint *)(lVar52 + lVar22 * 4) = uVar12;
  }
  else if (pcVar32[lVar57] == '\0') {
    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4),
                        puVar14[lVar57]);
    *(uint *)(lVar52 + lVar22 * 4) = uVar12;
  }
  else if (pcVar32[lVar57 + (1 - lVar54)] == '\0') {
    uVar12 = TTA::Merge(puVar49[lVar57],
                        *(uint *)(lVar31 * lVar28 + lVar24 * 4 + lVar26 + 8 + lVar22 * 4));
    *(uint *)(lVar52 + lVar22 * 4) = uVar12;
  }
  else {
    *(uint *)(lVar39 + lVar26 + 8 + lVar22 * 4) = puVar49[lVar57];
  }
LAB_002e1955:
  iVar37 = (int)uVar30;
  uVar12 = iVar37 + 2;
  if ((int)uVar12 < local_110) {
    lVar11 = (long)iVar37;
    lVar18 = lVar11 + 2;
    lVar52 = lVar11 << 0x20;
    lVar39 = lVar31 * lVar28 + lVar11 * 4;
    lVar40 = lVar26 + lVar39;
    lVar16 = lVar40 + 8;
    lVar17 = lVar35 + lVar11 * 4;
    lVar57 = lVar26 + lVar17 + 8;
    lVar22 = lVar54 * lVar53 + lVar11;
    lVar42 = lVar54 * lVar28 + lVar11;
    lVar43 = lVar54 * lVar20 + lVar11;
    lVar21 = lVar10 + lVar43;
    lVar24 = lVar10 + lVar11 + lVar33;
    lVar11 = 0;
    lVar41 = 0;
    do {
      lVar50 = lVar52 >> 0x1e;
      if (*(char *)(lVar24 + 2 + lVar41) != '\0') {
        uVar23 = lVar18 + lVar41;
        lVar39 = lVar52 + 0x300000000 >> 0x20;
        local_160 = uVar23;
        if (pcVar32[lVar39] != '\0') {
          if (*(char *)(lVar41 + 2 + lVar43 + lVar10) != '\0') {
            *(undefined4 *)(lVar57 + lVar41 * 4) = *(undefined4 *)(lVar16 + lVar41 * 4);
            goto LAB_002dddc1;
          }
          if (*(char *)(lVar41 + 2 + lVar42 + lVar10) != '\0') {
            *(undefined4 *)(lVar17 + lVar26 + 8 + lVar41 * 4) =
                 *(undefined4 *)((long)puVar49 + lVar50);
            goto LAB_002dddc1;
          }
          uVar12 = TTA::Merge(*(uint *)(lVar16 + lVar41 * 4),*(uint *)((long)puVar14 + lVar50));
          *(uint *)(lVar57 + lVar41 * 4) = uVar12;
          goto LAB_002dddc1;
        }
        if (*(char *)(lVar38 + lVar39) == '\0') {
          uVar12 = *(uint *)((long)puVar14 + lVar50);
          goto LAB_002e2275;
        }
        lVar40 = lVar52 + 0x400000000 >> 0x20;
        if (pcVar32[lVar40] == '\0') {
          uVar12 = *(uint *)((long)puVar14 + lVar50);
          goto LAB_002e1fd0;
        }
        if (pcVar32[lVar39 - lVar54] == '\0') {
          uVar12 = TTA::Merge(puVar49[lVar40],*(uint *)((long)puVar14 + lVar50));
          goto LAB_002e2b94;
        }
        if (*(char *)(lVar41 + 2 + lVar43 + lVar10) != '\0') {
          *(undefined4 *)(lVar57 + lVar41 * 4) = *(undefined4 *)(lVar16 + lVar41 * 4);
          goto LAB_002e1f19;
        }
        if (*(char *)(lVar41 + 2 + lVar42 + lVar10) == '\0') {
          uVar12 = TTA::Merge(*(uint *)(lVar16 + lVar41 * 4),*(uint *)((long)puVar14 + lVar50));
          *(uint *)(lVar57 + lVar41 * 4) = uVar12;
          uVar30 = uVar23;
        }
        else {
          *(undefined4 *)(lVar17 + lVar26 + 8 + lVar41 * 4) =
               *(undefined4 *)((long)puVar49 + lVar50);
          uVar30 = uVar23 & 0xffffffff;
        }
        goto LAB_002de6d7;
      }
      cVar8 = *(char *)(lVar24 + 3 + lVar41);
      if (*(char *)(lVar10 + lVar22 + 2 + lVar41) == '\0') {
        if (cVar8 == '\0') {
          local_160 = lVar18 + lVar41;
          if (*(char *)(lVar41 + 3 + lVar22 + lVar10) != '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            local_160 = local_160 & 0xffffffff;
            goto LAB_002e0bc3;
          }
          lVar11 = lVar11 + lVar17 + lVar26;
          goto LAB_002e2599;
        }
        if (*(char *)(lVar21 + 3 + lVar41) == '\0') goto LAB_002e1e7d;
LAB_002e1aa2:
        uVar12 = *(uint *)(lVar16 + lVar41 * 4);
      }
      else {
        if (cVar8 == '\0') {
          uVar12 = (int)lVar18 + (int)lVar41;
          *(undefined4 *)(lVar17 + lVar26 + 8 + lVar41 * 4) =
               *(undefined4 *)((long)puVar14 + lVar50);
          goto LAB_002e1cbb;
        }
        if (*(char *)(lVar21 + 3 + lVar41) == '\0') {
          uVar23 = lVar18 + lVar41;
          lVar18 = lVar52 + 0x400000000 >> 0x20;
          if (pcVar32[lVar18] == '\0') {
            uVar12 = *(uint *)((long)puVar14 + lVar50);
            local_160 = uVar23 & 0xffffffff;
            goto LAB_002e1fd0;
          }
          if (*(char *)(lVar41 + 3 + lVar42 + lVar10) == '\0') {
            uVar12 = TTA::Merge(puVar49[lVar18],*(uint *)((long)puVar14 + lVar50));
            *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = uVar12;
            uVar30 = uVar23 & 0xffffffff;
            goto LAB_002de6d7;
          }
          if (*(char *)(lVar41 + 2 + lVar43 + lVar10) == '\0') {
            if (*(char *)(lVar41 + 2 + lVar42 + lVar10) == '\0') {
              uVar12 = TTA::Merge(*(uint *)(lVar16 + lVar41 * 4),*(uint *)((long)puVar14 + lVar50));
              *(uint *)(lVar57 + lVar41 * 4) = uVar12;
              uVar30 = uVar23 & 0xffffffff;
              goto LAB_002de6d7;
            }
            *(undefined4 *)(lVar17 + lVar26 + 8 + lVar41 * 4) =
                 *(undefined4 *)((long)puVar49 + lVar50);
          }
          else {
            *(undefined4 *)(lVar57 + lVar41 * 4) = *(undefined4 *)(lVar16 + lVar41 * 4);
          }
          uVar30 = uVar23 & 0xffffffff;
          goto LAB_002de6d7;
        }
        if (*(char *)(lVar21 + 2 + lVar41) != '\0') goto LAB_002e1aa2;
        if (*(char *)(lVar10 + lVar42 + 2 + lVar41) == '\0') {
          uVar12 = TTA::Merge(*(uint *)(lVar16 + lVar41 * 4),*(uint *)(lVar26 + lVar17 + lVar41 * 4)
                             );
        }
        else {
          uVar12 = *(uint *)(lVar40 + lVar41 * 4);
        }
      }
      *(uint *)(lVar57 + lVar41 * 4) = uVar12;
      lVar52 = lVar52 + 0x200000000;
      lVar11 = lVar11 + 8;
      lVar50 = lVar18 + lVar41;
      lVar41 = lVar41 + 2;
      if (lVar45 <= lVar50 + 2) {
        iVar37 = iVar37 + (int)lVar41;
        uVar12 = (int)lVar18 + (int)lVar41;
        break;
      }
    } while( true );
  }
  uVar30 = (ulong)uVar12;
  if (local_110 < (int)uVar12) goto LAB_002e1be7;
  if (*(char *)(lVar38 + uVar30) == '\0') {
    uVar23 = (ulong)(iVar37 + 3);
    if (pcVar1[uVar30] == '\0') {
      if (*(char *)(lVar38 + uVar23) == '\0') goto LAB_002e28f7;
LAB_002e1f4f:
      if (pcVar32[uVar23] != '\0') goto LAB_002e60a1;
      cVar8 = pcVar32[uVar30];
      goto joined_r0x002e609f;
    }
    if ((*(char *)(lVar38 + uVar23) == '\0') || (pcVar32[uVar23] == '\0')) {
      lVar38 = (long)iVar37;
      goto LAB_002e6516;
    }
    if (pcVar32[uVar30] != '\0') goto LAB_002e60a1;
    if (pcVar32[uVar30 - lVar54] == '\0') {
      uVar12 = puVar49[uVar30];
      lVar38 = (long)iVar37;
      goto LAB_002e217a;
    }
LAB_002e5945:
    lVar38 = (long)iVar37;
  }
  else {
    lVar38 = (long)iVar37;
    if (pcVar32[lVar38 + 3] == '\0') goto LAB_002e6516;
    if (pcVar32[uVar30] != '\0') {
LAB_002e3d35:
      uVar12 = puVar49[uVar30];
LAB_002e68b6:
      puVar14[uVar30] = uVar12;
      goto LAB_002e68c2;
    }
    if (pcVar32[uVar30 - lVar54] == '\0') goto LAB_002e2176;
  }
  uVar12 = puVar49[lVar38];
  goto LAB_002e651a;
LAB_002e1e7d:
  local_160 = lVar18 + lVar41;
  lVar40 = lVar52 + 0x400000000 >> 0x20;
  cVar8 = *(char *)(lVar41 + 2 + lVar43 + lVar10);
  if (pcVar32[lVar40] == '\0') {
    if (cVar8 == '\0') {
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_ + 1;
      *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = TTA::length_;
      TTA::length_ = uVar12;
      uVar30 = local_160 & 0xffffffff;
      goto LAB_002de3c4;
    }
    *(undefined4 *)(lVar57 + lVar41 * 4) = *(undefined4 *)(lVar16 + lVar41 * 4);
LAB_002e26a8:
    local_160 = local_160 & 0xffffffff;
LAB_002de1c1:
    lVar18 = (long)(int)local_160;
    uVar30 = lVar18 + 2;
    uVar12 = (uint)uVar30;
    if ((int)uVar12 < local_110) {
      local_160 = uVar30;
      if (*(char *)(lVar38 + uVar30) == '\0') {
        cVar8 = *(char *)(lVar18 + 3 + lVar38);
        if (pcVar1[lVar18 + 2] == '\0') {
          if (cVar8 == '\0') {
            if (pcVar1[lVar18 + 3] != '\0') {
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              puVar14[lVar18 + 2] = TTA::length_;
              TTA::length_ = uVar12;
              local_160 = uVar30 & 0xffffffff;
              goto LAB_002e0bc3;
            }
            puVar46 = puVar14 + uVar30;
            goto LAB_002e021b;
          }
          if (pcVar32[lVar18 + 3] == '\0') goto LAB_002df75a;
          puVar14[lVar18 + 2] = puVar49[lVar18 + 2];
          goto LAB_002e1955;
        }
        if (cVar8 == '\0') {
          puVar14[lVar18 + 2] = puVar14[lVar18];
          goto LAB_002e3931;
        }
        if (pcVar32[lVar18 + 3] == '\0') goto LAB_002dea6b;
        if (pcVar32[uVar30 - lVar54] == '\0') {
          uVar12 = puVar49[lVar18 + 2];
          uVar27 = puVar14[lVar18];
        }
        else {
          uVar12 = puVar49[lVar18];
          if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
            puVar14[lVar18 + 2] = uVar12;
            goto LAB_002e1955;
          }
          uVar27 = puVar49[lVar18 + 2];
        }
        uVar12 = TTA::Merge(uVar12,uVar27);
        puVar14[lVar18 + 2] = uVar12;
        goto LAB_002e1955;
      }
      if (pcVar32[lVar18 + 3] != '\0') {
        if (pcVar32[uVar30 - lVar54] == '\0') {
          uVar12 = puVar49[lVar18 + 2];
          uVar27 = puVar14[lVar18];
        }
        else {
          uVar12 = puVar49[lVar18];
          if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
            puVar14[lVar18 + 2] = uVar12;
            goto LAB_002dddc1;
          }
          uVar27 = puVar49[lVar18 + 2];
        }
        uVar12 = TTA::Merge(uVar12,uVar27);
        puVar14[lVar18 + 2] = uVar12;
        goto LAB_002dddc1;
      }
      if (*(char *)(lVar38 + 3 + lVar18) == '\0') {
        uVar12 = puVar14[lVar18];
        uVar23 = uVar30 & 0xffffffff;
        goto LAB_002e2275;
      }
LAB_002dea6b:
      if (pcVar32[lVar18 + 4] == '\0') {
        uVar12 = puVar14[lVar18];
        local_160 = uVar30 & 0xffffffff;
        uVar23 = uVar30;
        goto LAB_002e1fd0;
      }
      if (pcVar32[lVar18 + (3 - lVar54)] == '\0') {
        uVar12 = TTA::Merge(puVar49[lVar18 + 4],puVar14[lVar18]);
        goto LAB_002df76a;
      }
      if (pcVar32[uVar30 - lVar54] == '\0') {
        uVar12 = puVar49[lVar18 + 2];
        uVar27 = puVar14[lVar18];
      }
      else {
        uVar12 = puVar49[lVar18];
        if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
          puVar14[lVar18 + 2] = uVar12;
          goto LAB_002de6d7;
        }
        uVar27 = puVar49[lVar18 + 2];
      }
      uVar12 = TTA::Merge(uVar12,uVar27);
      puVar14[lVar18 + 2] = uVar12;
      goto LAB_002de6d7;
    }
    if (local_110 < (int)uVar12) goto LAB_002e1be7;
    uVar30 = uVar30 & 0xffffffff;
    if (*(char *)(lVar38 + uVar30) == '\0') {
      uVar23 = (ulong)((int)local_160 + 3);
      if (pcVar1[uVar30] == '\0') {
        if (*(char *)(lVar38 + uVar23) == '\0') {
          if (pcVar1[uVar23] == '\0') {
LAB_002e26f5:
            puVar14[uVar30] = 0;
            goto LAB_002e68c2;
          }
        }
        else if (pcVar32[uVar23] != '\0') {
          uVar12 = puVar49[uVar30];
LAB_002e2a67:
          puVar14[uVar30] = uVar12;
          goto LAB_002e68c2;
        }
LAB_002e3102:
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_;
LAB_002e3351:
        TTA::length_ = uVar12 + 1;
        puVar14[uVar30] = uVar12;
        goto LAB_002e68c2;
      }
      if (*(char *)(lVar38 + uVar23) != '\0') {
        cVar8 = pcVar32[uVar23];
        goto joined_r0x002debe9;
      }
    }
    else {
      cVar8 = pcVar32[lVar18 + 3];
joined_r0x002debe9:
      if (cVar8 != '\0') {
        if (pcVar32[uVar30 - lVar54] == '\0') {
          uVar12 = puVar49[uVar30];
          uVar27 = puVar14[lVar18];
        }
        else {
          uVar12 = puVar49[lVar18];
          if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
            puVar14[uVar30] = uVar12;
            goto LAB_002e68c2;
          }
          uVar27 = puVar49[uVar30];
        }
        uVar12 = TTA::Merge(uVar12,uVar27);
        puVar14[uVar30] = uVar12;
        goto LAB_002e68c2;
      }
    }
    puVar14[uVar30] = puVar14[lVar18];
    goto LAB_002e68c2;
  }
  if (cVar8 == '\0') {
    *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = puVar49[lVar40];
    uVar30 = local_160 & 0xffffffff;
  }
  else {
    uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar41 * 4);
    if (*(char *)(lVar41 + 3 + lVar42 + lVar10) == '\0') {
      uVar12 = TTA::Merge(uVar12,puVar49[lVar40]);
LAB_002e2b94:
      local_160 = lVar18 + lVar41;
      *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = uVar12;
      uVar30 = local_160;
    }
    else {
      *(uint *)(lVar17 + lVar26 + 8 + lVar41 * 4) = uVar12;
LAB_002e1f19:
      local_160 = lVar18 + lVar41;
      uVar30 = local_160;
    }
  }
  goto LAB_002de6d7;
LAB_002df75a:
  if (pcVar32[lVar18 + 4] == '\0') {
    TTA::rtable_[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar12 = TTA::length_ + 1;
    puVar14[lVar18 + 2] = TTA::length_;
    TTA::length_ = uVar12;
LAB_002de3c4:
    puVar7 = TTA::tail_;
    puVar6 = TTA::next_;
    puVar34 = TTA::rtable_;
    iVar37 = (int)uVar30;
    uVar12 = iVar37 + 2;
    if ((int)uVar12 < local_110) {
      lVar21 = (long)iVar37;
      lVar18 = lVar21 + 2;
      lVar22 = lVar21 << 0x20;
      lVar17 = lVar54 * lVar53 + lVar21;
      lVar39 = lVar10 + lVar33 + lVar21;
      lVar40 = lVar10 + lVar54 * lVar20 + lVar21;
      lVar11 = lVar21 * 4;
      lVar24 = lVar21 * 4 + lVar35;
      puVar44 = (uint *)(lVar24 + lVar26 + 8);
      lVar16 = 0;
      puVar46 = puVar44;
      while (lVar52 = lVar22 >> 0x1e, *(char *)(lVar39 + 2 + lVar16) == '\0') {
        if (*(char *)(lVar10 + lVar17 + 2 + lVar16) != '\0') {
          uVar30 = lVar18 + lVar16;
          lVar18 = lVar22 + 0x300000000 >> 0x20;
          if (*(char *)(lVar38 + lVar18) == '\0') {
            *(undefined4 *)(lVar11 + lVar35 + lVar26 + 8 + lVar16 * 4) =
                 *(undefined4 *)((long)puVar14 + lVar52);
            goto LAB_002e3931;
          }
          if (pcVar32[lVar18] != '\0') {
            uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar16 * 4),
                                *(uint *)((long)puVar14 + lVar52));
            *(uint *)(lVar11 + lVar35 + lVar26 + 8 + lVar16 * 4) = uVar12;
            goto LAB_002e1955;
          }
          lVar39 = lVar22 + 0x400000000 >> 0x20;
          if (pcVar32[lVar39] == '\0') {
            uVar12 = *(uint *)((long)puVar14 + lVar52);
            local_160 = uVar30 & 0xffffffff;
            uVar23 = uVar30;
            goto LAB_002e1fd0;
          }
          lVar40 = lVar26 + 8 + lVar11 + lVar35;
          if (pcVar32[lVar18 - lVar54] == '\0') {
            uVar12 = TTA::Merge(puVar49[lVar39],*(uint *)((long)puVar14 + lVar52));
            *(uint *)(lVar40 + lVar16 * 4) = uVar12;
          }
          else {
            uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar16 * 4),
                                *(uint *)((long)puVar14 + lVar52));
            *(uint *)(lVar40 + lVar16 * 4) = uVar12;
          }
          goto LAB_002de6d7;
        }
        if (*(char *)(lVar39 + 3 + lVar16) == '\0') {
          local_160 = lVar18 + lVar16;
          if (*(char *)(lVar16 + 3 + lVar17 + lVar10) == '\0') goto LAB_002e021b;
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar24 + lVar26 + 8 + lVar16 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          goto LAB_002dede4;
        }
        iVar36 = (int)lVar18;
        if (*(char *)(lVar40 + 3 + lVar16) != '\0') {
          *(undefined4 *)(lVar11 + lVar35 + lVar26 + 8 + lVar16 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar16 * 4);
          uVar30 = (ulong)(uint)(iVar36 + (int)lVar16);
          goto LAB_002e1955;
        }
        if (*(char *)(lVar40 + 4 + lVar16) != '\0') {
          *(undefined4 *)(lVar11 + lVar35 + lVar26 + 8 + lVar16 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 0x10 + lVar16 * 4);
          uVar30 = (ulong)(uint)(iVar36 + (int)lVar16);
          goto LAB_002de6d7;
        }
        puVar34[TTA::length_] = TTA::length_;
        puVar6[TTA::length_] = 0xffffffff;
        puVar7[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        puVar44[lVar16] = TTA::length_;
        TTA::length_ = uVar12;
        lVar22 = lVar22 + 0x200000000;
        puVar46 = puVar46 + 2;
        lVar52 = lVar18 + lVar16;
        lVar16 = lVar16 + 2;
        if (lVar45 <= lVar52 + 2) {
          iVar37 = iVar37 + (int)lVar16;
          uVar12 = iVar36 + (int)lVar16;
          goto LAB_002de583;
        }
      }
      uVar30 = lVar18 + lVar16;
      lVar18 = lVar22 + 0x300000000 >> 0x20;
      if (pcVar32[lVar18] != '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar16 * 4),
                            *(uint *)((long)puVar14 + lVar52));
        *(uint *)(lVar11 + lVar35 + lVar26 + 8 + lVar16 * 4) = uVar12;
        local_160 = uVar30;
        goto LAB_002dddc1;
      }
      if (*(char *)(lVar38 + lVar18) == '\0') {
        uVar12 = *(uint *)((long)puVar14 + lVar52);
        uVar23 = uVar30 & 0xffffffff;
        local_160 = uVar30;
LAB_002e2275:
        puVar14[local_160] = uVar12;
        iVar37 = (int)uVar23;
        lVar18 = (long)iVar37;
        local_160 = lVar18 + 2;
        if ((int)local_160 < local_110) {
          uVar30 = local_160;
          if (*(char *)(lVar38 + local_160) == '\0') {
            cVar8 = *(char *)(lVar18 + 3 + lVar38);
            if (pcVar1[lVar18 + 2] == '\0') {
              if (cVar8 == '\0') {
                if (pcVar1[lVar18 + 3] != '\0') {
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  puVar14[lVar18 + 2] = TTA::length_;
                  TTA::length_ = uVar12;
                  goto LAB_002e0bc3;
                }
                puVar46 = puVar14 + local_160;
                goto LAB_002e021b;
              }
              cVar8 = pcVar32[lVar18 + 3];
joined_r0x002e26c0:
              if (cVar8 != '\0') {
                puVar14[lVar18 + 2] = puVar49[lVar18 + 2];
                goto LAB_002e1955;
              }
LAB_002e2bb9:
              if (pcVar32[lVar18 + 4] == '\0') {
                if (pcVar32[lVar18 + 2] == '\0') {
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  puVar14[lVar18 + 2] = TTA::length_;
                  TTA::length_ = uVar12;
                  goto LAB_002e34f4;
                }
                puVar14[lVar18 + 2] = puVar49[lVar18 + 2];
                goto LAB_002de1c1;
              }
              if (pcVar32[lVar18 + 2] == '\0') {
                uVar12 = puVar49[lVar18 + 4];
              }
              else {
                uVar12 = puVar49[lVar18 + 2];
                if (pcVar32[lVar18 + (3 - lVar54)] != '\0') {
LAB_002e2beb:
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002de6d7;
                }
                uVar27 = puVar49[lVar18 + 4];
LAB_002e3893:
                uVar12 = TTA::Merge(uVar12,uVar27);
              }
            }
            else {
              if (cVar8 == '\0') {
                if (pcVar1[lVar18 + 1] == '\0') {
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  puVar14[lVar18 + 2] = TTA::length_;
                  TTA::length_ = uVar12;
                }
                else {
                  puVar14[lVar18 + 2] = puVar14[lVar18];
                }
LAB_002e3931:
                puVar6 = TTA::tail_;
                puVar34 = TTA::next_;
                puVar46 = TTA::rtable_;
                iVar37 = (int)uVar30;
                uVar12 = iVar37 + 2;
                if ((int)uVar12 < local_110) {
                  lVar21 = (long)iVar37;
                  lVar18 = lVar21 + 2;
                  lVar22 = lVar21 << 0x20;
                  lVar17 = lVar10 + 3 + lVar33 + lVar21;
                  lVar11 = lVar35 + lVar21 * 4;
                  lVar16 = lVar26 + lVar11 + 8;
                  lVar39 = lVar10 + lVar54 * lVar53 + lVar21;
                  lVar40 = 0;
                  lVar24 = 0;
                  while( true ) {
                    lVar52 = lVar22 >> 0x20;
                    if (*(char *)(lVar17 + -1 + lVar24) != '\0') goto LAB_002e3b1b;
                    if (*(char *)(lVar39 + 2 + lVar24) == '\0') break;
                    if (*(char *)(lVar17 + lVar24) != '\0') {
                      uVar30 = lVar18 + lVar24;
                      lVar39 = lVar54 * lVar20 + lVar21 + lVar10;
                      cVar8 = *(char *)(lVar24 + 3 + lVar39);
                      if (pcVar1[lVar52 + 1] != '\0') {
                        if (cVar8 != '\0') {
                          uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 +
                                                       lVar24 * 4),puVar14[lVar52]);
                          *(uint *)(lVar16 + lVar24 * 4) = uVar12;
                          goto LAB_002e1955;
                        }
                        lVar40 = lVar22 + 0x400000000 >> 0x20;
                        if (pcVar32[lVar40] != '\0') {
                          if (*(char *)(lVar24 + 3 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
                            if (*(char *)(lVar24 + 2 + lVar39) == '\0') {
                              uVar12 = TTA::Merge(puVar49[lVar40],puVar14[lVar52]);
                              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                            }
                            else {
                              uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 +
                                                            8 + lVar24 * 4),puVar49[lVar40]);
                              uVar12 = TTA::Merge(uVar12,puVar14[lVar52]);
                              *(uint *)(lVar16 + lVar24 * 4) = uVar12;
                            }
                          }
                          else {
                            uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8
                                                         + lVar24 * 4),puVar14[lVar52]);
                            *(uint *)(lVar16 + lVar24 * 4) = uVar12;
                          }
                          goto LAB_002de6d7;
                        }
                        if (*(char *)(lVar24 + 2 + lVar39) != '\0') {
                          uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 +
                                                       lVar24 * 4),puVar14[lVar52]);
                          *(uint *)(lVar16 + lVar24 * 4) = uVar12;
                          goto LAB_002e4815;
                        }
                        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = puVar14[lVar52];
                        goto LAB_002e4955;
                      }
                      if (cVar8 != '\0') {
                        *(undefined4 *)(lVar16 + lVar24 * 4) =
                             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4)
                        ;
                        goto LAB_002e3ea8;
                      }
                      lVar40 = lVar22 + 0x400000000 >> 0x20;
                      cVar8 = *(char *)(lVar24 + 2 + lVar39);
                      if (pcVar32[lVar40] == '\0') {
                        if (cVar8 == '\0') {
                          TTA::rtable_[TTA::length_] = TTA::length_;
                          TTA::next_[TTA::length_] = 0xffffffff;
                          TTA::tail_[TTA::length_] = TTA::length_;
                          uVar12 = TTA::length_ + 1;
                          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
                          TTA::length_ = uVar12;
                          goto LAB_002e4c34;
                        }
                        *(undefined4 *)(lVar16 + lVar24 * 4) =
                             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4)
                        ;
                        goto LAB_002e4815;
                      }
                      if (cVar8 == '\0') goto LAB_002e442a;
                      lVar17 = lVar31 * lVar28 + lVar21 * 4;
                      cVar8 = *(char *)(lVar24 + 3 + lVar54 * lVar28 + lVar21 + lVar10);
LAB_002e42d6:
                      local_160 = lVar18 + lVar24;
                      uVar12 = *(uint *)(lVar17 + lVar26 + 8 + lVar24 * 4);
                      if (cVar8 == '\0') {
                        uVar12 = TTA::Merge(uVar12,puVar49[lVar40]);
                        goto LAB_002e4604;
                      }
                      *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                      uVar30 = local_160;
                      goto LAB_002de6d7;
                    }
                    if (*(char *)(lVar39 + 1 + lVar24) == '\0') {
                      puVar46[TTA::length_] = TTA::length_;
                      puVar34[TTA::length_] = 0xffffffff;
                      puVar6[TTA::length_] = TTA::length_;
                      uVar12 = TTA::length_;
                      TTA::length_ = TTA::length_ + 1;
                    }
                    else {
                      uVar12 = *(uint *)(lVar26 + lVar11 + lVar24 * 4);
                    }
                    *(uint *)(lVar16 + lVar24 * 4) = uVar12;
                    lVar22 = lVar22 + 0x200000000;
                    lVar40 = lVar40 + 8;
                    lVar52 = lVar18 + lVar24;
                    lVar24 = lVar24 + 2;
                    if (lVar45 <= lVar52 + 2) {
                      iVar37 = iVar37 + (int)lVar24;
                      uVar12 = (int)lVar18 + (int)lVar24;
                      goto LAB_002e3a93;
                    }
                  }
                  local_160 = lVar18 + lVar24;
                  lVar39 = lVar22 + 0x300000000 >> 0x20;
                  if (*(char *)(lVar38 + lVar39) == '\0') {
                    if (pcVar1[lVar39] == '\0') {
                      lVar40 = lVar40 + lVar11 + lVar26;
                      goto LAB_002e426a;
                    }
                    TTA::rtable_[TTA::length_] = TTA::length_;
                    TTA::next_[TTA::length_] = 0xffffffff;
                    TTA::tail_[TTA::length_] = TTA::length_;
                    uVar12 = TTA::length_ + 1;
                    *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
                    TTA::length_ = uVar12;
                    goto LAB_002e0bc3;
                  }
                  if (pcVar32[lVar39] != '\0') {
                    *(undefined4 *)(lVar16 + lVar24 * 4) =
                         *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
LAB_002e3ea8:
                    uVar30 = lVar18 + lVar24;
                    goto LAB_002e1955;
                  }
                  lVar40 = lVar22 + 0x400000000 >> 0x20;
                  cVar8 = *(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10);
                  if (pcVar32[lVar40] != '\0') {
                    if (cVar8 != '\0') {
                      lVar17 = lVar31 * lVar28 + lVar21 * 4;
                      cVar8 = pcVar32[lVar39 - lVar54];
                      goto LAB_002e42d6;
                    }
LAB_002e442a:
                    uVar12 = puVar49[lVar40];
LAB_002e4604:
                    local_160 = lVar18 + lVar24;
                    *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                    uVar30 = local_160;
                    goto LAB_002de6d7;
                  }
                  if (cVar8 != '\0') {
                    *(undefined4 *)(lVar16 + lVar24 * 4) =
                         *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
                    goto LAB_002e4815;
                  }
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_;
LAB_002e6cf8:
                  TTA::length_ = uVar12 + 1;
                  *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                  uVar30 = local_160;
                  goto LAB_002de3c4;
                }
LAB_002e3a93:
                uVar30 = (ulong)uVar12;
                if (local_110 < (int)uVar12) {
                  if (*(char *)(lVar38 + uVar30) == '\0') {
LAB_002e50d2:
                    if (pcVar1[uVar30] == '\0') {
LAB_002e50f6:
                      puVar14[uVar30] = 0;
                    }
                    else {
                      lVar38 = (long)iVar37;
                      if (pcVar1[lVar38 + 1] == '\0') {
LAB_002e53b1:
                        TTA::rtable_[TTA::length_] = TTA::length_;
                        TTA::next_[TTA::length_] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar12 = TTA::length_ + 1;
                        puVar14[uVar30] = TTA::length_;
                        TTA::length_ = uVar12;
                      }
                      else {
LAB_002e50eb:
                        puVar14[uVar30] = puVar14[lVar38];
                      }
                    }
                    goto LAB_002e68c2;
                  }
                  uVar12 = iVar37 + 1;
                  if (pcVar1[uVar12] == '\0') {
                    if (pcVar32[uVar30] != '\0') goto LAB_002e3d35;
                    if (pcVar32[uVar12] == '\0') goto LAB_002e6104;
LAB_002e4107:
                    lVar10 = (long)iVar37;
LAB_002e58b5:
                    uVar12 = puVar49[lVar10];
                    goto LAB_002e68b6;
                  }
                  if (pcVar32[uVar12] == '\0') {
                    if (pcVar32[uVar30] == '\0') {
                      uVar12 = puVar14[iVar37];
                      goto LAB_002e68b6;
                    }
                    uVar12 = puVar49[uVar30];
                  }
                  else {
                    uVar12 = puVar49[iVar37];
                  }
                  uVar27 = puVar14[iVar37];
                  goto LAB_002e5dec;
                }
                if (*(char *)(lVar38 + uVar30) == '\0') {
                  uVar23 = (ulong)(iVar37 + 3);
                  cVar8 = *(char *)(lVar38 + uVar23);
                  if (pcVar1[uVar30] == '\0') {
                    if (cVar8 == '\0') {
                      bVar58 = pcVar1[uVar23] == '\0';
LAB_002e60f4:
                      if (bVar58) {
                        puVar14[uVar30] = 0;
                      }
                      else {
LAB_002e6104:
                        TTA::rtable_[TTA::length_] = TTA::length_;
                        TTA::next_[TTA::length_] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar12 = TTA::length_ + 1;
                        puVar14[uVar30] = TTA::length_;
                        TTA::length_ = uVar12;
                      }
                    }
                    else {
LAB_002e5406:
                      cVar8 = pcVar32[uVar23];
joined_r0x002e540f:
                      if (cVar8 == '\0') {
                        cVar8 = pcVar32[uVar30];
joined_r0x002e5a4b:
                        if (cVar8 == '\0') goto LAB_002e6104;
                      }
LAB_002e64eb:
                      uVar12 = puVar49[uVar30];
LAB_002e64ef:
                      puVar14[uVar30] = uVar12;
                    }
                    goto LAB_002e68c2;
                  }
LAB_002e511e:
                  lVar38 = (long)iVar37;
                  if (cVar8 == '\0') {
                    if (pcVar1[lVar38 + 1] == '\0') {
                      TTA::rtable_[TTA::length_] = TTA::length_;
                      TTA::next_[TTA::length_] = 0xffffffff;
                      TTA::tail_[TTA::length_] = TTA::length_;
                      uVar12 = TTA::length_ + 1;
                      puVar14[uVar30] = TTA::length_;
                      TTA::length_ = uVar12;
                      goto LAB_002e68c2;
                    }
LAB_002e53f6:
                    uVar12 = puVar14[lVar38];
                  }
                  else {
                    if (pcVar1[lVar38 + 1] != '\0') {
                      if ((pcVar32[uVar23] == '\0') && (pcVar32[uVar30] == '\0')) goto LAB_002e53f6;
                      uVar12 = TTA::Merge(puVar49[uVar30],puVar14[lVar38]);
                      puVar14[uVar30] = uVar12;
                      goto LAB_002e68c2;
                    }
                    if (pcVar32[uVar23] == '\0') {
                      cVar8 = pcVar32[uVar30];
                      goto joined_r0x002e5a4b;
                    }
                    uVar12 = puVar49[uVar30];
                  }
                  puVar14[uVar30] = uVar12;
                }
                else {
                  uVar12 = iVar37 + 1;
                  lVar38 = (long)iVar37;
                  if (pcVar1[uVar12] == '\0') {
                    if (pcVar32[lVar38 + 3] == '\0') {
                      if (pcVar32[uVar30] == '\0') {
                        if (pcVar32[uVar12] == '\0') goto LAB_002e6104;
                        uVar12 = puVar49[lVar38];
                        goto LAB_002e64ef;
                      }
LAB_002e4128:
                      uVar12 = puVar49[uVar30];
                      goto LAB_002e68b6;
                    }
                    if (pcVar32[uVar30] != '\0') goto LAB_002e4128;
                    if (pcVar32[uVar12] == '\0') {
                      uVar12 = puVar49[uVar30];
                      goto LAB_002e68b6;
                    }
                    uVar12 = puVar49[lVar38];
                    if (pcVar32[uVar30 - lVar54] != '\0') {
LAB_002e6086:
                      puVar14[uVar30] = uVar12;
                      goto LAB_002e68c2;
                    }
                    uVar27 = puVar49[uVar30];
                  }
                  else {
                    if (pcVar32[lVar38 + 3] == '\0') {
                      if (pcVar32[uVar12] == '\0') {
                        if (pcVar32[uVar30] != '\0') goto LAB_002e3b0e;
                        uVar12 = puVar14[lVar38];
                        goto LAB_002e68b6;
                      }
                      uVar12 = puVar49[lVar38];
                    }
                    else {
                      if ((pcVar32[uVar30] == '\0') && (pcVar32[uVar12] != '\0')) {
                        uVar12 = puVar49[lVar38];
                        if (pcVar32[uVar30 - lVar54] == '\0') {
                          uVar27 = puVar49[uVar30];
LAB_002e466b:
                          uVar12 = TTA::Merge(uVar12,uVar27);
                          uVar12 = TTA::Merge(uVar12,puVar14[lVar38]);
                          puVar14[uVar30] = uVar12;
                        }
                        else {
                          uVar27 = puVar14[lVar38];
LAB_002e40f3:
                          uVar12 = TTA::Merge(uVar12,uVar27);
                          puVar14[uVar30] = uVar12;
                        }
                        goto LAB_002e68c2;
                      }
LAB_002e3b0e:
                      uVar12 = puVar49[uVar30];
                    }
                    uVar27 = puVar14[lVar38];
                  }
LAB_002e3eff:
                  uVar12 = TTA::Merge(uVar12,uVar27);
                  puVar14[uVar30] = uVar12;
                }
                goto LAB_002e68c2;
              }
              cVar8 = pcVar32[lVar18 + 3];
              if (pcVar1[lVar18 + 1] == '\0') goto joined_r0x002e26c0;
              if (cVar8 != '\0') {
                if (pcVar32[lVar18] == '\0') {
                  uVar12 = puVar49[lVar18 + 2];
                  uVar27 = puVar14[lVar18];
                }
                else {
                  if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
                    if (pcVar32[local_160] == '\0') {
                      if (pcVar32[local_160 - lVar54] == '\0') {
                        uVar12 = TTA::Merge(puVar49[lVar18],puVar49[lVar18 + 2]);
                        puVar14[lVar18 + 2] = uVar12;
                      }
                      else {
                        puVar14[lVar18 + 2] = puVar49[lVar18];
                      }
                    }
                    else {
                      puVar14[lVar18 + 2] = puVar49[lVar18];
                    }
                    goto LAB_002e1955;
                  }
                  uVar12 = puVar49[lVar18];
                  uVar27 = puVar49[lVar18 + 2];
                }
                uVar12 = TTA::Merge(uVar12,uVar27);
                puVar14[lVar18 + 2] = uVar12;
                goto LAB_002e1955;
              }
              if (pcVar32[lVar18 + 4] == '\0') {
                if (pcVar32[lVar18 + 2] == '\0') goto LAB_002e34e3;
                if (pcVar32[lVar18] == '\0') {
                  uVar12 = puVar49[lVar18 + 2];
                  uVar27 = puVar14[lVar18];
                }
                else {
                  uVar12 = puVar49[lVar18];
                  if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
                    puVar14[lVar18 + 2] = uVar12;
                    goto LAB_002de1c1;
                  }
                  uVar27 = puVar49[lVar18 + 2];
                }
                uVar12 = TTA::Merge(uVar12,uVar27);
                puVar14[lVar18 + 2] = uVar12;
                goto LAB_002de1c1;
              }
              if (pcVar32[lVar18 + (3 - lVar54)] == '\0') {
                if (pcVar32[local_160] == '\0') {
                  uVar12 = puVar49[lVar18 + 4];
                  goto LAB_002e388c;
                }
                if (pcVar32[lVar18] != '\0') goto LAB_002e369b;
                uVar12 = TTA::Merge(puVar49[lVar18 + 2],puVar49[lVar18 + 4]);
                uVar27 = puVar14[lVar18];
                goto LAB_002e3893;
              }
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[lVar18 + 2];
LAB_002e388c:
                uVar27 = puVar14[lVar18];
                goto LAB_002e3893;
              }
              if (pcVar32[lVar18 + (1 - lVar54)] == '\0') {
                uVar12 = puVar49[lVar18];
LAB_002e3843:
                uVar27 = puVar49[lVar18 + 2];
                goto LAB_002e3893;
              }
              if (pcVar32[local_160] == '\0') {
                uVar12 = puVar49[lVar18];
                if (pcVar32[local_160 - lVar54] == '\0') goto LAB_002e3843;
                goto LAB_002e2beb;
              }
              uVar12 = puVar49[lVar18];
            }
            puVar14[lVar18 + 2] = uVar12;
          }
          else {
            if (pcVar1[lVar18 + 1] == '\0') {
              if (pcVar32[lVar18 + 3] != '\0') {
                puVar14[lVar18 + 2] = puVar49[lVar18 + 2];
                goto LAB_002dddc1;
              }
              if (*(char *)(lVar38 + 3 + lVar18) == '\0') {
                if (pcVar32[local_160] != '\0') {
                  puVar14[lVar18 + 2] = puVar49[lVar18 + 2];
                  goto LAB_002e5607;
                }
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_ + 1;
                puVar14[lVar18 + 2] = TTA::length_;
                TTA::length_ = uVar12;
                goto LAB_002e4e8b;
              }
              goto LAB_002e2bb9;
            }
            if (pcVar32[lVar18 + 3] != '\0') {
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[lVar18 + 2];
                uVar27 = puVar14[lVar18];
              }
              else {
                if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
                  if (pcVar32[local_160] != '\0') {
                    puVar14[lVar18 + 2] = puVar49[lVar18];
                    goto LAB_002dddc1;
                  }
                  if (pcVar32[local_160 - lVar54] != '\0') {
                    puVar14[lVar18 + 2] = puVar49[lVar18];
                    goto LAB_002dddc1;
                  }
                  uVar12 = TTA::Merge(puVar49[lVar18],puVar49[lVar18 + 2]);
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002dddc1;
                }
                uVar12 = puVar49[lVar18];
                uVar27 = puVar49[lVar18 + 2];
              }
              uVar12 = TTA::Merge(uVar12,uVar27);
              puVar14[lVar18 + 2] = uVar12;
              goto LAB_002dddc1;
            }
            if (*(char *)(lVar38 + 3 + lVar18) == '\0') {
              if (pcVar32[lVar18 + 2] == '\0') {
                puVar14[lVar18 + 2] = puVar14[lVar18];
                goto LAB_002e4e8b;
              }
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[lVar18 + 2];
                uVar27 = puVar14[lVar18];
              }
              else {
                uVar12 = puVar49[lVar18];
                if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002e5607;
                }
                uVar27 = puVar49[lVar18 + 2];
              }
              uVar12 = TTA::Merge(uVar12,uVar27);
              puVar14[lVar18 + 2] = uVar12;
              goto LAB_002e5607;
            }
            if (pcVar32[lVar18 + 4] == '\0') {
              if (pcVar32[lVar18 + 2] == '\0') {
LAB_002e34e3:
                puVar14[lVar18 + 2] = puVar14[lVar18];
LAB_002e34f4:
                uVar30 = local_160 & 0xffffffff;
                goto LAB_002de3c4;
              }
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[lVar18 + 2];
                uVar27 = puVar14[lVar18];
              }
              else {
                uVar12 = puVar49[lVar18];
                if (pcVar32[lVar18 + (1 - lVar54)] != '\0') {
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002de1c1;
                }
                uVar27 = puVar49[lVar18 + 2];
              }
              uVar12 = TTA::Merge(uVar12,uVar27);
              puVar14[lVar18 + 2] = uVar12;
              goto LAB_002de1c1;
            }
            if (pcVar32[lVar18 + (3 - lVar54)] == '\0') {
              if (pcVar32[local_160] == '\0') {
                uVar12 = puVar49[lVar18 + 4];
LAB_002e36c8:
                uVar27 = puVar14[lVar18];
              }
              else {
                if (pcVar32[lVar18] != '\0') {
LAB_002e369b:
                  uVar12 = puVar49[lVar18];
                  if (pcVar32[lVar18 + (1 - lVar54)] == '\0') {
                    uVar12 = TTA::Merge(uVar12,puVar49[lVar18 + 2]);
                    uVar27 = puVar49[lVar18 + 4];
                  }
                  else {
                    uVar27 = puVar49[lVar18 + 4];
                  }
                  uVar12 = TTA::Merge(uVar12,uVar27);
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002de6d7;
                }
                uVar12 = TTA::Merge(puVar49[lVar18 + 2],puVar49[lVar18 + 4]);
                uVar27 = puVar14[lVar18];
              }
            }
            else {
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[lVar18 + 2];
                goto LAB_002e36c8;
              }
              if (pcVar32[lVar18 + (1 - lVar54)] == '\0') {
                uVar12 = puVar49[lVar18];
              }
              else {
                if (pcVar32[local_160] != '\0') {
                  puVar14[lVar18 + 2] = puVar49[lVar18];
                  goto LAB_002de6d7;
                }
                uVar12 = puVar49[lVar18];
                if (pcVar32[local_160 - lVar54] != '\0') {
                  puVar14[lVar18 + 2] = uVar12;
                  goto LAB_002de6d7;
                }
              }
              uVar27 = puVar49[lVar18 + 2];
            }
            uVar12 = TTA::Merge(uVar12,uVar27);
            puVar14[lVar18 + 2] = uVar12;
          }
          goto LAB_002de6d7;
        }
        uVar30 = local_160 & 0xffffffff;
        if (local_110 < (int)local_160) {
          if (*(char *)(lVar38 + uVar30) == '\0') {
            if (pcVar1[uVar30] == '\0') goto LAB_002e26f5;
            if (pcVar1[lVar18 + 1] != '\0') goto LAB_002e2a63;
LAB_002e331a:
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_;
            goto LAB_002e3351;
          }
          if (pcVar1[iVar37 + 1] == '\0') {
            if (pcVar32[uVar30] == '\0') goto LAB_002e331a;
            uVar12 = puVar49[uVar30];
          }
          else {
            if (pcVar32[uVar30] != '\0') {
              if (pcVar32[lVar18] == '\0') {
LAB_002e2aaf:
                uVar12 = puVar49[uVar30];
                uVar27 = puVar14[lVar18];
              }
              else {
                uVar12 = puVar49[lVar18];
                if (pcVar32[(ulong)(iVar37 + 1) - lVar54] != '\0') {
                  puVar14[uVar30] = uVar12;
                  goto LAB_002e68c2;
                }
                uVar27 = puVar49[uVar30];
              }
LAB_002e3083:
              uVar12 = TTA::Merge(uVar12,uVar27);
              puVar14[uVar30] = uVar12;
              goto LAB_002e68c2;
            }
            uVar12 = puVar14[lVar18];
          }
          puVar14[uVar30] = uVar12;
          goto LAB_002e68c2;
        }
        if (*(char *)(lVar38 + uVar30) == '\0') {
          uVar23 = (ulong)(iVar37 + 3);
          if (pcVar1[uVar30] == '\0') {
            if (*(char *)(lVar38 + uVar23) != '\0') {
              cVar8 = pcVar32[uVar23];
              goto joined_r0x002e2a90;
            }
            if (pcVar1[uVar23] != '\0') goto LAB_002e3102;
            puVar14[uVar30] = 0;
            goto LAB_002e68c2;
          }
          if (*(char *)(lVar38 + uVar23) == '\0') {
            if (pcVar1[lVar18 + 1] == '\0') goto LAB_002e331a;
            puVar14[uVar30] = puVar14[lVar18];
            goto LAB_002e68c2;
          }
          uVar15 = (ulong)(iVar37 + 1);
          cVar8 = pcVar32[uVar23];
          if (pcVar1[uVar15] == '\0') goto joined_r0x002e2a90;
          if (cVar8 != '\0') {
            if (pcVar32[lVar18] == '\0') {
              uVar12 = puVar49[uVar30];
              uVar27 = puVar14[lVar18];
            }
            else {
              if (pcVar32[uVar15 - lVar54] == '\0') {
                uVar12 = puVar49[lVar18];
              }
              else {
                if (pcVar32[uVar30] != '\0') {
                  uVar12 = puVar49[lVar18];
                  goto LAB_002e2aa6;
                }
                uVar12 = puVar49[lVar18];
                if (pcVar32[uVar30 - lVar54] != '\0') goto LAB_002e32d5;
              }
              uVar27 = puVar49[uVar30];
            }
            uVar12 = TTA::Merge(uVar12,uVar27);
            puVar14[uVar30] = uVar12;
            goto LAB_002e68c2;
          }
          if (pcVar32[uVar30] != '\0') {
            if (pcVar32[lVar18] == '\0') {
              uVar12 = puVar49[uVar30];
              uVar27 = puVar14[lVar18];
              goto LAB_002e3083;
            }
            cVar8 = pcVar32[uVar15 - lVar54];
            goto LAB_002e2a4b;
          }
          uVar12 = puVar14[lVar18];
        }
        else {
          uVar23 = (ulong)(iVar37 + 1);
          cVar8 = pcVar32[lVar18 + 3];
          if (pcVar1[uVar23] != '\0') {
            if (cVar8 != '\0') {
              if (pcVar32[lVar18] == '\0') {
                uVar12 = puVar49[uVar30];
                uVar27 = puVar14[lVar18];
              }
              else {
                if (pcVar32[uVar23 - lVar54] != '\0') {
                  if (pcVar32[uVar30] == '\0') {
                    uVar12 = puVar49[lVar18];
                    if (pcVar32[uVar30 - lVar54] == '\0') {
                      uVar12 = TTA::Merge(uVar12,puVar49[uVar30]);
                      puVar14[uVar30] = uVar12;
                    }
                    else {
LAB_002e32d5:
                      puVar14[uVar30] = uVar12;
                    }
                  }
                  else {
                    puVar14[uVar30] = puVar49[lVar18];
                  }
                  goto LAB_002e68c2;
                }
                uVar12 = puVar49[lVar18];
                uVar27 = puVar49[uVar30];
              }
              uVar12 = TTA::Merge(uVar12,uVar27);
              puVar14[uVar30] = uVar12;
              goto LAB_002e68c2;
            }
            if (pcVar32[uVar30] == '\0') {
LAB_002e2a63:
              uVar12 = puVar14[lVar18];
              goto LAB_002e2a67;
            }
            if (pcVar32[lVar18] == '\0') goto LAB_002e2aaf;
            cVar8 = pcVar32[uVar23 - lVar54];
LAB_002e2a4b:
            uVar12 = puVar49[lVar18];
            if (cVar8 == '\0') {
              uVar27 = puVar49[uVar30];
              goto LAB_002e3083;
            }
            puVar14[uVar30] = uVar12;
            goto LAB_002e68c2;
          }
joined_r0x002e2a90:
          if ((cVar8 == '\0') && (pcVar32[uVar30] == '\0')) goto LAB_002e3102;
          uVar12 = puVar49[uVar30];
        }
LAB_002e2aa6:
        puVar14[uVar30] = uVar12;
        goto LAB_002e68c2;
      }
      lVar39 = lVar22 + 0x400000000 >> 0x20;
      if (pcVar32[lVar39] == '\0') {
        uVar12 = *(uint *)((long)puVar14 + lVar52);
        local_160 = uVar30 & 0xffffffff;
        uVar23 = uVar30;
        goto LAB_002e1fd0;
      }
      lVar40 = lVar26 + 8 + lVar11 + lVar35;
      if (pcVar32[lVar18 - lVar54] == '\0') {
        uVar12 = TTA::Merge(puVar49[lVar39],*(uint *)((long)puVar14 + lVar52));
        *(uint *)(lVar40 + lVar16 * 4) = uVar12;
      }
      else {
        uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar16 * 4),
                            *(uint *)((long)puVar14 + lVar52));
        *(uint *)(lVar40 + lVar16 * 4) = uVar12;
      }
      goto LAB_002de6d7;
    }
LAB_002de583:
    uVar30 = (ulong)uVar12;
    if (local_110 < (int)uVar12) goto LAB_002e1be7;
    if (*(char *)(lVar38 + uVar30) != '\0') {
      lVar38 = (long)iVar37;
      cVar8 = pcVar32[lVar38 + 3];
joined_r0x002de5b4:
      if (cVar8 == '\0') goto LAB_002e6516;
      goto LAB_002e2176;
    }
    uVar23 = (ulong)(iVar37 + 3);
    if (pcVar1[uVar30] == '\0') {
      if (*(char *)(lVar38 + uVar23) != '\0') goto LAB_002e28e8;
LAB_002e104e:
      cVar8 = pcVar1[uVar23];
      goto joined_r0x002e1057;
    }
    if ((*(char *)(lVar38 + uVar23) != '\0') && (pcVar32[uVar23] != '\0')) {
LAB_002e0da4:
      uVar12 = puVar49[uVar30];
      lVar38 = (long)iVar37;
      goto LAB_002e217a;
    }
LAB_002e0db0:
    lVar38 = (long)iVar37;
    goto LAB_002e6516;
  }
  uVar12 = puVar49[lVar18 + 4];
LAB_002df76a:
  puVar14[lVar18 + 2] = uVar12;
  goto LAB_002de6d7;
LAB_002e3b1b:
  local_160 = lVar18 + lVar24;
  lVar39 = lVar22 + 0x100000000 >> 0x20;
  lVar40 = lVar22 + 0x300000000 >> 0x20;
  lVar17 = lVar22 >> 0x1e;
  uVar30 = local_160;
  if (pcVar1[lVar39] == '\0') {
    if (pcVar32[lVar40] != '\0') {
      if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
        *(undefined4 *)(lVar16 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        goto LAB_002dddc1;
      }
      if (pcVar32[lVar39] == '\0') {
        *(undefined4 *)(lVar16 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        goto LAB_002dddc1;
      }
      if (*(char *)(lVar24 + 2 + lVar54 * lVar28 + lVar21 + lVar10) != '\0') {
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar17);
        goto LAB_002dddc1;
      }
      uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),
                          *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4));
      *(uint *)(lVar16 + lVar24 * 4) = uVar12;
      goto LAB_002dddc1;
    }
    if (*(char *)(lVar38 + lVar40) != '\0') {
      lVar22 = lVar22 + 0x400000000 >> 0x20;
      cVar8 = *(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10);
      if (pcVar32[lVar22] != '\0') {
        if (cVar8 == '\0') {
          if (pcVar32[lVar39] != '\0') {
            if (pcVar32[lVar40 - lVar54] == '\0') {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),puVar49[lVar22]);
              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
            }
            else if (*(char *)(lVar24 + 2 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),
                                  *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4))
              ;
              *(uint *)(lVar16 + lVar24 * 4) = uVar12;
            }
            else {
              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar17);
            }
            goto LAB_002de6d7;
          }
          uVar12 = puVar49[lVar22];
        }
        else {
          uVar12 = *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
          if (pcVar32[lVar40 - lVar54] != '\0') {
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
            goto LAB_002de6d7;
          }
          uVar12 = TTA::Merge(uVar12,puVar49[lVar22]);
        }
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        goto LAB_002de6d7;
      }
      if (cVar8 != '\0') {
        *(undefined4 *)(lVar16 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        goto LAB_002e4815;
      }
      if (pcVar32[lVar39] != '\0') {
        *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(undefined4 *)((long)puVar49 + lVar17);
LAB_002e4c34:
        local_160 = lVar18 + lVar24;
        uVar30 = local_160;
        goto LAB_002de3c4;
      }
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_ + 1;
      *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar12;
      goto LAB_002e4955;
    }
    if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
      *(undefined4 *)(lVar16 + lVar24 * 4) =
           *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
      goto LAB_002e5607;
    }
    if (pcVar32[lVar39] == '\0') {
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_ + 1;
      *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar12;
    }
    else {
      *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(undefined4 *)((long)puVar49 + lVar17);
    }
  }
  else {
    if (pcVar32[lVar40] != '\0') {
      if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                            *(uint *)((long)puVar14 + lVar17));
        *(uint *)(lVar16 + lVar24 * 4) = uVar12;
        goto LAB_002dddc1;
      }
      if (pcVar32[lVar39] == '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                            *(uint *)((long)puVar14 + lVar17));
        *(uint *)(lVar16 + lVar24 * 4) = uVar12;
        goto LAB_002dddc1;
      }
      if (*(char *)(lVar24 + 2 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
        uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),
                            *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4));
        uVar12 = TTA::Merge(uVar12,puVar14[lVar52]);
        *(uint *)(lVar16 + lVar24 * 4) = uVar12;
        goto LAB_002dddc1;
      }
      uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),puVar14[lVar52]);
      *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
      goto LAB_002dddc1;
    }
    if (*(char *)(lVar38 + lVar40) != '\0') {
      lVar22 = lVar22 + 0x400000000 >> 0x20;
      if (pcVar32[lVar22] != '\0') {
        if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
          uVar12 = *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
          if (pcVar32[lVar40 - lVar54] == '\0') {
            uVar12 = TTA::Merge(uVar12,puVar49[lVar22]);
            uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar17));
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
          }
          else {
            uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar17));
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
          }
          goto LAB_002de6d7;
        }
        if (pcVar32[lVar39] == '\0') {
          uVar12 = TTA::Merge(puVar49[lVar22],*(uint *)((long)puVar14 + lVar17));
        }
        else {
          if (pcVar32[lVar40 - lVar54] != '\0') {
            if (*(char *)(lVar24 + 2 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),
                                  *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4))
              ;
              uVar12 = TTA::Merge(uVar12,puVar14[lVar52]);
              *(uint *)(lVar16 + lVar24 * 4) = uVar12;
            }
            else {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),puVar14[lVar52]);
              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
            }
            goto LAB_002de6d7;
          }
          uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),puVar49[lVar22]);
          uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar17));
        }
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        goto LAB_002de6d7;
      }
      if (pcVar32[lVar39] != '\0') {
        uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),*(uint *)((long)puVar14 + lVar17));
        uVar23 = local_160;
        goto LAB_002e1fd0;
      }
      if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                            *(uint *)((long)puVar14 + lVar17));
        *(uint *)(lVar16 + lVar24 * 4) = uVar12;
LAB_002e4815:
        local_160 = lVar18 + lVar24;
        goto LAB_002de1c1;
      }
      *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(undefined4 *)((long)puVar14 + lVar17);
LAB_002e4955:
      local_160 = lVar18 + lVar24;
      uVar30 = local_160;
      goto LAB_002de3c4;
    }
    if (pcVar32[lVar39] != '\0') {
      uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar17),*(uint *)((long)puVar14 + lVar17));
      uVar23 = local_160 & 0xffffffff;
      goto LAB_002e2275;
    }
    if (*(char *)(lVar24 + 2 + lVar54 * lVar20 + lVar21 + lVar10) != '\0') {
      uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                          *(uint *)((long)puVar14 + lVar17));
      *(uint *)(lVar16 + lVar24 * 4) = uVar12;
      goto LAB_002e5607;
    }
    *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(undefined4 *)((long)puVar14 + lVar17);
  }
LAB_002e4e8b:
  puVar6 = TTA::tail_;
  puVar34 = TTA::next_;
  puVar46 = TTA::rtable_;
  iVar37 = (int)local_160;
  uVar12 = iVar37 + 2;
  if ((int)uVar12 < local_110) {
    lVar21 = (long)iVar37;
    lVar18 = lVar21 + 2;
    lVar52 = lVar21 << 0x20;
    lVar11 = lVar35 + lVar21 * 4;
    lVar40 = lVar26 + 8 + lVar11;
    lVar22 = lVar54 * lVar53 + lVar21;
    lVar39 = lVar10 + lVar33 + lVar21;
    lVar41 = lVar39 + 3;
    lVar16 = lVar54 * lVar20 + lVar21;
    lVar57 = lVar10 + lVar16 + 2;
    lVar17 = 0;
    lVar24 = 0;
LAB_002e4f40:
    if (*(char *)(lVar39 + 2 + lVar24) == '\0') {
      local_160 = lVar18 + lVar24;
      lVar39 = lVar52 + 0x300000000 >> 0x20;
      uVar30 = local_160;
      if (*(char *)(lVar24 + 2 + lVar22 + lVar10) == '\0') {
        if (*(char *)(lVar38 + lVar39) == '\0') {
          if (pcVar1[lVar39] != '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            goto LAB_002e0bc3;
          }
          lVar17 = lVar17 + lVar11 + lVar26;
          goto LAB_002e6bb1;
        }
        if (pcVar32[lVar39] != '\0') {
          *(undefined4 *)(lVar40 + lVar24 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
        lVar17 = lVar52 + 0x400000000 >> 0x20;
        cVar2 = pcVar32[lVar17];
        cVar8 = *(char *)(lVar24 + 2 + lVar16 + lVar10);
      }
      else {
        lVar17 = lVar52 >> 0x20;
        if (*(char *)(lVar38 + lVar39) == '\0') {
          if (pcVar1[lVar17 + 1] == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            uVar30 = local_160 & 0xffffffff;
          }
          else {
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = puVar14[lVar17];
            uVar30 = local_160 & 0xffffffff;
          }
          goto LAB_002e3931;
        }
        if (pcVar1[lVar17 + 1] != '\0') {
          if (pcVar32[lVar39] != '\0') {
            uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                                puVar14[lVar17]);
            *(uint *)(lVar40 + lVar24 * 4) = uVar12;
            uVar30 = local_160 & 0xffffffff;
            goto LAB_002e1955;
          }
          lVar22 = lVar52 + 0x400000000 >> 0x20;
          if (pcVar32[lVar22] != '\0') {
            if (pcVar32[lVar39 - lVar54] == '\0') {
              if (*(char *)(lVar24 + 2 + lVar16 + lVar10) == '\0') {
                uVar12 = TTA::Merge(puVar49[lVar22],puVar14[lVar17]);
                *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
              }
              else {
                uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4
                                             ),puVar49[lVar22]);
                uVar12 = TTA::Merge(uVar12,puVar14[lVar17]);
                *(uint *)(lVar40 + lVar24 * 4) = uVar12;
              }
              uVar30 = local_160 & 0xffffffff;
            }
            else {
              uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                                  puVar14[lVar17]);
              *(uint *)(lVar40 + lVar24 * 4) = uVar12;
              uVar30 = local_160 & 0xffffffff;
            }
            goto LAB_002de6d7;
          }
          if (*(char *)(lVar24 + 2 + lVar16 + lVar10) != '\0') {
            uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                                puVar14[lVar17]);
            *(uint *)(lVar40 + lVar24 * 4) = uVar12;
            goto LAB_002e648a;
          }
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = puVar14[lVar17];
          goto LAB_002de3c4;
        }
        if (pcVar32[lVar39] != '\0') {
          *(undefined4 *)(lVar40 + lVar24 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
        lVar17 = lVar52 + 0x400000000 >> 0x20;
        cVar2 = pcVar32[lVar17];
        cVar8 = *(char *)(lVar24 + 2 + lVar16 + lVar10);
      }
      if (cVar2 == '\0') {
        if (cVar8 == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          goto LAB_002de3c4;
        }
        *(undefined4 *)(lVar40 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
LAB_002e648a:
        local_160 = lVar18 + lVar24;
        goto LAB_002de1c1;
      }
      if (cVar8 == '\0') {
        uVar12 = puVar49[lVar17];
LAB_002e703c:
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
      }
      else {
        uVar12 = *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        if (pcVar32[lVar39 - lVar54] == '\0') {
          uVar12 = TTA::Merge(uVar12,puVar49[lVar17]);
          goto LAB_002e703c;
        }
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
      }
      uVar30 = local_160 & 0xffffffff;
      goto LAB_002de6d7;
    }
    cVar8 = *(char *)(lVar10 + lVar16 + 3 + lVar24);
    iVar36 = (int)lVar18;
    if (*(char *)(lVar10 + lVar22 + 1 + lVar24) == '\0') {
      if (cVar8 != '\0') {
        *(undefined4 *)(lVar40 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
LAB_002e54dd:
        local_160 = (ulong)(uint)(iVar36 + (int)lVar24);
        goto LAB_002dddc1;
      }
      if (*(char *)(lVar41 + lVar24) != '\0') {
        local_160 = lVar18 + lVar24;
        lVar39 = lVar52 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar24 + 2 + lVar16 + lVar10);
        if (pcVar32[lVar39] == '\0') {
          if (cVar8 != '\0') {
            *(undefined4 *)(lVar40 + lVar24 * 4) =
                 *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
            goto LAB_002e648a;
          }
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          goto LAB_002e6cf8;
        }
        if (cVar8 == '\0') {
          uVar12 = puVar49[lVar39];
LAB_002e6bd4:
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        }
        else {
          uVar12 = *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
          if (*(char *)(lVar24 + 3 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
            uVar12 = TTA::Merge(uVar12,puVar49[lVar39]);
            goto LAB_002e6bd4;
          }
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        }
        uVar30 = local_160 & 0xffffffff;
        goto LAB_002de6d7;
      }
      if (*(char *)(lVar57 + lVar24) != '\0') {
        *(undefined4 *)(lVar40 + lVar24 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        goto LAB_002e55e4;
      }
      puVar46[TTA::length_] = TTA::length_;
      puVar34[TTA::length_] = 0xffffffff;
      puVar6[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_;
      TTA::length_ = TTA::length_ + 1;
LAB_002e4fe8:
      *(uint *)(lVar40 + lVar24 * 4) = uVar12;
      lVar52 = lVar52 + 0x200000000;
      lVar17 = lVar17 + 8;
      lVar42 = lVar18 + lVar24;
      lVar24 = lVar24 + 2;
      if (lVar45 <= lVar42 + 2) {
        iVar37 = iVar37 + (int)lVar24;
        uVar12 = iVar36 + (int)lVar24;
        goto LAB_002e5056;
      }
      goto LAB_002e4f40;
    }
    if (cVar8 != '\0') {
      uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                          *(uint *)(lVar40 + -8 + lVar24 * 4));
      *(uint *)(lVar40 + lVar24 * 4) = uVar12;
      goto LAB_002e54dd;
    }
    if (*(char *)(lVar41 + lVar24) != '\0') {
      lVar39 = lVar52 + 0x400000000 >> 0x20;
      if (pcVar32[lVar39] == '\0') {
        if (*(char *)(lVar24 + 2 + lVar16 + lVar10) != '\0') {
          uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                              *(uint *)(lVar40 + -8 + lVar24 * 4));
          *(uint *)(lVar40 + lVar24 * 4) = uVar12;
          goto LAB_002e648a;
        }
        *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
             *(undefined4 *)(lVar11 + lVar26 + lVar24 * 4);
        uVar30 = lVar18 + lVar24;
        goto LAB_002de3c4;
      }
      if (*(char *)(lVar24 + 3 + lVar54 * lVar28 + lVar21 + lVar10) == '\0') {
        if (*(char *)(lVar24 + 2 + lVar16 + lVar10) != '\0') {
          uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                              puVar49[lVar39]);
          uVar27 = *(uint *)(lVar40 + -8 + lVar24 * 4);
          goto LAB_002e63b0;
        }
        uVar12 = TTA::Merge(puVar49[lVar39],*(uint *)(lVar11 + lVar26 + lVar24 * 4));
        *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
      }
      else {
        uVar12 = *(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4);
        uVar27 = *(uint *)(lVar40 + -8 + lVar24 * 4);
LAB_002e63b0:
        uVar12 = TTA::Merge(uVar12,uVar27);
        *(uint *)(lVar40 + lVar24 * 4) = uVar12;
      }
      uVar30 = lVar18 + lVar24 & 0xffffffff;
      goto LAB_002de6d7;
    }
    if (*(char *)(lVar57 + lVar24) == '\0') {
      uVar12 = *(uint *)(lVar40 + -8 + lVar24 * 4);
      goto LAB_002e4fe8;
    }
    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar21 * 4 + lVar26 + 8 + lVar24 * 4),
                        *(uint *)(lVar40 + -8 + lVar24 * 4));
    *(uint *)(lVar40 + lVar24 * 4) = uVar12;
LAB_002e55e4:
    local_160 = (ulong)(uint)(iVar36 + (int)lVar24);
LAB_002e5607:
    iVar37 = (int)local_160;
    uVar12 = iVar37 + 2;
    if ((int)uVar12 < local_110) {
      lVar17 = (long)iVar37;
      lVar18 = lVar17 + 2;
      lVar40 = lVar17 * 4;
      lVar39 = lVar31 * lVar28 + lVar17 * 4;
      lVar16 = lVar54 * lVar28 + lVar17;
      lVar22 = lVar54 * lVar53 + lVar17;
      lVar52 = lVar54 * lVar20 + lVar17;
      lVar11 = lVar35 + lVar17 * 4;
      lVar57 = lVar17 << 0x20;
      lVar41 = lVar39 + lVar26 + 8;
      lVar17 = lVar10 + 3 + lVar33 + lVar17;
      lVar21 = lVar10 + 2 + lVar52;
      puVar34 = (uint *)(lVar11 + lVar26 + 8);
      lVar24 = 0;
      puVar46 = puVar34;
      while (lVar42 = lVar57 >> 0x1e, *(char *)(lVar17 + -1 + lVar24) != '\0') {
        cVar8 = *(char *)(lVar21 + 1 + lVar24);
        iVar36 = (int)lVar18;
        if (*(char *)(lVar10 + lVar22 + 1 + lVar24) == '\0') {
          if (cVar8 != '\0') {
            uVar12 = iVar36 + (int)lVar24;
            *(undefined4 *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) =
                 *(undefined4 *)(lVar41 + lVar24 * 4);
            goto LAB_002e5c90;
          }
          if (*(char *)(lVar17 + lVar24) != '\0') {
            local_160 = lVar18 + lVar24;
            lVar11 = lVar57 + 0x400000000 >> 0x20;
            cVar8 = *(char *)(lVar24 + 2 + lVar52 + lVar10);
            if (pcVar32[lVar11] != '\0') {
              if (cVar8 == '\0') goto LAB_002e69ea;
              cVar8 = *(char *)(lVar24 + 3 + lVar16 + lVar10);
              uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar24 * 4);
              goto joined_r0x002e5d1b;
            }
            if (cVar8 == '\0') {
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
              TTA::length_ = uVar12;
              uVar30 = local_160;
              goto LAB_002de3c4;
            }
            *(undefined4 *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) =
                 *(undefined4 *)(lVar41 + lVar24 * 4);
            goto LAB_002de1c1;
          }
          if (*(char *)(lVar21 + lVar24) == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            goto LAB_002e5db3;
          }
          uVar12 = *(uint *)(lVar41 + lVar24 * 4);
        }
        else {
          if (cVar8 != '\0') {
            local_160 = lVar18 + lVar24;
            if (*(char *)(lVar24 + 1 + lVar16 + lVar10) == '\0') {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              local_160 = local_160 & 0xffffffff;
              goto LAB_002dddc1;
            }
            if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
              if (*(char *)(lVar24 + 2 + lVar16 + lVar10) != '\0') {
                *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                     *(uint *)((long)puVar49 + lVar42);
                goto LAB_002dddc1;
              }
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              goto LAB_002dddc1;
            }
            *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                 *(undefined4 *)((long)puVar49 + lVar42);
            goto LAB_002dddc1;
          }
          if (*(char *)(lVar17 + lVar24) != '\0') {
            local_160 = lVar18 + lVar24;
            lVar18 = lVar57 + 0x400000000 >> 0x20;
            if (pcVar32[lVar18] == '\0') {
              if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
                *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                     *(undefined4 *)((long)puVar14 + lVar42);
                uVar30 = local_160;
                goto LAB_002de3c4;
              }
              if (*(char *)(lVar24 + 1 + lVar16 + lVar10) == '\0') {
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4)
                                   );
                *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              }
              else {
                *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                     *(uint *)((long)puVar49 + lVar42);
              }
              goto LAB_002de1c1;
            }
            lVar16 = lVar16 + lVar10;
            if (*(char *)(lVar24 + 3 + lVar16) == '\0') {
              if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
                uVar12 = TTA::Merge(puVar49[lVar18],*(uint *)((long)puVar14 + lVar42));
                *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = uVar12;
                uVar30 = local_160 & 0xffffffff;
                goto LAB_002de6d7;
              }
              if (*(char *)(lVar24 + 1 + lVar16) == '\0') {
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4)
                                   );
                uVar12 = TTA::Merge(uVar12,puVar49[lVar18]);
                *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              }
              else {
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),puVar49[lVar18]);
                *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = uVar12;
              }
            }
            else if (*(char *)(lVar24 + 1 + lVar16) == '\0') {
              uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
            }
            else if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
              if (*(char *)(lVar24 + 2 + lVar16) == '\0') {
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4)
                                   );
                *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              }
              else {
                *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                     *(uint *)((long)puVar49 + lVar42);
              }
            }
            else {
              *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                   *(undefined4 *)((long)puVar49 + lVar42);
            }
            uVar30 = local_160 & 0xffffffff;
            goto LAB_002de6d7;
          }
          if (*(char *)(lVar21 + lVar24) == '\0') {
            *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
                 *(undefined4 *)((long)puVar14 + lVar42);
LAB_002e5db3:
            local_160 = (ulong)(uint)(iVar36 + (int)lVar24);
            goto LAB_002e4e8b;
          }
          uVar12 = *(uint *)(lVar39 + lVar26 + lVar24 * 4);
          if (*(char *)(lVar10 + lVar16 + 1 + lVar24) == '\0') {
            uVar12 = TTA::Merge(uVar12,*(uint *)(lVar41 + lVar24 * 4));
          }
        }
        puVar34[lVar24] = uVar12;
        lVar57 = lVar57 + 0x200000000;
        puVar46 = puVar46 + 2;
        lVar42 = lVar18 + lVar24;
        lVar24 = lVar24 + 2;
        if (lVar45 <= lVar42 + 2) {
          iVar37 = iVar37 + (int)lVar24;
          uVar12 = iVar36 + (int)lVar24;
          goto LAB_002e580f;
        }
      }
      local_160 = lVar18 + lVar24;
      uVar12 = (uint)local_160;
      lVar17 = lVar57 + 0x300000000 >> 0x20;
      if (*(char *)(lVar24 + 2 + lVar22 + lVar10) == '\0') {
        if (*(char *)(lVar38 + lVar17) == '\0') {
          if (pcVar1[lVar17] == '\0') {
            local_160 = local_160 & 0xffffffff;
            goto LAB_002e021b;
          }
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
LAB_002e62dd:
          TTA::length_ = uVar12 + 1;
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
LAB_002e0bc3:
          puVar7 = TTA::tail_;
          puVar6 = TTA::next_;
          puVar34 = TTA::rtable_;
          iVar37 = (int)local_160;
          uVar12 = iVar37 + 2;
          if ((int)uVar12 < local_110) {
            lVar40 = (long)iVar37;
            lVar18 = lVar40 + 2;
            lVar24 = lVar40 << 0x20;
            lVar17 = lVar33 + lVar40 + lVar10;
            lVar21 = lVar54 * lVar53 + lVar40 + lVar10;
            lVar39 = lVar40 * 4;
            puVar44 = (uint *)(lVar35 + lVar40 * 4 + lVar26 + 8);
            lVar11 = 0;
            puVar46 = puVar44;
            do {
              lVar16 = lVar24 >> 0x1e;
              if (*(char *)(lVar17 + 2 + lVar11) != '\0') {
                uVar30 = lVar18 + lVar11;
                lVar17 = lVar24 + 0x300000000 >> 0x20;
                lVar21 = lVar24 >> 0x20;
                local_160 = uVar30;
                if (pcVar32[lVar17] != '\0') {
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) != '\0') {
                    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4
                                                 ),*(uint *)((long)puVar14 + lVar16));
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_002dddc1;
                  }
                  if (pcVar32[lVar21 + 1] == '\0') {
                    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4
                                                 ),puVar14[lVar21]);
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_002dddc1;
                  }
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar28 + lVar40 + lVar10) == '\0') {
                    uVar12 = TTA::Merge(puVar49[lVar21],
                                        *(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4
                                                 ));
                    uVar12 = TTA::Merge(uVar12,puVar14[lVar21]);
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_002dddc1;
                  }
                  uVar12 = TTA::Merge(puVar49[lVar21],puVar14[lVar21]);
                  *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  goto LAB_002dddc1;
                }
                if (*(char *)(lVar38 + lVar17) == '\0') {
                  if (pcVar32[lVar21 + 1] != '\0') {
                    uVar12 = TTA::Merge(puVar49[lVar21],puVar14[lVar21]);
                    uVar23 = uVar30 & 0xffffffff;
                    goto LAB_002e2275;
                  }
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) != '\0') {
                    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4
                                                 ),puVar14[lVar21]);
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_002e5607;
                  }
                  *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = puVar14[lVar21];
                  goto LAB_002e4e8b;
                }
                lVar24 = lVar24 + 0x400000000 >> 0x20;
                if (pcVar32[lVar24] == '\0') {
                  if (pcVar32[lVar21 + 1] != '\0') {
                    uVar12 = TTA::Merge(puVar49[lVar21],puVar14[lVar21]);
                    local_160 = uVar30 & 0xffffffff;
                    uVar23 = uVar30;
                    goto LAB_002e1fd0;
                  }
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) == '\0') {
                    uVar12 = puVar14[lVar21];
LAB_002e18ee:
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    uVar30 = lVar18 + lVar11;
                    goto LAB_002de3c4;
                  }
                  uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4),
                                      puVar14[lVar21]);
LAB_002e179d:
                  local_160 = lVar18 + lVar11;
                  *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  goto LAB_002e26a8;
                }
                if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) != '\0') {
                  uVar12 = *(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4);
                  if (pcVar32[lVar17 - lVar54] == '\0') {
                    uVar12 = TTA::Merge(uVar12,puVar49[lVar24]);
                    uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar16));
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
LAB_002e1861:
                    uVar30 = lVar18 + lVar11;
                  }
                  else {
                    uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar16));
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  }
                  goto LAB_002de6d7;
                }
                if (pcVar32[lVar21 + 1] == '\0') {
                  uVar12 = TTA::Merge(puVar49[lVar24],puVar14[lVar21]);
                }
                else {
                  if (pcVar32[lVar17 - lVar54] != '\0') {
                    if (*(char *)(lVar11 + 2 + lVar54 * lVar28 + lVar40 + lVar10) == '\0') {
                      uVar12 = TTA::Merge(puVar49[lVar21],
                                          *(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 +
                                                   lVar11 * 4));
                      uVar12 = TTA::Merge(uVar12,puVar14[lVar21]);
                      *(uint *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) = uVar12;
                    }
                    else {
                      uVar12 = TTA::Merge(puVar49[lVar21],puVar14[lVar21]);
                      *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                    }
                    goto LAB_002de6d7;
                  }
                  uVar12 = TTA::Merge(puVar49[lVar21],puVar49[lVar24]);
                  uVar12 = TTA::Merge(uVar12,puVar14[lVar21]);
                }
                *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                goto LAB_002de6d7;
              }
              if (*(char *)(lVar21 + 2 + lVar11) != '\0') {
                uVar30 = lVar18 + lVar11;
                lVar17 = lVar24 + 0x300000000 >> 0x20;
                if (*(char *)(lVar38 + lVar17) == '\0') {
                  *(undefined4 *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) =
                       *(undefined4 *)((long)puVar14 + lVar16);
                  goto LAB_002e3931;
                }
                if (pcVar32[lVar17] != '\0') {
                  uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4),
                                      *(uint *)((long)puVar14 + lVar16));
                  *(uint *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) = uVar12;
                  goto LAB_002e1955;
                }
                lVar21 = lVar24 + 0x400000000 >> 0x20;
                if (pcVar32[lVar21] == '\0') {
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) == '\0') {
                    uVar12 = *(uint *)((long)puVar14 + lVar16);
                    goto LAB_002e18ee;
                  }
                  uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4),
                                      *(uint *)((long)puVar14 + lVar16));
                  goto LAB_002e179d;
                }
                if (pcVar32[lVar17 - lVar54] == '\0') {
                  if (*(char *)(lVar11 + 2 + lVar54 * lVar20 + lVar40 + lVar10) == '\0') {
                    uVar12 = TTA::Merge(puVar49[lVar21],*(uint *)((long)puVar14 + lVar16));
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  }
                  else {
                    uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4
                                                 ),puVar49[lVar21]);
                    uVar12 = TTA::Merge(uVar12,*(uint *)((long)puVar14 + lVar16));
                    *(uint *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) = uVar12;
                  }
                  goto LAB_002e1861;
                }
                uVar12 = TTA::Merge(*(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4),
                                    *(uint *)((long)puVar14 + lVar16));
                *(uint *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) = uVar12;
                goto LAB_002de6d7;
              }
              if (*(char *)(lVar17 + 3 + lVar11) != '\0') {
                uVar30 = lVar18 + lVar11;
                lVar18 = lVar54 * lVar20 + lVar40 + lVar10;
                if (*(char *)(lVar11 + 3 + lVar18) != '\0') {
                  *(undefined4 *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) =
                       *(undefined4 *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4);
                  goto LAB_002e1955;
                }
                lVar17 = lVar24 + 0x400000000 >> 0x20;
                cVar8 = *(char *)(lVar11 + 2 + lVar18);
                if (pcVar32[lVar17] == '\0') {
                  if (cVar8 != '\0') {
                    *(undefined4 *)(lVar26 + lVar39 + lVar35 + 8 + lVar11 * 4) =
                         *(undefined4 *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4);
                    local_160 = uVar30 & 0xffffffff;
                    goto LAB_002de1c1;
                  }
                  TTA::rtable_[TTA::length_] = TTA::length_;
                  TTA::next_[TTA::length_] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar12 = TTA::length_ + 1;
                  *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = TTA::length_;
                  TTA::length_ = uVar12;
                  goto LAB_002de3c4;
                }
                if (cVar8 == '\0') {
                  *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = puVar49[lVar17];
                }
                else {
                  uVar12 = *(uint *)(lVar31 * lVar28 + lVar39 + lVar26 + 8 + lVar11 * 4);
                  if (*(char *)(lVar11 + 3 + lVar54 * lVar28 + lVar40 + lVar10) == '\0') {
                    uVar12 = TTA::Merge(uVar12,puVar49[lVar17]);
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  }
                  else {
                    *(uint *)(lVar39 + lVar35 + lVar26 + 8 + lVar11 * 4) = uVar12;
                  }
                }
                goto LAB_002de6d7;
              }
              if (*(char *)(lVar21 + 3 + lVar11) == '\0') goto LAB_002e0fb6;
              puVar34[TTA::length_] = TTA::length_;
              puVar6[TTA::length_] = 0xffffffff;
              puVar7[TTA::length_] = TTA::length_;
              uVar12 = TTA::length_ + 1;
              puVar44[lVar11] = TTA::length_;
              TTA::length_ = uVar12;
              lVar24 = lVar24 + 0x200000000;
              puVar46 = puVar46 + 2;
              lVar16 = lVar18 + lVar11;
              lVar11 = lVar11 + 2;
              if (lVar45 <= lVar16 + 2) {
                iVar37 = iVar37 + (int)lVar11;
                uVar12 = (int)lVar18 + (int)lVar11;
                break;
              }
            } while( true );
          }
          uVar30 = (ulong)uVar12;
          if (local_110 < (int)uVar12) {
            if (*(char *)(lVar38 + uVar30) == '\0') {
              if (pcVar1[uVar30] == '\0') goto LAB_002e2901;
              goto LAB_002e0db0;
            }
            lVar38 = (long)iVar37;
            if (pcVar32[lVar38 + 1] == '\0') {
              cVar8 = pcVar32[uVar30];
              goto joined_r0x002de5b4;
            }
            uVar12 = puVar49[lVar38];
            goto LAB_002e217a;
          }
          if (*(char *)(lVar38 + uVar30) == '\0') {
            uVar23 = (ulong)(iVar37 + 3);
            if (pcVar1[uVar30] == '\0') {
              if (*(char *)(lVar38 + uVar23) == '\0') goto LAB_002e104e;
              goto LAB_002e1f4f;
            }
            if ((*(char *)(lVar38 + uVar23) == '\0') ||
               ((pcVar32[uVar23] == '\0' && (pcVar32[uVar30] == '\0')))) goto LAB_002e0db0;
            goto LAB_002e0da4;
          }
          lVar38 = (long)iVar37;
          if (pcVar32[lVar38 + 3] == '\0') {
            if (pcVar32[lVar38 + 1] == '\0') {
              if (pcVar32[uVar30] != '\0') goto LAB_002e0d5d;
              uVar12 = puVar14[lVar38];
              goto LAB_002e651a;
            }
            uVar12 = puVar49[lVar38];
          }
          else {
            if ((pcVar32[uVar30] == '\0') && (pcVar32[lVar38 + 1] != '\0')) {
              uVar12 = puVar49[lVar38];
              if (pcVar32[uVar30 - lVar54] == '\0') {
                uVar27 = puVar49[uVar30];
                goto LAB_002e466b;
              }
              uVar27 = puVar14[lVar38];
              goto LAB_002e40f3;
            }
LAB_002e0d5d:
            uVar12 = puVar49[uVar30];
          }
          uVar27 = puVar14[lVar38];
          goto LAB_002e3eff;
        }
        if (pcVar32[lVar17] == '\0') {
          lVar11 = lVar57 + 0x400000000 >> 0x20;
          cVar8 = *(char *)(lVar24 + 2 + lVar52 + lVar10);
          if (pcVar32[lVar11] == '\0') goto joined_r0x002e6ed7;
          if (cVar8 == '\0') goto LAB_002e69ea;
          cVar8 = pcVar32[lVar17 - lVar54];
          uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar24 * 4);
joined_r0x002e5d1b:
          if (cVar8 != '\0') goto LAB_002e5d21;
          uVar12 = TTA::Merge(uVar12,puVar49[lVar11]);
          *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = uVar12;
          uVar30 = lVar18 + lVar24 & 0xffffffff;
          goto LAB_002de6d7;
        }
        *(undefined4 *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) =
             *(undefined4 *)(lVar41 + lVar24 * 4);
LAB_002e5c5a:
        uVar30 = local_160 & 0xffffffff;
        goto LAB_002e1955;
      }
      if (*(char *)(lVar38 + lVar17) == '\0') {
        if (pcVar1[(lVar57 >> 0x20) + 1] == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          uVar30 = local_160 & 0xffffffff;
        }
        else {
          *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = puVar14[lVar57 >> 0x20];
          uVar30 = local_160 & 0xffffffff;
        }
        goto LAB_002e3931;
      }
      lVar11 = lVar57 + 0x100000000 >> 0x20;
      if (pcVar1[lVar11] == '\0') {
        if (pcVar32[lVar17] != '\0') {
          *(undefined4 *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) =
               *(undefined4 *)(lVar41 + lVar24 * 4);
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
        lVar11 = lVar57 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar24 + 2 + lVar52 + lVar10);
        if (pcVar32[lVar11] == '\0') {
joined_r0x002e6ed7:
          if (cVar8 != '\0') {
            *(undefined4 *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) =
                 *(undefined4 *)(lVar41 + lVar24 * 4);
            goto LAB_002de1c1;
          }
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          lVar11 = lVar40 + lVar35;
          uVar12 = TTA::length_;
LAB_002e70a8:
          TTA::length_ = uVar12 + 1;
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
          uVar30 = local_160;
          goto LAB_002de3c4;
        }
        if (cVar8 == '\0') {
LAB_002e69ea:
          local_160 = lVar18 + lVar24;
          uVar12 = puVar49[lVar11];
          lVar11 = lVar40 + lVar35;
LAB_002e6a03:
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        }
        else {
          uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar24 * 4);
          if (pcVar32[lVar17 - lVar54] == '\0') {
            uVar12 = TTA::Merge(uVar12,puVar49[lVar11]);
            lVar11 = lVar40 + lVar35;
LAB_002e69d6:
            uVar27 = (uint)local_160;
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
LAB_002e69dd:
            uVar30 = (ulong)uVar27;
            goto LAB_002de6d7;
          }
LAB_002e5d21:
          local_160 = lVar18 + lVar24;
          lVar11 = lVar40 + lVar35;
LAB_002e5d2e:
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
        }
LAB_002e6a13:
        uVar30 = local_160 & 0xffffffff;
        goto LAB_002de6d7;
      }
      if (pcVar32[lVar17] != '\0') {
        if (pcVar32[lVar11 - lVar54] == '\0') {
          uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
          *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
          uVar30 = local_160 & 0xffffffff;
        }
        else if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
          if (*(char *)(lVar24 + 2 + lVar16 + lVar10) == '\0') {
            uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
            *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
          }
          else {
            *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar42)
            ;
          }
          uVar30 = local_160 & 0xffffffff;
        }
        else {
          *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
               *(undefined4 *)((long)puVar49 + lVar42);
          uVar30 = local_160 & 0xffffffff;
        }
        goto LAB_002e1955;
      }
      lVar18 = lVar57 + 0x400000000 >> 0x20;
      if (pcVar32[lVar18] == '\0') {
        if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
          *(undefined4 *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) =
               *(undefined4 *)((long)puVar14 + lVar42);
          uVar30 = local_160;
          goto LAB_002de3c4;
        }
        if (pcVar32[lVar11 - lVar54] == '\0') {
          uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
          *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
        }
        else {
          *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar42);
        }
        goto LAB_002de1c1;
      }
      if (pcVar32[lVar17 - lVar54] == '\0') {
        if (*(char *)(lVar24 + 2 + lVar52 + lVar10) != '\0') {
          if (pcVar32[lVar11 - lVar54] == '\0') {
            uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
            uVar12 = TTA::Merge(uVar12,puVar49[lVar18]);
            *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
          }
          else {
            uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),puVar49[lVar18]);
            *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = uVar12;
          }
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002de6d7;
        }
        uVar12 = TTA::Merge(puVar49[lVar18],*(uint *)((long)puVar14 + lVar42));
        *(uint *)(lVar40 + lVar35 + lVar26 + 8 + lVar24 * 4) = uVar12;
      }
      else {
        if (pcVar32[lVar11 - lVar54] != '\0') {
          if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
            uVar27 = *(uint *)((long)puVar49 + lVar42);
            if (*(char *)(lVar24 + 2 + lVar16 + lVar10) == '\0') {
              uVar12 = TTA::Merge(uVar27,*(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
              goto LAB_002dfe1d;
            }
            lVar11 = lVar40 + lVar35;
LAB_002df190:
            uVar12 = (uint)local_160;
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar27;
          }
          else {
            uVar9 = *(undefined4 *)((long)puVar49 + lVar42);
            lVar11 = lVar40 + lVar35;
LAB_002dfa22:
            *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar9;
          }
          uVar30 = (ulong)uVar12;
          goto LAB_002de6d7;
        }
        uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar42),*(uint *)(lVar41 + lVar24 * 4));
        *(uint *)(lVar26 + lVar40 + lVar35 + 8 + lVar24 * 4) = uVar12;
      }
LAB_002dfe1d:
      uVar30 = local_160 & 0xffffffff;
      goto LAB_002de6d7;
    }
LAB_002e580f:
    uVar30 = (ulong)uVar12;
    if (local_110 < (int)uVar12) {
      if (*(char *)(lVar38 + uVar30) == '\0') {
        if (pcVar1[uVar30] == '\0') {
LAB_002e6192:
          puVar14[uVar30] = 0;
        }
        else if (pcVar1[(long)iVar37 + 1] == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          puVar14[uVar30] = TTA::length_;
          TTA::length_ = uVar12;
        }
        else {
          puVar14[uVar30] = puVar14[iVar37];
        }
        goto LAB_002e68c2;
      }
      if (pcVar1[iVar37 + 1] != '\0') {
        if (pcVar32[uVar30] == '\0') goto LAB_002e6511;
        cVar8 = pcVar32[(ulong)(iVar37 + 1) - lVar54];
LAB_002e5854:
        uVar12 = puVar49[iVar37];
        if (cVar8 != '\0') {
LAB_002e5866:
          puVar14[uVar30] = uVar12;
          goto LAB_002e68c2;
        }
LAB_002e6899:
        uVar12 = TTA::Merge(uVar12,puVar49[uVar30]);
        goto LAB_002e68b6;
      }
      if (pcVar32[uVar30] == '\0') goto LAB_002e614d;
    }
    else if (*(char *)(lVar38 + uVar30) == '\0') {
      uVar23 = (ulong)(iVar37 + 3);
      if (pcVar1[uVar30] != '\0') {
        if (*(char *)(lVar38 + uVar23) == '\0') {
          if (pcVar1[(long)iVar37 + 1] == '\0') goto LAB_002e614d;
        }
        else {
          uVar15 = (ulong)(iVar37 + 1);
          cVar8 = pcVar32[uVar23];
          if (pcVar1[uVar15] == '\0') goto joined_r0x002e5bf6;
          if (cVar8 != '\0') {
            if (pcVar32[uVar15 - lVar54] == '\0') {
              uVar12 = puVar49[iVar37];
              goto LAB_002e6899;
            }
            if (pcVar32[uVar30] != '\0') goto LAB_002e5945;
            uVar12 = puVar49[iVar37];
            if (pcVar32[uVar30 - lVar54] != '\0') {
              puVar14[uVar30] = uVar12;
              goto LAB_002e68c2;
            }
            uVar27 = puVar49[uVar30];
            goto LAB_002e5dec;
          }
          if (pcVar32[uVar30] != '\0') {
            cVar8 = pcVar32[uVar15 - lVar54];
            goto LAB_002e5854;
          }
        }
LAB_002e6511:
        lVar38 = (long)iVar37;
        goto LAB_002e6516;
      }
      if (*(char *)(lVar38 + uVar23) == '\0') {
        if (pcVar1[uVar23] == '\0') goto LAB_002e6192;
LAB_002e614d:
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        puVar14[uVar30] = TTA::length_;
        TTA::length_ = uVar12;
        goto LAB_002e68c2;
      }
      cVar8 = pcVar32[uVar23];
joined_r0x002e5bf6:
      if (cVar8 == '\0') {
        cVar8 = pcVar32[uVar30];
        goto joined_r0x002e609f;
      }
    }
    else {
      uVar23 = (ulong)(iVar37 + 1);
      lVar10 = (long)iVar37;
      if (pcVar1[uVar23] != '\0') {
        if (pcVar32[lVar10 + 3] != '\0') {
          if (pcVar32[uVar23 - lVar54] == '\0') {
            uVar12 = puVar49[lVar10];
          }
          else {
            if (pcVar32[uVar30] != '\0') goto LAB_002e58b5;
            uVar12 = puVar49[lVar10];
            if (pcVar32[uVar30 - lVar54] != '\0') goto LAB_002e6086;
          }
          uVar27 = puVar49[uVar30];
          goto LAB_002e5dec;
        }
        if (pcVar32[uVar30] == '\0') goto LAB_002e5be2;
        bVar58 = pcVar32[uVar23 - lVar54] == '\0';
LAB_002e5bd0:
        uVar12 = puVar49[lVar10];
        if (!bVar58) {
          puVar14[uVar30] = uVar12;
          goto LAB_002e68c2;
        }
        uVar27 = puVar49[uVar30];
        goto LAB_002e5dec;
      }
      if (pcVar32[lVar10 + 3] == '\0') {
        cVar8 = pcVar32[uVar30];
        goto joined_r0x002e5a4b;
      }
    }
LAB_002e5bfc:
    uVar12 = puVar49[uVar30];
    goto LAB_002e68b6;
  }
LAB_002e5056:
  uVar30 = (ulong)uVar12;
  if (local_110 < (int)uVar12) {
    if (*(char *)(lVar38 + uVar30) == '\0') goto LAB_002e50d2;
    cVar8 = pcVar32[uVar30];
    if (pcVar1[(long)iVar37 + 1] == '\0') goto joined_r0x002e5a4b;
joined_r0x002e5088:
    lVar10 = (long)iVar37;
    if (cVar8 == '\0') {
LAB_002e5be2:
      uVar12 = puVar14[lVar10];
      goto LAB_002e64ef;
    }
  }
  else {
    if (*(char *)(lVar38 + uVar30) == '\0') {
      uVar23 = (ulong)(iVar37 + 3);
      cVar8 = *(char *)(lVar38 + uVar23);
      if (pcVar1[uVar30] != '\0') goto LAB_002e511e;
      if (cVar8 != '\0') goto LAB_002e5406;
      bVar58 = pcVar1[uVar23] == '\0';
      goto LAB_002e60f4;
    }
    lVar10 = (long)iVar37;
    cVar8 = pcVar32[lVar10 + 3];
    if (pcVar1[lVar10 + 1] == '\0') goto joined_r0x002e540f;
    if (cVar8 == '\0') {
      cVar8 = pcVar32[uVar30];
      goto joined_r0x002e5088;
    }
  }
LAB_002e50bb:
  uVar12 = puVar49[uVar30];
LAB_002e50bf:
  uVar27 = puVar14[lVar10];
  goto LAB_002e5dec;
LAB_002e0fb6:
  local_160 = (ulong)(uint)((int)lVar18 + (int)lVar11);
LAB_002e021b:
  *puVar46 = 0;
  iVar37 = (int)local_160;
  uVar12 = iVar37 + 2;
  if ((int)uVar12 < local_110) {
    lVar40 = (long)iVar37;
    lVar18 = lVar40 + 2;
    lVar11 = lVar40 << 0x20;
    lVar17 = lVar33 + lVar40 + lVar10;
    lVar24 = lVar54 * lVar53 + lVar40 + lVar10;
    lVar39 = lVar35 + lVar40 * 4;
    lVar16 = lVar26 + lVar39 + 8;
    lVar21 = 0;
    while (*(char *)(lVar17 + 2 + lVar21) == '\0') {
      if (*(char *)(lVar24 + 2 + lVar21) != '\0') {
        uVar30 = lVar18 + lVar21;
        lVar17 = lVar11 + 0x300000000 >> 0x20;
        if (*(char *)(lVar38 + lVar17) == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          goto LAB_002e3931;
        }
        if (pcVar32[lVar17] != '\0') {
          *(undefined4 *)(lVar16 + lVar21 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
LAB_002e04b4:
          uVar30 = lVar18 + lVar21;
          goto LAB_002e1955;
        }
        lVar11 = lVar11 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar21 + 2 + lVar54 * lVar20 + lVar40 + lVar10);
        if (pcVar32[lVar11] == '\0') {
          if (cVar8 == '\0') goto LAB_002e0a8c;
          *(undefined4 *)(lVar16 + lVar21 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
          goto LAB_002e08cc;
        }
        if (cVar8 == '\0') {
LAB_002e07d2:
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar11];
          goto LAB_002e07eb;
        }
        uVar12 = *(uint *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
        if (pcVar32[lVar17 - lVar54] != '\0') goto LAB_002e0757;
        uVar27 = puVar49[lVar11];
        goto LAB_002e0a2e;
      }
      if (*(char *)(lVar17 + 3 + lVar21) != '\0') {
        lVar17 = lVar54 * lVar20 + lVar40 + lVar10;
        if (*(char *)(lVar21 + 3 + lVar17) != '\0') {
          *(undefined4 *)(lVar16 + lVar21 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
          goto LAB_002e04b4;
        }
        lVar11 = lVar11 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar21 + 2 + lVar17);
        if (pcVar32[lVar11] == '\0') {
          if (cVar8 == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            uVar30 = lVar18 + lVar21;
            goto LAB_002de3c4;
          }
          *(undefined4 *)(lVar16 + lVar21 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
          goto LAB_002e08cc;
        }
        if (cVar8 == '\0') goto LAB_002e07d2;
        uVar12 = *(uint *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
        if (*(char *)(lVar21 + 3 + lVar54 * lVar28 + lVar40 + lVar10) != '\0') goto LAB_002e0757;
        uVar12 = TTA::Merge(uVar12,puVar49[lVar11]);
        *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = uVar12;
        goto LAB_002e0a43;
      }
      if (*(char *)(lVar24 + 3 + lVar21) != '\0') {
        local_160 = (ulong)(uint)((int)lVar18 + (int)lVar21);
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = TTA::length_;
        TTA::length_ = uVar12;
        goto LAB_002e0bc3;
      }
      *(undefined4 *)(lVar16 + lVar21 * 4) = 0;
      lVar11 = lVar11 + 0x200000000;
      lVar22 = lVar21 + lVar18;
      lVar21 = lVar21 + 2;
      if (lVar45 <= lVar22 + 2) {
        iVar37 = iVar37 + (int)lVar21;
        uVar12 = (int)lVar18 + (int)lVar21;
        goto LAB_002e030c;
      }
    }
    local_160 = lVar18 + lVar21;
    lVar24 = lVar11 + 0x300000000 >> 0x20;
    lVar17 = lVar11 >> 0x20;
    if (pcVar32[lVar24] == '\0') {
      if (*(char *)(lVar38 + lVar24) == '\0') {
        if (*(char *)(lVar21 + 2 + lVar54 * lVar20 + lVar40 + lVar10) != '\0') {
          *(undefined4 *)(lVar16 + lVar21 * 4) =
               *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
          goto LAB_002e5607;
        }
        if (pcVar32[lVar17 + 1] == '\0') {
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = TTA::length_;
          TTA::length_ = uVar12;
        }
        else {
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar17];
        }
        goto LAB_002e4e8b;
      }
      lVar11 = lVar11 + 0x400000000 >> 0x20;
      cVar8 = *(char *)(lVar21 + 2 + lVar54 * lVar20 + lVar40 + lVar10);
      uVar30 = local_160;
      if (pcVar32[lVar11] == '\0') {
        if (cVar8 == '\0') {
          if (pcVar32[lVar17 + 1] == '\0') {
LAB_002e0a8c:
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            uVar30 = lVar18 + lVar21;
          }
          else {
            *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar17];
          }
          goto LAB_002de3c4;
        }
        *(undefined4 *)(lVar16 + lVar21 * 4) =
             *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
LAB_002e08cc:
        local_160 = lVar18 + lVar21;
        goto LAB_002de1c1;
      }
      if (cVar8 != '\0') {
        uVar12 = *(uint *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
        if (pcVar32[lVar24 - lVar54] == '\0') {
          uVar27 = puVar49[lVar11];
LAB_002e0a2e:
          uVar12 = TTA::Merge(uVar12,uVar27);
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = uVar12;
LAB_002e0a43:
          uVar30 = lVar18 + lVar21;
        }
        else {
LAB_002e0757:
          *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = uVar12;
          uVar30 = lVar18 + lVar21;
        }
        goto LAB_002de6d7;
      }
      if (pcVar32[lVar17 + 1] == '\0') {
        *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar11];
      }
      else {
        if (pcVar32[lVar24 - lVar54] != '\0') {
          if (*(char *)(lVar21 + 2 + lVar54 * lVar28 + lVar40 + lVar10) == '\0') {
            uVar12 = TTA::Merge(puVar49[lVar17],
                                *(uint *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4));
            *(uint *)(lVar16 + lVar21 * 4) = uVar12;
          }
          else {
            *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar17];
          }
          goto LAB_002de6d7;
        }
        uVar12 = TTA::Merge(puVar49[lVar17],puVar49[lVar11]);
        *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = uVar12;
      }
LAB_002e07eb:
      uVar30 = lVar18 + lVar21;
      goto LAB_002de6d7;
    }
    if ((*(char *)(lVar21 + 2 + lVar54 * lVar20 + lVar40 + lVar10) == '\0') &&
       (pcVar32[lVar17 + 1] != '\0')) {
      if (*(char *)(lVar21 + 2 + lVar54 * lVar28 + lVar40 + lVar10) == '\0') {
        uVar12 = TTA::Merge(puVar49[lVar17],
                            *(uint *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4));
        *(uint *)(lVar16 + lVar21 * 4) = uVar12;
      }
      else {
        *(uint *)(lVar39 + lVar26 + 8 + lVar21 * 4) = puVar49[lVar17];
      }
    }
    else {
      *(undefined4 *)(lVar16 + lVar21 * 4) =
           *(undefined4 *)(lVar31 * lVar28 + lVar40 * 4 + lVar26 + 8 + lVar21 * 4);
    }
LAB_002dddc1:
    iVar37 = (int)local_160;
    uVar12 = iVar37 + 2;
    if ((int)uVar12 < local_110) {
      lVar50 = (long)iVar37;
      lVar18 = lVar50 + 2;
      lVar39 = lVar31 * lVar28 + lVar50 * 4;
      lVar11 = lVar35 + lVar50 * 4;
      lVar17 = lVar33 + lVar50;
      lVar57 = lVar54 * lVar53 + lVar50;
      lVar52 = lVar54 * lVar28 + lVar50;
      lVar41 = lVar54 * lVar20 + lVar50;
      lVar50 = lVar50 << 0x20;
      lVar55 = lVar39 + lVar26;
      lVar56 = lVar55 + 8;
      lVar21 = lVar26 + 8 + lVar11;
      lVar16 = lVar10 + 3 + lVar17;
      lVar22 = lVar10 + 2 + lVar52;
      lVar42 = lVar41 + lVar10;
      lVar43 = lVar42 + 2;
      lVar40 = 0;
      lVar24 = 0;
      while (lVar51 = lVar50 >> 0x1e, *(char *)(lVar16 + -1 + lVar24) != '\0') {
        if (*(char *)(lVar16 + -2 + lVar24) == '\0') {
          cVar8 = *(char *)(lVar42 + 3 + lVar24);
          if (*(char *)(lVar10 + lVar57 + 1 + lVar24) == '\0') {
            if (cVar8 == '\0') {
              local_160 = lVar18 + lVar24;
              if (*(char *)(lVar24 + 3 + lVar17 + lVar10) == '\0') {
                if (*(char *)(lVar24 + 2 + lVar41 + lVar10) == '\0') {
                  *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                       *(undefined4 *)((long)puVar49 + lVar51);
                  local_160 = local_160 & 0xffffffff;
                  goto LAB_002e4e8b;
                }
                *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
                local_160 = local_160 & 0xffffffff;
                goto LAB_002e5607;
              }
              lVar18 = lVar50 + 0x400000000 >> 0x20;
              cVar8 = *(char *)(lVar24 + 2 + lVar41 + lVar10);
              if (pcVar32[lVar18] == '\0') {
                if (cVar8 != '\0') {
                  *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
                  goto LAB_002de1c1;
                }
                *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                     *(undefined4 *)((long)puVar49 + lVar51);
                uVar30 = local_160;
                goto LAB_002de3c4;
              }
              cVar2 = *(char *)(lVar24 + 3 + lVar52 + lVar10);
              if (cVar8 == '\0') {
                if (cVar2 == '\0') {
                  uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar51),puVar49[lVar18]);
                  *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                }
                else if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
                  uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar51),
                                      *(uint *)(lVar56 + lVar24 * 4));
                  *(uint *)(lVar21 + lVar24 * 4) = uVar12;
                }
                else {
                  *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar51);
                }
                uVar30 = local_160 & 0xffffffff;
              }
              else {
                uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar24 * 4);
                if (cVar2 == '\0') {
                  uVar12 = TTA::Merge(uVar12,puVar49[lVar18]);
                  *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                  uVar30 = local_160 & 0xffffffff;
                }
                else {
                  *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
                  uVar30 = local_160 & 0xffffffff;
                }
              }
              goto LAB_002de6d7;
            }
            if (*(char *)(lVar43 + lVar24) != '\0') goto LAB_002dded2;
          }
          else {
            if (cVar8 == '\0') {
              local_160 = lVar18 + lVar24;
              if (*(char *)(lVar24 + 3 + lVar17 + lVar10) == '\0') {
                uVar12 = *(uint *)((long)puVar49 + lVar51);
                uVar23 = local_160 & 0xffffffff;
                goto LAB_002e2275;
              }
              lVar39 = lVar50 + 0x400000000 >> 0x20;
              if (pcVar32[lVar39] == '\0') {
                uVar12 = *(uint *)((long)puVar49 + lVar51);
                uVar23 = local_160;
                goto LAB_002e1fd0;
              }
              if (*(char *)(lVar24 + 3 + lVar52 + lVar10) == '\0') {
                uVar12 = *(uint *)((long)puVar49 + lVar51);
                uVar27 = puVar49[lVar39];
                goto LAB_002dfdf5;
              }
              if (*(char *)(lVar24 + 2 + lVar41 + lVar10) != '\0') goto LAB_002dfa0a;
              uVar27 = *(uint *)((long)puVar49 + lVar51);
              if (*(char *)(lVar24 + 2 + lVar52 + lVar10) != '\0') goto LAB_002df190;
              uVar12 = TTA::Merge(uVar27,*(uint *)(lVar56 + lVar24 * 4));
              *(uint *)(lVar21 + lVar24 * 4) = uVar12;
              goto LAB_002dfe1d;
            }
            if (*(char *)(lVar43 + lVar24) != '\0') {
LAB_002ddf04:
              uVar12 = *(uint *)(lVar55 + lVar24 * 4);
              goto LAB_002ddf77;
            }
          }
          uVar12 = *(uint *)(lVar55 + lVar24 * 4);
          if (*(char *)(lVar22 + lVar24) == '\0') {
            uVar27 = *(uint *)(lVar56 + lVar24 * 4);
LAB_002ddf3b:
            uVar12 = TTA::Merge(uVar12,uVar27);
          }
        }
        else {
          if (*(char *)(lVar42 + 3 + lVar24) == '\0') {
            local_160 = lVar18 + lVar24;
            if (*(char *)(lVar24 + 3 + lVar17 + lVar10) == '\0') {
              uVar12 = *(uint *)((long)puVar14 + lVar51);
              uVar23 = local_160 & 0xffffffff;
              goto LAB_002e2275;
            }
            lVar39 = lVar50 + 0x400000000 >> 0x20;
            if (pcVar32[lVar39] == '\0') {
              uVar12 = *(uint *)((long)puVar14 + lVar51);
              uVar23 = local_160;
              goto LAB_002e1fd0;
            }
            if (*(char *)(lVar24 + 3 + lVar52 + lVar10) == '\0') {
              uVar12 = puVar49[lVar39];
              uVar27 = *(uint *)((long)puVar14 + lVar51);
              goto LAB_002dfdf5;
            }
            if (*(char *)(lVar24 + 2 + lVar41 + lVar10) != '\0') {
              *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
              uVar30 = local_160 & 0xffffffff;
              goto LAB_002de6d7;
            }
            if (*(char *)(lVar24 + 2 + lVar52 + lVar10) != '\0') {
LAB_002dfa0a:
              uVar12 = (int)lVar18 + (int)lVar24;
              uVar9 = *(undefined4 *)((long)puVar49 + lVar51);
              goto LAB_002dfa22;
            }
            uVar12 = TTA::Merge(*(uint *)(lVar56 + lVar24 * 4),*(uint *)((long)puVar14 + lVar51));
            *(uint *)(lVar21 + lVar24 * 4) = uVar12;
            goto LAB_002dfe97;
          }
          if (*(char *)(lVar43 + lVar24) == '\0') {
            if (*(char *)(lVar22 + lVar24) != '\0') goto LAB_002ddf04;
            uVar12 = *(uint *)(lVar56 + lVar24 * 4);
            uVar27 = *(uint *)(lVar21 + -8 + lVar24 * 4);
            goto LAB_002ddf3b;
          }
LAB_002dded2:
          uVar12 = *(uint *)(lVar56 + lVar24 * 4);
        }
LAB_002ddf77:
        *(uint *)(lVar21 + lVar24 * 4) = uVar12;
        lVar50 = lVar50 + 0x200000000;
        lVar51 = lVar18 + lVar24;
        lVar24 = lVar24 + 2;
        lVar40 = lVar40 + 8;
        if (lVar45 <= lVar51 + 2) {
          iVar37 = iVar37 + (int)lVar24;
          uVar12 = (int)lVar18 + (int)lVar24;
          goto LAB_002ddfc9;
        }
      }
      local_160 = lVar18 + lVar24;
      lVar17 = lVar50 + 0x300000000 >> 0x20;
      if (*(char *)(lVar24 + 2 + lVar57 + lVar10) != '\0') {
        lVar40 = lVar50 + 0x100000000 >> 0x20;
        if (*(char *)(lVar38 + lVar17) == '\0') {
          if (pcVar1[lVar40] == '\0') {
            if (*(char *)(lVar38 + lVar40) != '\0') {
              *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                   *(undefined4 *)((long)puVar14 + lVar51);
              uVar30 = local_160 & 0xffffffff;
              goto LAB_002e3931;
            }
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = TTA::length_;
            TTA::length_ = uVar12;
          }
          else {
            *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                 *(undefined4 *)((long)puVar14 + lVar51);
          }
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e3931;
        }
        if (*(char *)(lVar38 + lVar40) == '\0') {
          if (pcVar1[lVar40] == '\0') {
            if (pcVar32[lVar17] == '\0') goto LAB_002df849;
            *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
          }
          else {
            if (pcVar32[lVar17] == '\0') {
              lVar18 = lVar50 + 0x400000000 >> 0x20;
              if (pcVar32[lVar18] == '\0') {
                if (*(char *)(lVar24 + 2 + lVar41 + lVar10) != '\0') {
                  *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)((long)puVar49 + lVar51);
                  goto LAB_002de1c1;
                }
                *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)((long)puVar14 + lVar51);
                uVar30 = local_160;
                goto LAB_002de3c4;
              }
              cVar8 = *(char *)(lVar24 + 2 + lVar41 + lVar10);
              if (pcVar32[lVar17 - lVar54] == '\0') {
                if (cVar8 == '\0') {
                  uVar12 = puVar49[lVar18];
                  uVar27 = *(uint *)((long)puVar14 + lVar51);
                }
                else {
                  uVar12 = *(uint *)((long)puVar49 + lVar51);
                  uVar27 = puVar49[lVar18];
                }
                uVar12 = TTA::Merge(uVar12,uVar27);
                *(uint *)(lVar21 + lVar24 * 4) = uVar12;
                uVar30 = local_160 & 0xffffffff;
                goto LAB_002de6d7;
              }
              if (cVar8 != '\0') {
                *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                     *(undefined4 *)((long)puVar49 + lVar51);
                goto LAB_002dffd2;
              }
              if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
                uVar27 = (uint)local_160;
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar51),*(uint *)(lVar56 + lVar24 * 4)
                                   );
                *(uint *)(lVar21 + lVar24 * 4) = uVar12;
                goto LAB_002e69dd;
              }
              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar51);
              goto LAB_002e6a13;
            }
            if (*(char *)(lVar24 + 2 + lVar41 + lVar10) == '\0') {
              if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
                uVar12 = TTA::Merge(*(uint *)((long)puVar49 + lVar51),*(uint *)(lVar56 + lVar24 * 4)
                                   );
                *(uint *)(lVar21 + lVar24 * 4) = uVar12;
                uVar30 = local_160 & 0xffffffff;
                goto LAB_002e1955;
              }
              *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = *(uint *)((long)puVar49 + lVar51);
              goto LAB_002e5c5a;
            }
            *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                 *(undefined4 *)((long)puVar49 + lVar51);
          }
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
        if (pcVar32[lVar17] != '\0') {
          if (*(char *)(lVar24 + 2 + lVar41 + lVar10) == '\0') {
            if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
              uVar12 = TTA::Merge(*(uint *)(lVar56 + lVar24 * 4),*(uint *)((long)puVar14 + lVar51));
              *(uint *)(lVar21 + lVar24 * 4) = uVar12;
              uVar30 = local_160 & 0xffffffff;
              goto LAB_002e1955;
            }
            *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
                 *(undefined4 *)((long)puVar49 + lVar51);
          }
          else {
            *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
          }
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
        lVar39 = lVar50 + 0x400000000 >> 0x20;
        if (pcVar32[lVar39] == '\0') {
          uVar12 = *(uint *)((long)puVar14 + lVar51);
          uVar23 = local_160;
          goto LAB_002e1fd0;
        }
        if (pcVar32[lVar17 - lVar54] == '\0') {
          uVar12 = puVar49[lVar39];
          uVar27 = *(uint *)((long)puVar14 + lVar51);
LAB_002dfdf5:
          local_160 = lVar18 + lVar24;
          uVar12 = TTA::Merge(uVar12,uVar27);
          *(uint *)(lVar11 + lVar26 + 8 + lVar24 * 4) = uVar12;
          goto LAB_002dfe1d;
        }
        if (*(char *)(lVar24 + 2 + lVar41 + lVar10) == '\0') {
          if (*(char *)(lVar24 + 2 + lVar52 + lVar10) == '\0') {
            uVar12 = TTA::Merge(*(uint *)(lVar56 + lVar24 * 4),*(uint *)((long)puVar14 + lVar51));
            *(uint *)(lVar21 + lVar24 * 4) = uVar12;
LAB_002dfe97:
            uVar30 = lVar18 + lVar24 & 0xffffffff;
            goto LAB_002de6d7;
          }
          *(undefined4 *)(lVar11 + lVar26 + 8 + lVar24 * 4) =
               *(undefined4 *)((long)puVar49 + lVar51);
        }
        else {
          *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
        }
LAB_002dffd2:
        uVar30 = local_160 & 0xffffffff;
        goto LAB_002de6d7;
      }
      if (*(char *)(lVar38 + lVar17) != '\0') {
        if (pcVar32[lVar17] != '\0') {
          *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
          uVar30 = local_160 & 0xffffffff;
          goto LAB_002e1955;
        }
LAB_002df849:
        lVar18 = lVar50 + 0x400000000 >> 0x20;
        cVar8 = *(char *)(lVar24 + 2 + lVar41 + lVar10);
        if (pcVar32[lVar18] == '\0') {
          if (cVar8 != '\0') {
            *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar56 + lVar24 * 4);
            goto LAB_002de1c1;
          }
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar12 = TTA::length_;
          goto LAB_002e70a8;
        }
        if (cVar8 == '\0') {
          uVar12 = puVar49[lVar18];
          goto LAB_002e6a03;
        }
        uVar12 = *(uint *)(lVar39 + lVar26 + 8 + lVar24 * 4);
        if (pcVar32[lVar17 - lVar54] != '\0') goto LAB_002e5d2e;
        uVar12 = TTA::Merge(uVar12,puVar49[lVar18]);
        goto LAB_002e69d6;
      }
      if (pcVar1[lVar17] != '\0') {
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_;
        goto LAB_002e62dd;
      }
      lVar40 = lVar40 + lVar11 + lVar26;
      local_160 = local_160 & 0xffffffff;
LAB_002e426a:
      puVar46 = (uint *)(lVar40 + 8);
      goto LAB_002e021b;
    }
LAB_002ddfc9:
    uVar30 = (ulong)uVar12;
    if (local_110 < (int)uVar12) {
      if (*(char *)(lVar38 + uVar30) != '\0') {
        if (*(char *)(lVar38 + (ulong)(iVar37 + 1)) != '\0') goto LAB_002ddffe;
        if ((pcVar1[iVar37 + 1] != '\0') || (pcVar32[uVar30] == '\0')) goto LAB_002e4107;
        goto LAB_002e3d35;
      }
      if (pcVar1[uVar30] == '\0') {
        puVar14[uVar30] = 0;
        goto LAB_002e68c2;
      }
      if (pcVar1[iVar37 + 1] != '\0') {
        lVar38 = (long)iVar37;
        goto LAB_002e50eb;
      }
      cVar8 = *(char *)(lVar38 + (ulong)(iVar37 + 1));
joined_r0x002df358:
      if (cVar8 == '\0') goto LAB_002e53b1;
      puVar14[uVar30] = puVar14[iVar37];
      goto LAB_002e68c2;
    }
    if (*(char *)(lVar38 + uVar30) == '\0') {
      uVar23 = (ulong)(iVar37 + 3);
      if (pcVar1[uVar30] == '\0') {
        if (*(char *)(lVar38 + uVar23) == '\0') {
          bVar58 = pcVar1[uVar23] == '\0';
          goto LAB_002e60f4;
        }
        cVar8 = pcVar32[uVar23];
        goto joined_r0x002e540f;
      }
      uVar15 = (ulong)(iVar37 + 1);
      if (*(char *)(lVar38 + uVar23) == '\0') {
        if (pcVar1[uVar15] == '\0') {
          cVar8 = *(char *)(lVar38 + uVar15);
          goto joined_r0x002df358;
        }
LAB_002ddffe:
        lVar10 = (long)iVar37;
        goto LAB_002e5be2;
      }
      if (*(char *)(lVar38 + uVar15) == '\0') {
        cVar8 = pcVar32[uVar23];
        if (pcVar1[uVar15] == '\0') goto joined_r0x002e540f;
        if (cVar8 == '\0') {
          if (pcVar32[uVar30] == '\0') {
            uVar12 = puVar14[iVar37];
          }
          else {
            uVar12 = puVar49[iVar37];
          }
          goto LAB_002e64ef;
        }
        if (pcVar32[uVar30] == '\0') {
          bVar58 = pcVar32[uVar30 - lVar54] == '\0';
          lVar10 = (long)iVar37;
          goto LAB_002e5bd0;
        }
      }
      else {
        if (pcVar32[uVar23] == '\0') goto LAB_002ddffe;
        if (pcVar32[uVar30] != '\0') goto LAB_002e64eb;
        if (pcVar32[uVar30 - lVar54] == '\0') {
          uVar12 = puVar49[uVar30];
          lVar10 = (long)iVar37;
          goto LAB_002e50bf;
        }
      }
      lVar10 = (long)iVar37;
      goto LAB_002e053a;
    }
    lVar10 = (long)iVar37;
    if (*(char *)(lVar38 + (ulong)(iVar37 + 1)) != '\0') {
      if (pcVar32[lVar10 + 3] == '\0') goto LAB_002e5be2;
      if (pcVar32[uVar30] != '\0') goto LAB_002e3d35;
      if (pcVar32[uVar30 - lVar54] != '\0') goto LAB_002e053a;
      goto LAB_002e50bb;
    }
    if (pcVar1[iVar37 + 1] == '\0') {
      if (pcVar32[lVar10 + 3] == '\0') {
        if (pcVar32[uVar30] != '\0') goto LAB_002e5bfc;
        uVar12 = puVar49[lVar10];
        goto LAB_002e68b6;
      }
      if (pcVar32[uVar30] != '\0') goto LAB_002e5bfc;
      uVar12 = puVar49[lVar10];
      if (pcVar32[uVar30 - lVar54] != '\0') goto LAB_002e5866;
      uVar27 = puVar49[uVar30];
      goto LAB_002e5dec;
    }
    if (pcVar32[lVar10 + 3] != '\0') {
      if (pcVar32[uVar30] == '\0') goto LAB_002e036d;
      goto LAB_002e58b5;
    }
  }
  else {
LAB_002e030c:
    uVar30 = (ulong)uVar12;
    if (local_110 < (int)uVar12) {
      if (*(char *)(lVar38 + uVar30) != '\0') {
        if (pcVar32[uVar30] != '\0') goto LAB_002e3d35;
        lVar10 = (long)iVar37;
        if (pcVar32[lVar10 + 1] != '\0') goto LAB_002e58b5;
        goto LAB_002e6104;
      }
      cVar8 = pcVar1[uVar30];
joined_r0x002e0382:
      if (cVar8 != '\0') goto LAB_002e6104;
      goto LAB_002e50f6;
    }
    if (*(char *)(lVar38 + uVar30) == '\0') {
      uVar23 = (ulong)(iVar37 + 3);
      if (pcVar1[uVar30] == '\0') {
        if (*(char *)(lVar38 + uVar23) == '\0') {
          cVar8 = pcVar1[uVar23];
          goto joined_r0x002e0382;
        }
      }
      else if (*(char *)(lVar38 + uVar23) == '\0') goto LAB_002e6104;
      if ((pcVar32[uVar23] != '\0') || (pcVar32[uVar30] != '\0')) goto LAB_002e3d35;
      goto LAB_002e6104;
    }
    lVar10 = (long)iVar37;
    if (pcVar32[lVar10 + 3] != '\0') {
      if ((pcVar32[uVar30] != '\0') || (pcVar32[lVar10 + 1] == '\0')) goto LAB_002e64eb;
LAB_002e036d:
      bVar58 = pcVar32[uVar30 - lVar54] == '\0';
      goto LAB_002e5bd0;
    }
    if (pcVar32[uVar30] != '\0') goto LAB_002e64eb;
    if (pcVar32[lVar10 + 1] == '\0') goto LAB_002e6104;
  }
LAB_002e053a:
  uVar12 = puVar49[lVar10];
  goto LAB_002e64ef;
LAB_002e7e8c:
  uVar30 = lVar16 + lVar21 + 2;
  uVar29 = (ulong)(iVar37 + iVar36 + 2);
LAB_002e7eb4:
  *(undefined4 *)(lVar53 + uVar30 * 4) = *(undefined4 *)(lVar26 + uVar30 * 4);
  lVar10 = (long)(int)uVar29;
  uVar30 = lVar10 + 2;
  iVar36 = (int)uVar30;
  if (iVar36 < local_110) {
    if (*(char *)(lVar45 + 2 + lVar10) == '\0') {
      if (*(char *)(lVar45 + 3 + lVar10) == '\0') {
LAB_002e8350:
        iVar36 = (int)uVar30;
        goto LAB_002e76bc;
      }
      if (*(char *)(lVar54 + 3 + lVar10) != '\0') goto LAB_002e8030;
      if (*(char *)(lVar10 + 4 + lVar54) == '\0') goto LAB_002e79fd;
      *(undefined4 *)(lVar53 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + 0x10 + lVar10 * 4);
      uVar29 = uVar30 & 0xffffffff;
    }
    else {
      if (*(char *)(lVar54 + 3 + lVar10) != '\0') {
        if (*(char *)(lVar18 + uVar30) != '\0') {
          uVar12 = *(uint *)(lVar26 + lVar10 * 4);
          if (*(char *)(lVar18 + 1 + lVar10) != '\0') goto LAB_002e84a4;
          uVar27 = *(uint *)(lVar26 + 8 + lVar10 * 4);
          goto LAB_002e8499;
        }
        uVar12 = *(uint *)(lVar26 + 8 + lVar10 * 4);
        uVar27 = *(uint *)(lVar53 + lVar10 * 4);
        goto LAB_002e8499;
      }
      iVar37 = iVar36;
      if (*(char *)(lVar45 + 3 + lVar10) == '\0') {
        uVar12 = *(uint *)(lVar53 + lVar10 * 4);
        goto LAB_002e87b6;
      }
      if (*(char *)(lVar10 + 4 + lVar54) == '\0') {
        puVar25 = (undefined4 *)(lVar53 + lVar10 * 4);
LAB_002e827c:
        *(undefined4 *)(lVar53 + uVar30 * 4) = *puVar25;
        uVar12 = iVar37 + 2;
        if ((int)uVar12 < local_110) {
          lVar17 = (long)iVar37;
          lVar10 = lVar17 + 2;
          lVar11 = lVar17 << 0x20;
          lVar33 = lVar35 + lVar17 * 4;
          lVar21 = 0;
LAB_002e82bf:
          if (*(char *)(lVar28 + lVar17 + -1 + lVar21) == '\0') {
            uVar30 = lVar10 + lVar21;
            lVar10 = lVar11 + 0x300000000 >> 0x20;
            if (*(char *)(lVar45 + lVar10) == '\0') goto LAB_002e8350;
            if (*(char *)(lVar54 + lVar10) != '\0') goto LAB_002e8343;
            lVar10 = lVar11 + 0x400000000 >> 0x20;
            if (*(char *)(lVar54 + lVar10) == '\0') goto LAB_002e79fd;
            *(undefined4 *)(lVar33 + lVar21 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
            goto LAB_002e8846;
          }
          lVar24 = lVar11 >> 0x20;
          lVar16 = lVar11 >> 0x1e;
          if (*(char *)(lVar20 + lVar17 + -1 + lVar21) != '\0') goto LAB_002e8358;
          if (*(char *)(lVar28 + lVar17 + lVar21) == '\0') {
            uVar30 = lVar10 + lVar21;
            uVar12 = *(uint *)(lVar53 + lVar16);
LAB_002e83b3:
            iVar37 = (int)uVar30;
            goto LAB_002e87b6;
          }
          if (*(char *)(lVar20 + lVar17 + lVar21) == '\0') goto code_r0x002e82e5;
          uVar30 = lVar10 + lVar21;
          if (*(char *)(lVar21 + lVar40 + lVar17) == '\0') {
            uVar12 = *(uint *)(lVar38 + lVar17 * 4 + 8 + lVar21 * 4);
          }
          else {
            if (*(char *)(lVar21 + -1 + lVar40 + lVar17) != '\0') {
              if (*(char *)(lVar54 + lVar24) == '\0') {
                uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
                uVar27 = *(uint *)(lVar53 + lVar24 * 4);
LAB_002e8948:
                uVar12 = TTA::Merge(uVar12,uVar27);
                *(uint *)(lVar33 + lVar21 * 4) = uVar12;
              }
              else {
                uVar12 = *(uint *)(lVar26 + lVar24 * 4);
                if (*(char *)(lVar18 + 1 + lVar24) == '\0') {
                  uVar27 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
                  goto LAB_002e8948;
                }
                *(uint *)(lVar33 + lVar21 * 4) = uVar12;
              }
              uVar29 = uVar30 & 0xffffffff;
              goto LAB_002e7cc1;
            }
            uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
          }
          uVar12 = TTA::Merge(uVar12,*(uint *)(lVar53 + lVar16));
          *(uint *)(lVar33 + lVar21 * 4) = uVar12;
LAB_002e8846:
          uVar29 = uVar30 & 0xffffffff;
          goto LAB_002e7cc1;
        }
LAB_002e8d43:
        uVar30 = (ulong)uVar12;
        if (local_110 < (int)uVar12) goto LAB_002e8d51;
        lVar20 = (long)(int)uVar12;
        if (*(char *)(lVar45 + lVar20) == '\0') {
          if (*(char *)((long)iVar37 + 3 + lVar45) == '\0') {
LAB_002e8fb0:
            *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
            goto LAB_002e9054;
          }
          if (*(char *)(lVar54 + 3 + (long)iVar37) == '\0') {
LAB_002e8f78:
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar53 + lVar20 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            goto LAB_002e9054;
          }
LAB_002e9047:
          uVar12 = *(uint *)(lVar26 + lVar20 * 4);
        }
        else {
          lVar28 = (long)iVar37;
          if (*(char *)(lVar54 + 3 + lVar28) == '\0') {
LAB_002e8ec1:
            uVar12 = *(uint *)(lVar53 + lVar28 * 4);
          }
          else {
            if ((*(char *)(lVar18 + lVar20) == '\0') || (*(char *)(lVar54 + lVar28) == '\0')) {
LAB_002e8fbd:
              uVar12 = *(uint *)(lVar26 + lVar20 * 4);
              uVar27 = *(uint *)(lVar53 + lVar28 * 4);
            }
            else {
              cVar8 = *(char *)(lVar18 + 1 + lVar28);
LAB_002e8f25:
              uVar12 = *(uint *)(lVar26 + lVar28 * 4);
              if (cVar8 != '\0') {
                *(uint *)(lVar53 + lVar20 * 4) = uVar12;
                goto LAB_002e9054;
              }
              uVar27 = *(uint *)(lVar26 + lVar20 * 4);
            }
            uVar12 = TTA::Merge(uVar12,uVar27);
          }
        }
LAB_002e904c:
        *(uint *)(lVar53 + lVar20 * 4) = uVar12;
        goto LAB_002e9054;
      }
      if (*(char *)(lVar18 + 3 + lVar10) == '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar26 + 0x10 + lVar10 * 4),*(uint *)(lVar53 + lVar10 * 4));
        *(uint *)(lVar53 + 8 + lVar10 * 4) = uVar12;
        uVar29 = uVar30 & 0xffffffff;
      }
      else {
        if (*(char *)(lVar18 + uVar30) == '\0') {
          uVar12 = *(uint *)(lVar26 + 8 + lVar10 * 4);
          uVar27 = *(uint *)(lVar53 + lVar10 * 4);
LAB_002e800a:
          uVar12 = TTA::Merge(uVar12,uVar27);
          *(uint *)(lVar53 + 8 + lVar10 * 4) = uVar12;
        }
        else {
          uVar12 = *(uint *)(lVar26 + lVar10 * 4);
          if (*(char *)(lVar18 + 1 + lVar10) == '\0') {
            uVar27 = *(uint *)(lVar26 + 8 + lVar10 * 4);
            goto LAB_002e800a;
          }
          *(uint *)(lVar53 + 8 + lVar10 * 4) = uVar12;
        }
LAB_002e8023:
        uVar29 = uVar30 & 0xffffffff;
      }
    }
    goto LAB_002e7cc1;
  }
  if (local_110 < iVar36) goto LAB_002e8d51;
  if (*(char *)(lVar45 + uVar30) == '\0') {
    if (*(char *)(lVar10 + 3 + lVar45) == '\0') {
      *(undefined4 *)(lVar53 + 8 + lVar10 * 4) = 0;
      goto LAB_002e9054;
    }
    if (*(char *)(lVar54 + 3 + lVar10) == '\0') {
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_ + 1;
      *(uint *)(lVar53 + 8 + lVar10 * 4) = TTA::length_;
      TTA::length_ = uVar12;
      goto LAB_002e9054;
    }
    uVar12 = *(uint *)(lVar26 + 8 + lVar10 * 4);
  }
  else if (*(char *)(lVar54 + 3 + lVar10) == '\0') {
    uVar12 = *(uint *)(lVar53 + lVar10 * 4);
  }
  else {
    if (*(char *)(lVar18 + uVar30) == '\0') {
      uVar12 = *(uint *)(lVar26 + 8 + lVar10 * 4);
      uVar27 = *(uint *)(lVar53 + lVar10 * 4);
    }
    else {
      uVar12 = *(uint *)(lVar26 + lVar10 * 4);
      if (*(char *)(lVar18 + 1 + lVar10) != '\0') {
        *(uint *)(lVar53 + 8 + lVar10 * 4) = uVar12;
        goto LAB_002e9054;
      }
      uVar27 = *(uint *)(lVar26 + 8 + lVar10 * 4);
    }
    uVar12 = TTA::Merge(uVar12,uVar27);
  }
  *(uint *)(lVar53 + 8 + lVar10 * 4) = uVar12;
  goto LAB_002e9054;
LAB_002e8358:
  uVar30 = lVar10 + lVar21;
  if (*(char *)(lVar21 + -1 + lVar40 + lVar17) == '\0') {
    uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
    uVar27 = *(uint *)(lVar53 + lVar16);
    goto LAB_002e842a;
  }
  if (*(char *)(lVar54 + lVar24) == '\0') {
    uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
    uVar27 = *(uint *)(lVar53 + lVar24 * 4);
  }
  else {
    uVar12 = *(uint *)(lVar26 + lVar24 * 4);
    if (*(char *)(lVar18 + 1 + lVar24) != '\0') goto LAB_002e84a4;
    uVar27 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
  }
LAB_002e8499:
  uVar12 = TTA::Merge(uVar12,uVar27);
LAB_002e84a4:
  uVar29 = uVar30 & 0xffffffff;
LAB_002e84b7:
  *(uint *)(lVar53 + uVar30 * 4) = uVar12;
  iVar37 = (int)uVar29;
  iVar36 = iVar37 + 2;
  if (local_110 <= iVar36) {
LAB_002e8c41:
    lVar20 = (long)iVar36;
    if (local_110 < iVar36) {
      if (*(char *)(lVar45 + lVar20) == '\0') goto LAB_002e8fb0;
      lVar28 = (long)iVar37;
      if (*(char *)(lVar45 + 1 + lVar28) != '\0') goto LAB_002e8ec1;
      cVar2 = *(char *)(lVar54 + lVar20);
joined_r0x002e8c7a:
      lVar28 = (long)iVar37;
      if (cVar2 != '\0') goto LAB_002e9047;
    }
    else {
      lVar28 = (long)iVar37;
      if (*(char *)(lVar45 + lVar20) == '\0') {
LAB_002e8e22:
        if (*(char *)(lVar28 + 3 + lVar45) == '\0') goto LAB_002e8fb0;
        if ((*(char *)(lVar54 + 3 + lVar28) != '\0') || (*(char *)(lVar54 + lVar20) != '\0'))
        goto LAB_002e9047;
        goto LAB_002e8f78;
      }
      cVar8 = *(char *)(lVar54 + 3 + lVar28);
      if (*(char *)(lVar45 + 1 + lVar28) == '\0') {
        cVar2 = *(char *)(lVar54 + lVar20);
        if (cVar8 == '\0') goto joined_r0x002e8c7a;
        if (cVar2 != '\0') goto LAB_002e9047;
LAB_002e8f19:
        cVar8 = *(char *)(lVar18 + lVar20);
        goto LAB_002e8f25;
      }
joined_r0x002e8cc1:
      if (cVar8 == '\0') goto LAB_002e8ec1;
      if (*(char *)(lVar54 + lVar20) != '\0') goto LAB_002e9047;
      if (*(char *)(lVar18 + lVar20) == '\0') goto LAB_002e8fbd;
    }
LAB_002e8efb:
    uVar12 = *(uint *)(lVar26 + lVar28 * 4);
    goto LAB_002e904c;
  }
  lVar16 = (long)iVar37;
  lVar10 = lVar16 + 2;
  lVar33 = (lVar16 << 0x20) + 0x400000000;
  lVar22 = (lVar16 << 0x20) + 0x300000000;
  lVar11 = lVar38 + lVar16 * 4;
  lVar17 = lVar53 + lVar16 * 4;
  lVar21 = lVar28 + lVar16;
  lVar24 = lVar40 + lVar16;
  lVar16 = lVar16 + lVar31;
  lVar52 = 0;
  lVar57 = 0;
LAB_002e8539:
  lVar41 = lVar33 >> 0x20;
  if (*(char *)(lVar21 + -1 + lVar57) == '\0') {
    uVar30 = lVar10 + lVar57;
    lVar22 = lVar22 >> 0x20;
    iVar36 = (int)uVar30;
    if (*(char *)(lVar45 + lVar22) == '\0') goto LAB_002e76bc;
    if (*(char *)(lVar54 + lVar22) != '\0') goto LAB_002e8030;
    if (*(char *)(lVar54 + lVar41) == '\0') {
      if (*(char *)(lVar57 + lVar16) == '\0') {
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_;
        goto LAB_002e7a35;
      }
      uVar29 = uVar30 & 0xffffffff;
      goto LAB_002e7eb4;
    }
    if (*(char *)(lVar57 + lVar16) == '\0') {
      *(undefined4 *)(lVar17 + 8 + lVar57 * 4) = *(undefined4 *)(lVar26 + lVar41 * 4);
    }
    else {
      uVar12 = *(uint *)(lVar11 + lVar57 * 4);
      if (*(char *)(lVar18 + lVar22) != '\0') {
        *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
        goto LAB_002e8782;
      }
      uVar12 = TTA::Merge(uVar12,*(uint *)(lVar26 + lVar41 * 4));
      *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
    }
    uVar29 = uVar30 & 0xffffffff;
    goto LAB_002e7cc1;
  }
  cVar8 = *(char *)(lVar16 + 1 + lVar57);
  if (*(char *)(lVar21 + -2 + lVar57) == '\0') {
    if (cVar8 == '\0') goto LAB_002e86d3;
    if (*(char *)(lVar16 + lVar57) == '\0') {
      uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
      if (*(char *)(lVar24 + -1 + lVar57) == '\0') {
        uVar27 = *(uint *)(lVar11 + lVar57 * 4);
LAB_002e85d8:
        uVar12 = TTA::Merge(uVar12,uVar27);
      }
    }
    else {
LAB_002e857f:
      uVar12 = *(uint *)(lVar11 + lVar57 * 4);
    }
  }
  else {
    if (cVar8 == '\0') {
      uVar30 = lVar10 + lVar57;
      iVar37 = (int)uVar30;
      if (*(char *)(lVar57 + lVar21) == '\0') {
        uVar12 = *(uint *)(lVar17 + lVar57 * 4);
        goto LAB_002e87b6;
      }
      if (*(char *)(lVar54 + lVar41) == '\0') {
        puVar25 = (undefined4 *)(lVar17 + lVar52);
        goto LAB_002e827c;
      }
      if (*(char *)(lVar57 + lVar24) != '\0') {
        if (*(char *)(lVar57 + lVar16) != '\0') {
          *(undefined4 *)(lVar17 + 8 + lVar57 * 4) = *(undefined4 *)(lVar11 + lVar57 * 4);
          goto LAB_002e8782;
        }
        if (*(char *)(lVar57 + -1 + lVar24) == '\0') {
          uVar12 = TTA::Merge(*(uint *)(lVar11 + lVar57 * 4),*(uint *)(lVar17 + lVar57 * 4));
        }
        else {
          uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
        }
        *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
        goto LAB_002e8ab3;
      }
      uVar12 = TTA::Merge(*(uint *)(lVar26 + lVar41 * 4),*(uint *)(lVar17 + lVar57 * 4));
      *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
LAB_002e8253:
      uVar29 = uVar30 & 0xffffffff;
      goto LAB_002e7cc1;
    }
    if (*(char *)(lVar16 + lVar57) != '\0') goto LAB_002e857f;
    if (*(char *)(lVar24 + -1 + lVar57) == '\0') {
      uVar12 = *(uint *)(lVar11 + lVar57 * 4);
      uVar27 = *(uint *)(lVar17 + lVar57 * 4);
      goto LAB_002e85d8;
    }
    uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
  }
  *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
  lVar33 = lVar33 + 0x200000000;
  lVar22 = lVar22 + 0x200000000;
  lVar52 = lVar52 + 8;
  lVar41 = lVar10 + lVar57;
  lVar57 = lVar57 + 2;
  if (lVar39 <= lVar41 + 2) {
    iVar36 = iVar37 + (int)lVar57 + 2;
    iVar37 = iVar37 + (int)lVar57;
    goto LAB_002e8c41;
  }
  goto LAB_002e8539;
LAB_002e86d3:
  uVar30 = lVar10 + lVar57;
  if (*(char *)(lVar57 + lVar21) != '\0') {
    if (*(char *)(lVar54 + lVar41) == '\0') {
      if (*(char *)(lVar57 + lVar16) == '\0') {
        uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
LAB_002e8a77:
        uVar29 = uVar30 & 0xffffffff;
LAB_002e7a38:
        *(uint *)(lVar53 + uVar30 * 4) = uVar12;
        puVar46 = TTA::tail_;
        puVar49 = TTA::next_;
        puVar14 = TTA::rtable_;
        iVar37 = (int)uVar29;
        uVar12 = iVar37 + 2;
        if ((int)uVar12 < local_110) {
          lVar11 = (long)iVar37;
          lVar10 = lVar11 + 2;
          lVar21 = lVar11 << 0x20;
          lVar33 = lVar35 + lVar11 * 4;
          lVar17 = 0;
          while( true ) {
            if (*(char *)(lVar28 + lVar11 + -1 + lVar17) != '\0') {
              uVar30 = lVar10 + lVar17;
              lVar10 = lVar21 + 0x300000000 >> 0x20;
              lVar24 = lVar21 >> 0x1e;
              if (*(char *)(lVar54 + lVar10) != '\0') {
                uVar12 = TTA::Merge(*(uint *)(lVar38 + lVar11 * 4 + lVar17 * 4),
                                    *(uint *)(lVar53 + lVar24));
                uVar29 = uVar30 & 0xffffffff;
                goto LAB_002e84b7;
              }
              if (*(char *)(lVar45 + lVar10) == '\0') {
                uVar12 = *(uint *)(lVar53 + lVar24);
                iVar37 = (int)uVar30;
                goto LAB_002e87b6;
              }
              lVar16 = lVar21 + 0x400000000 >> 0x20;
              if (*(char *)(lVar54 + lVar16) == '\0') goto LAB_002e81c7;
              if (*(char *)(lVar18 + lVar10) == '\0') {
                uVar12 = *(uint *)(lVar26 + lVar16 * 4);
              }
              else {
                uVar12 = *(uint *)(lVar38 + lVar11 * 4 + lVar17 * 4);
              }
              uVar12 = TTA::Merge(uVar12,*(uint *)(lVar53 + lVar24));
              *(uint *)(lVar33 + lVar17 * 4) = uVar12;
              uVar29 = uVar30 & 0xffffffff;
              goto LAB_002e7cc1;
            }
            if (*(char *)(lVar28 + lVar11 + lVar17) == '\0') {
              uVar30 = lVar10 + lVar17;
              iVar36 = (int)uVar30;
              goto LAB_002e76bc;
            }
            if (*(char *)(lVar20 + lVar11 + -1 + lVar17) != '\0') break;
            if (*(char *)(lVar20 + lVar11 + lVar17) != '\0') {
              *(undefined4 *)(lVar33 + lVar17 * 4) =
                   *(undefined4 *)(lVar38 + lVar11 * 4 + 8 + lVar17 * 4);
              uVar29 = (ulong)(uint)((int)lVar10 + (int)lVar17);
              goto LAB_002e7cc1;
            }
            puVar14[TTA::length_] = TTA::length_;
            puVar49[TTA::length_] = 0xffffffff;
            puVar46[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar33 + lVar17 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            lVar21 = lVar21 + 0x200000000;
            lVar24 = lVar10 + lVar17;
            lVar17 = lVar17 + 2;
            if (lVar39 <= lVar24 + 2) {
              uVar12 = iVar37 + (int)lVar17 + 2;
              iVar37 = iVar37 + (int)lVar17;
              goto LAB_002e8d14;
            }
          }
          uVar30 = lVar10 + lVar17;
          iVar36 = (int)uVar30;
LAB_002e8030:
          *(undefined4 *)(lVar53 + uVar30 * 4) = *(undefined4 *)(lVar26 + uVar30 * 4);
          uVar12 = iVar36 + 2;
          if ((int)uVar12 < local_110) {
            lVar24 = (long)iVar36;
            lVar10 = lVar24 + 2;
            lVar21 = lVar24 << 0x20;
            lVar33 = lVar31 + lVar24;
            lVar11 = lVar35 + lVar24 * 4;
            lVar17 = lVar38 + lVar24 * 4;
            lVar16 = 0;
            do {
              if (*(char *)(lVar28 + lVar24 + -1 + lVar16) != '\0') {
                uVar30 = lVar10 + lVar16;
                lVar52 = lVar21 + 0x300000000 >> 0x20;
                lVar22 = lVar21 >> 0x1e;
                if (*(char *)(lVar54 + lVar52) != '\0') {
                  if (*(char *)(lVar16 + lVar33) == '\0') {
                    if (*(char *)(lVar16 + -1 + lVar24 + lVar40) == '\0') {
                      uVar12 = TTA::Merge(*(uint *)(lVar17 + lVar16 * 4),*(uint *)(lVar53 + lVar22))
                      ;
                    }
                    else {
                      uVar12 = *(uint *)(lVar26 + lVar22);
                    }
                  }
                  else {
                    uVar12 = *(uint *)(lVar17 + lVar16 * 4);
                  }
                  uVar29 = uVar30 & 0xffffffff;
                  goto LAB_002e84b7;
                }
                if (*(char *)(lVar45 + lVar52) == '\0') {
                  uVar12 = *(uint *)(lVar53 + lVar22);
                  goto LAB_002e83b3;
                }
                lVar57 = lVar21 + 0x400000000 >> 0x20;
                if (*(char *)(lVar54 + lVar57) == '\0') goto LAB_002e81c7;
                if (*(char *)(lVar18 + lVar52) == '\0') {
                  uVar12 = *(uint *)(lVar26 + lVar57 * 4);
LAB_002e8222:
                  uVar27 = *(uint *)(lVar53 + lVar22);
                  goto LAB_002e822a;
                }
                if (*(char *)(lVar16 + lVar33) == '\0') {
                  if (*(char *)(lVar16 + -1 + lVar24 + lVar40) == '\0') {
                    uVar12 = *(uint *)(lVar17 + lVar16 * 4);
                    goto LAB_002e8222;
                  }
                  uVar9 = *(undefined4 *)(lVar26 + lVar22);
                }
                else {
                  uVar9 = *(undefined4 *)(lVar17 + lVar16 * 4);
                }
LAB_002e81bb:
                *(undefined4 *)(lVar11 + lVar16 * 4) = uVar9;
LAB_002e824f:
                uVar30 = lVar10 + lVar16;
                goto LAB_002e8253;
              }
              if (*(char *)(lVar28 + lVar24 + lVar16) == '\0') goto LAB_002e80ec;
              if (*(char *)(lVar33 + 1 + lVar16) == '\0') {
                uVar30 = lVar10 + lVar16;
                lVar21 = lVar21 + 0x400000000 >> 0x20;
                if (*(char *)(lVar54 + lVar21) != '\0') {
                  if (*(char *)(lVar16 + lVar33) == '\0') {
                    uVar9 = *(undefined4 *)(lVar26 + lVar21 * 4);
                    goto LAB_002e81bb;
                  }
                  uVar12 = *(uint *)(lVar17 + lVar16 * 4);
                  if (*(char *)(lVar16 + lVar24 + lVar40) == '\0') {
                    uVar27 = *(uint *)(lVar26 + lVar21 * 4);
LAB_002e822a:
                    uVar12 = TTA::Merge(uVar12,uVar27);
                    *(uint *)(lVar11 + lVar16 * 4) = uVar12;
                  }
                  else {
                    *(uint *)(lVar11 + lVar16 * 4) = uVar12;
                  }
                  goto LAB_002e824f;
                }
                if (*(char *)(lVar16 + lVar33) == '\0') goto LAB_002e79fd;
                uVar29 = uVar30 & 0xffffffff;
                goto LAB_002e7eb4;
              }
              *(undefined4 *)(lVar11 + lVar16 * 4) = *(undefined4 *)(lVar17 + lVar16 * 4);
              lVar21 = lVar21 + 0x200000000;
              lVar22 = lVar10 + lVar16;
              lVar16 = lVar16 + 2;
              if (lVar39 <= lVar22 + 2) {
                uVar12 = iVar36 + (int)lVar16 + 2;
                iVar36 = iVar36 + (int)lVar16;
                break;
              }
            } while( true );
          }
          uVar30 = (ulong)uVar12;
          if (local_110 < (int)uVar12) goto LAB_002e8d51;
          lVar20 = (long)(int)uVar12;
          lVar28 = (long)iVar36;
          if (*(char *)(lVar45 + lVar20) == '\0') goto LAB_002e8e22;
          cVar8 = *(char *)(lVar54 + 3 + lVar28);
          goto joined_r0x002e8cc1;
        }
LAB_002e8d14:
        uVar30 = (ulong)uVar12;
        if (local_110 < (int)uVar12) goto LAB_002e8d51;
        lVar20 = (long)(int)uVar12;
        if (*(char *)(lVar45 + lVar20) == '\0') {
          if (*(char *)((long)iVar37 + 3 + lVar45) == '\0') {
            *(undefined4 *)(lVar53 + lVar20 * 4) = 0;
            goto LAB_002e9054;
          }
          if (*(char *)(lVar54 + 3 + (long)iVar37) == '\0') goto LAB_002e8f78;
          uVar12 = *(uint *)(lVar26 + lVar20 * 4);
        }
        else {
          lVar45 = (long)iVar37;
          if (*(char *)(lVar54 + 3 + lVar45) == '\0') {
            uVar12 = *(uint *)(lVar53 + lVar45 * 4);
          }
          else {
            uVar12 = TTA::Merge(*(uint *)(lVar26 + lVar20 * 4),*(uint *)(lVar53 + lVar45 * 4));
          }
        }
        *(uint *)(lVar53 + lVar20 * 4) = uVar12;
        goto LAB_002e9054;
      }
      uVar29 = uVar30 & 0xffffffff;
      goto LAB_002e7eb4;
    }
    if (*(char *)(lVar57 + lVar16) == '\0') {
      if (*(char *)(lVar57 + lVar24) == '\0') {
        uVar12 = TTA::Merge(*(uint *)(lVar11 + -8 + lVar57 * 4),*(uint *)(lVar26 + lVar41 * 4));
        *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
        uVar29 = uVar30 & 0xffffffff;
      }
      else {
        uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
        if (*(char *)(lVar57 + -1 + lVar24) == '\0') {
          uVar12 = TTA::Merge(uVar12,*(uint *)(lVar11 + lVar57 * 4));
          *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
        }
        else {
          *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
        }
        uVar29 = uVar30 & 0xffffffff;
      }
    }
    else {
      uVar12 = *(uint *)(lVar11 + lVar57 * 4);
      if (*(char *)(lVar57 + lVar24) == '\0') {
        uVar12 = TTA::Merge(uVar12,*(uint *)(lVar26 + lVar41 * 4));
        *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
LAB_002e8ab3:
        uVar29 = lVar10 + lVar57 & 0xffffffff;
      }
      else {
        *(uint *)(lVar17 + 8 + lVar57 * 4) = uVar12;
LAB_002e8782:
        uVar29 = lVar10 + lVar57 & 0xffffffff;
      }
    }
    goto LAB_002e7cc1;
  }
  if (*(char *)(lVar57 + lVar16) == '\0') {
    uVar12 = *(uint *)(lVar11 + -8 + lVar57 * 4);
  }
  else {
    uVar12 = *(uint *)(lVar11 + lVar57 * 4);
  }
  iVar37 = (int)uVar30;
  goto LAB_002e87b6;
LAB_002e81c7:
  puVar25 = (undefined4 *)((lVar21 >> 0x1e) + lVar53);
  iVar37 = (int)uVar30;
  goto LAB_002e827c;
LAB_002e80ec:
  uVar30 = lVar10 + lVar16;
  iVar36 = (int)uVar30;
LAB_002e76bc:
  *(undefined4 *)(lVar53 + uVar30 * 4) = 0;
  iVar37 = iVar36 + 2;
  if (local_110 <= iVar37) {
LAB_002e8be9:
    lVar20 = (long)iVar37;
    if (local_110 < iVar37) {
      if (*(char *)(lVar45 + lVar20) == '\0') goto LAB_002e8fb0;
      cVar8 = *(char *)(lVar54 + lVar20);
    }
    else {
      lVar28 = (long)iVar36;
      if (*(char *)(lVar45 + lVar20) == '\0') goto LAB_002e8e22;
      cVar8 = *(char *)(lVar54 + lVar20);
      if (*(char *)(lVar54 + 3 + lVar28) != '\0') {
        if ((cVar8 != '\0') || (*(char *)(lVar54 + 1 + lVar28) == '\0')) goto LAB_002e9047;
        goto LAB_002e8f19;
      }
    }
    if (cVar8 != '\0') goto LAB_002e9047;
    lVar28 = (long)iVar36;
    if (*(char *)(lVar54 + 1 + lVar28) != '\0') goto LAB_002e8efb;
    goto LAB_002e8f78;
  }
  lVar17 = (long)iVar36;
  lVar10 = lVar17 + 2;
  lVar11 = lVar17 << 0x20;
  lVar33 = lVar35 + lVar17 * 4;
  lVar21 = 0;
  while (*(char *)(lVar28 + lVar17 + -1 + lVar21) == '\0') {
    if (*(char *)(lVar28 + lVar17 + lVar21) != '\0') goto LAB_002e776f;
    *(undefined4 *)(lVar33 + lVar21 * 4) = 0;
    lVar11 = lVar11 + 0x200000000;
    lVar24 = lVar10 + lVar21;
    lVar21 = lVar21 + 2;
    if (lVar39 <= lVar24 + 2) {
      iVar37 = iVar36 + (int)lVar21 + 2;
      iVar36 = iVar36 + (int)lVar21;
      goto LAB_002e8be9;
    }
  }
  uVar30 = lVar10 + lVar21;
  lVar16 = lVar11 + 0x300000000 >> 0x20;
  lVar24 = lVar11 >> 0x20;
  if (*(char *)(lVar54 + lVar16) == '\0') {
    if (*(char *)(lVar45 + lVar16) == '\0') {
      if (*(char *)(lVar21 + lVar31 + lVar17) != '\0') {
        uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
        goto LAB_002e83b3;
      }
      if (*(char *)(lVar54 + 1 + lVar24) == '\0') {
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_;
        TTA::length_ = TTA::length_ + 1;
      }
      else {
        uVar12 = *(uint *)(lVar26 + lVar24 * 4);
      }
      iVar37 = (int)uVar30;
      goto LAB_002e87b6;
    }
    lVar11 = lVar11 + 0x400000000 >> 0x20;
    cVar8 = *(char *)(lVar21 + lVar31 + lVar17);
    if (*(char *)(lVar54 + lVar11) == '\0') {
      if (cVar8 != '\0') goto LAB_002e78af;
      if (*(char *)(lVar54 + 1 + lVar24) == '\0') goto LAB_002e79fd;
      uVar12 = *(uint *)(lVar26 + lVar24 * 4);
      goto LAB_002e8a77;
    }
    if (cVar8 != '\0') {
      uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
      if (*(char *)(lVar18 + lVar16) != '\0') goto LAB_002e7833;
      uVar27 = *(uint *)(lVar26 + lVar11 * 4);
      goto LAB_002e7936;
    }
    if (*(char *)(lVar54 + 1 + lVar24) == '\0') {
      uVar9 = *(undefined4 *)(lVar26 + lVar11 * 4);
      goto LAB_002e78c1;
    }
    if (*(char *)(lVar18 + lVar16) == '\0') {
      uVar12 = *(uint *)(lVar26 + lVar24 * 4);
      uVar27 = *(uint *)(lVar26 + lVar11 * 4);
    }
    else {
      uVar12 = *(uint *)(lVar26 + lVar24 * 4);
      if (*(char *)(lVar21 + -1 + lVar40 + lVar17) != '\0') {
        *(uint *)(lVar33 + lVar21 * 4) = uVar12;
        goto LAB_002e8023;
      }
      uVar27 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
    }
    uVar12 = TTA::Merge(uVar12,uVar27);
    *(uint *)(lVar33 + lVar21 * 4) = uVar12;
    goto LAB_002e8023;
  }
  if ((*(char *)(lVar21 + lVar31 + lVar17) == '\0') && (*(char *)(lVar54 + 1 + lVar24) != '\0')) {
    uVar12 = *(uint *)(lVar26 + lVar24 * 4);
    if (*(char *)(lVar21 + -1 + lVar40 + lVar17) == '\0') {
      uVar27 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
LAB_002e842a:
      uVar12 = TTA::Merge(uVar12,uVar27);
    }
  }
  else {
    uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
  }
  uVar29 = uVar30 & 0xffffffff;
  goto LAB_002e84b7;
LAB_002e776f:
  uVar30 = lVar10 + lVar21;
  if (*(char *)(lVar21 + 1 + lVar31 + lVar17) == '\0') goto code_r0x002e7786;
LAB_002e8343:
  iVar36 = (int)uVar30;
  goto LAB_002e8030;
code_r0x002e7786:
  lVar11 = lVar11 + 0x400000000 >> 0x20;
  cVar8 = *(char *)(lVar21 + lVar31 + lVar17);
  if (*(char *)(lVar54 + lVar11) != '\0') {
    if (cVar8 == '\0') {
      uVar9 = *(undefined4 *)(lVar26 + lVar11 * 4);
LAB_002e78c1:
      uVar30 = lVar10 + lVar21;
      *(undefined4 *)(lVar33 + lVar21 * 4) = uVar9;
    }
    else {
      uVar12 = *(uint *)(lVar38 + lVar17 * 4 + lVar21 * 4);
      if (*(char *)(lVar21 + lVar40 + lVar17) == '\0') {
        uVar27 = *(uint *)(lVar26 + lVar11 * 4);
LAB_002e7936:
        uVar30 = lVar10 + lVar21;
        uVar12 = TTA::Merge(uVar12,uVar27);
        *(uint *)(lVar33 + lVar21 * 4) = uVar12;
      }
      else {
LAB_002e7833:
        uVar30 = lVar10 + lVar21;
        *(uint *)(lVar33 + lVar21 * 4) = uVar12;
      }
    }
    goto LAB_002e8846;
  }
  if (cVar8 != '\0') {
LAB_002e78af:
    uVar30 = lVar10 + lVar21;
    uVar29 = uVar30 & 0xffffffff;
    goto LAB_002e7eb4;
  }
LAB_002e79fd:
  TTA::rtable_[TTA::length_] = TTA::length_;
  TTA::next_[TTA::length_] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar12 = TTA::length_;
LAB_002e7a35:
  TTA::length_ = uVar12 + 1;
  uVar29 = uVar30 & 0xffffffff;
  goto LAB_002e7a38;
code_r0x002e82e5:
  *(undefined4 *)(lVar33 + lVar21 * 4) = *(undefined4 *)(lVar33 + -8 + lVar21 * 4);
  lVar11 = lVar11 + 0x200000000;
  lVar24 = lVar10 + lVar21;
  lVar21 = lVar21 + 2;
  if (lVar39 <= lVar24 + 2) {
    uVar12 = iVar37 + (int)lVar21 + 2;
    iVar37 = iVar37 + (int)lVar21;
    goto LAB_002e8d43;
  }
  goto LAB_002e82bf;
LAB_002dd414:
  uVar9 = *(undefined4 *)(lVar53 + lVar28 * 4);
LAB_002dd429:
  iVar36 = iVar48 + 2;
LAB_002dd430:
  *(undefined4 *)(lVar53 + lVar20 * 4) = uVar9;
  iVar48 = iVar36;
LAB_002dd436:
  iVar36 = iVar48 + 2;
  if (iVar37 <= iVar36) goto code_r0x002dd443;
  goto LAB_002dd30f;
code_r0x002dd443:
  lVar20 = (long)iVar48;
LAB_002dd91e:
  lVar28 = (long)iVar36;
  if (iVar37 < iVar36) {
    if (*(char *)(lVar45 + lVar28) == '\0') {
      *(undefined4 *)(lVar53 + lVar28 * 4) = 0;
      goto LAB_002e9054;
    }
  }
  else if (*(char *)(lVar45 + lVar28) == '\0') {
    if (*(char *)(lVar45 + 3 + lVar20) == '\0') {
      *(undefined4 *)(lVar53 + lVar28 * 4) = 0;
    }
    else {
      puVar14[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar12 = TTA::length_ + 1;
      *(uint *)(lVar53 + lVar28 * 4) = TTA::length_;
      TTA::length_ = uVar12;
    }
    goto LAB_002e9054;
  }
  puVar14[TTA::length_] = TTA::length_;
  TTA::next_[TTA::length_] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar12 = TTA::length_ + 1;
  *(uint *)(lVar53 + lVar28 * 4) = TTA::length_;
  TTA::length_ = uVar12;
LAB_002e9054:
  puVar14 = TTA::rtable_;
  uVar12 = 1;
  if (1 < TTA::length_) {
    uVar29 = 1;
    do {
      if (uVar29 == puVar14[uVar29]) {
        uVar12 = uVar12 + 1;
        uVar27 = uVar12;
      }
      else {
        uVar27 = puVar14[puVar14[uVar29]];
      }
      puVar14[uVar29] = uVar27;
      uVar29 = uVar29 + 1;
    } while (uVar29 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar12;
  puVar14 = TTA::rtable_;
  uVar29 = 0;
  iVar37 = (int)(uVar19 & 0xfffffffffffffffe);
  if (0 < (int)uVar47) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar28 = *(long *)&pMVar4->field_0x10;
    lVar38 = **(long **)&pMVar4->field_0x48;
    lVar10 = *(long *)&pMVar5->field_0x10;
    lVar54 = **(long **)&pMVar5->field_0x48;
    lVar20 = lVar10 + lVar54;
    lVar53 = lVar28 + 1 + lVar38;
    lVar45 = lVar28 + 1;
    uVar29 = 0;
    lVar26 = lVar10;
    do {
      puVar49 = TTA::rtable_;
      lVar35 = lVar54 * uVar29 + lVar10;
      lVar31 = lVar35 + lVar54;
      if (iVar37 < 1) {
        uVar30 = 0;
      }
      else {
        uVar30 = 0;
        do {
          lVar33 = (long)*(int *)(lVar26 + uVar30 * 4);
          if (lVar33 < 1) {
            *(undefined8 *)(lVar26 + uVar30 * 4) = 0;
            uVar23 = uVar30 + 1;
            *(undefined4 *)(lVar20 + uVar30 * 4) = 0;
            uVar12 = 0;
          }
          else {
            uVar12 = puVar49[lVar33];
            uVar27 = uVar12;
            if (*(char *)(lVar45 + -1 + uVar30) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar26 + uVar30 * 4) = uVar27;
            uVar23 = uVar30 | 1;
            uVar27 = uVar12;
            if (*(char *)(lVar45 + uVar30) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar26 + 4 + uVar30 * 4) = uVar27;
            uVar27 = uVar12;
            if (*(char *)(lVar53 + -1 + uVar30) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar20 + uVar30 * 4) = uVar27;
            if (*(char *)(lVar53 + uVar30) == '\0') {
              uVar12 = 0;
            }
          }
          *(uint *)(lVar31 + uVar23 * 4) = uVar12;
          uVar30 = uVar30 + 2;
        } while ((long)uVar30 < (long)(uVar19 & 0xfffffffffffffffe));
      }
      if ((uVar3 & 0x80000001) == 1) {
        lVar33 = (long)*(int *)(lVar35 + uVar30 * 4);
        if (lVar33 < 1) {
          *(undefined4 *)(lVar35 + uVar30 * 4) = 0;
          *(undefined4 *)(lVar31 + uVar30 * 4) = 0;
        }
        else {
          lVar18 = lVar38 * uVar29 + lVar28;
          uVar12 = puVar14[lVar33];
          uVar27 = uVar12;
          if (*(char *)(lVar18 + uVar30) == '\0') {
            uVar27 = 0;
          }
          *(uint *)(lVar35 + uVar30 * 4) = uVar27;
          if (*(char *)(lVar18 + lVar38 + uVar30) == '\0') {
            *(undefined4 *)(lVar31 + uVar30 * 4) = 0;
          }
          else {
            *(uint *)(lVar31 + uVar30 * 4) = uVar12;
          }
        }
      }
      uVar29 = uVar29 + 2;
      lVar20 = lVar20 + lVar54 * 2;
      lVar53 = lVar53 + lVar38 * 2;
      lVar45 = lVar45 + lVar38 * 2;
      lVar26 = lVar26 + lVar54 * 2;
    } while (uVar29 < uVar47);
    uVar29 = uVar29 & 0xffffffff;
  }
  puVar14 = TTA::rtable_;
  if ((uVar13 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar45 = *(long *)&pMVar4->field_0x10;
    lVar28 = **(long **)&pMVar4->field_0x48 * uVar29;
    lVar53 = *(long *)&pMVar5->field_0x10;
    lVar20 = uVar29 * **(long **)&pMVar5->field_0x48;
    if (iVar37 < 1) {
      uVar29 = 0;
    }
    else {
      lVar38 = lVar28 + lVar45;
      lVar10 = lVar20 + lVar53;
      uVar29 = 0;
      do {
        lVar54 = (long)*(int *)(lVar10 + uVar29 * 4);
        if (lVar54 < 1) {
          *(undefined8 *)(lVar10 + uVar29 * 4) = 0;
        }
        else {
          uVar13 = puVar14[lVar54];
          uVar47 = uVar13;
          if (*(char *)(lVar38 + uVar29) == '\0') {
            uVar47 = 0;
          }
          *(uint *)(lVar10 + uVar29 * 4) = uVar47;
          if (*(char *)(lVar38 + 1 + uVar29) == '\0') {
            *(undefined4 *)(lVar10 + 4 + uVar29 * 4) = 0;
          }
          else {
            *(uint *)(lVar10 + 4 + uVar29 * 4) = uVar13;
          }
        }
        uVar29 = uVar29 + 2;
      } while (uVar29 < (uVar19 & 0xfffffffe));
    }
    if ((uVar3 & 0x80000001) == 1) {
      lVar53 = lVar53 + lVar20;
      lVar20 = (long)*(int *)(lVar53 + uVar29 * 4);
      uVar13 = 0;
      if ((0 < lVar20) && (uVar13 = 0, *(char *)(lVar45 + lVar28 + uVar29) != '\0')) {
        uVar13 = TTA::rtable_[lVar20];
      }
      *(uint *)(lVar53 + uVar29 * 4) = uVar13;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        int e_rows = h & 0xfffffffe;
        bool o_rows = h % 2 == 1;
        int e_cols = w & 0xfffffffe;
        bool o_cols = w % 2 == 1;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

    }